

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_misc.cpp
# Opt level: O1

void __thiscall
amrex::MLNodeLaplacian::compRHS
          (MLNodeLaplacian *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *rhs,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *vel,
          Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *rhnd,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_rhcc)

{
  undefined **ppuVar1;
  undefined **ppuVar2;
  undefined **ppuVar3;
  undefined1 *puVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined8 uVar15;
  pointer paVar16;
  FabArray<amrex::FArrayBox> *pFVar17;
  pointer ppMVar18;
  MultiFab *pMVar19;
  EBCellFlagFab *this_00;
  pointer puVar20;
  pointer paVar21;
  pointer ppMVar22;
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  int iVar26;
  undefined8 uVar27;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *pVVar28;
  ulong uVar29;
  bool bVar30;
  int idim;
  uint uVar31;
  int iVar32;
  LinOpBCType LVar33;
  int iVar34;
  int iVar35;
  long lVar36;
  MultiFab *pMVar37;
  int *piVar38;
  undefined **ppuVar39;
  long lVar40;
  long lVar41;
  uint uVar42;
  int iVar43;
  uint uVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  double *pdVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  LinOpBCType LVar52;
  int iVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  double dVar57;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *pVVar58;
  int iVar59;
  long lVar60;
  FabArray<amrex::IArrayBox> *pFVar61;
  int joff;
  int iVar62;
  undefined8 *puVar63;
  long lVar64;
  long lVar65;
  LayoutData<int> *pLVar66;
  long lVar67;
  long lVar68;
  long lVar69;
  long lVar70;
  long lVar71;
  Geometry *pGVar72;
  long lVar73;
  bool bVar74;
  int iVar75;
  int iVar76;
  long lVar77;
  long lVar78;
  long lVar79;
  long lVar80;
  long lVar81;
  long lVar82;
  long lVar83;
  long lVar84;
  long lVar85;
  long lVar86;
  void *pvVar87;
  long lVar88;
  long lVar89;
  long lVar90;
  long lVar91;
  int in;
  long lVar92;
  long lVar93;
  long lVar94;
  undefined1 *puVar95;
  undefined1 *puVar96;
  int iVar97;
  long lVar98;
  long lVar99;
  long lVar100;
  ulong uVar101;
  MultiCutFab *pMVar102;
  long lVar103;
  long lVar104;
  undefined1 *puVar105;
  bool bVar106;
  bool bVar107;
  bool bVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  undefined *puVar120;
  undefined4 uVar121;
  undefined4 uVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  Periodicity PVar134;
  int jlo;
  int klo;
  Real facy;
  Box bx;
  Real facz;
  Box cccdom_pi;
  Real facx;
  IntVect dlo;
  MFIter mfi_3;
  Box domain;
  IntVect cell;
  Box bx_vel;
  Box result;
  IntVect dhi;
  Box bx_2;
  MFItInfo mfi_info;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  rhcc;
  MFItInfo mfi_info_2;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  frhs;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  rhs_cc;
  MFIter mfi;
  ulong local_930;
  long local_928;
  int local_920;
  long local_918;
  long local_910;
  ulong local_908;
  FabArray<amrex::IArrayBox> *local_900;
  undefined **local_8f0;
  undefined **local_8e8;
  ulong local_8e0;
  long local_8d0;
  long local_8c8;
  long local_8c0;
  undefined **local_8b8;
  LayoutData<int> *local_8b0;
  long local_8a8;
  long local_8a0;
  long local_898;
  long local_880;
  long local_878;
  long local_870;
  long local_868;
  long local_860;
  long local_858;
  undefined **local_848;
  ulong local_840;
  long local_838;
  ulong local_830;
  ulong local_828;
  long local_820;
  Box local_808;
  undefined8 local_7e8;
  int iStack_7e0;
  undefined4 uStack_7dc;
  long local_7d0;
  undefined1 *local_7c8;
  Geometry *local_7c0;
  Box local_7b8;
  undefined8 local_798;
  undefined8 uStack_790;
  ulong local_788;
  undefined **local_780;
  long local_778;
  ulong local_770;
  long local_768;
  ulong local_760;
  long local_758;
  LinOpBCType local_74c;
  ulong local_748;
  long local_740;
  long local_738;
  long local_730;
  ulong local_728;
  ulong local_720;
  undefined1 *local_718;
  FabType local_70c;
  ulong local_708;
  long local_700;
  long local_6f8;
  undefined1 *local_6f0;
  uint local_6e8;
  int local_6e4;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_6e0;
  __uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> local_6d8;
  long local_6d0;
  long local_6c8;
  GpuArray<amrex::LinOpBCType,_3U> local_6c0;
  GpuArray<amrex::LinOpBCType,_3U> local_6b0;
  EBFArrayBoxFactory *local_6a0;
  undefined1 *local_698;
  ulong local_690;
  FabArray<amrex::IArrayBox> *local_688;
  long local_680;
  undefined **local_678;
  undefined **local_670;
  undefined **local_668;
  undefined **local_660;
  long local_658;
  undefined **local_650;
  long local_648;
  long local_640;
  long local_638;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_630;
  MultiCutFab *local_628;
  ulong local_620;
  _Head_base<0UL,_amrex::LayoutData<int>_*,_false> local_618;
  LayoutData<int> *local_610;
  long local_608;
  long local_600;
  undefined1 local_5f8 [24];
  undefined4 uStack_5e0;
  int local_5d8;
  int local_5d4;
  int local_5d0;
  Array4<const_double> local_5b8;
  undefined1 local_578 [16];
  undefined1 local_568 [8];
  pointer pbStack_560;
  undefined8 local_558;
  int local_550;
  Vector<int,_std::allocator<int>_> *local_538;
  Real local_518;
  FabArray<amrex::FArrayBox> *local_510;
  FabArray<amrex::IArrayBox> *local_508;
  long local_500;
  int local_4f8;
  LinOpBCType local_4f4;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_4f0;
  _Head_base<0UL,_amrex::MultiFab_*,_false> local_4e8;
  _Head_base<0UL,_amrex::MultiFab_*,_false> local_4e0;
  FabArray<amrex::EBCellFlagFab> *local_4d8;
  undefined1 *local_4d0;
  long local_4c8;
  FabArray<amrex::IArrayBox> *local_4c0;
  long local_4b8;
  __uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> local_4b0;
  undefined1 local_4a8 [16];
  Array4<const_double> local_498;
  Array4<const_double> local_458;
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  FabArray<amrex::IArrayBox> *local_3f8;
  ulong uStack_3f0;
  Array4<const_double> local_3e8;
  long local_3a8;
  ulong local_3a0;
  FabArray<amrex::IArrayBox> *local_398;
  ulong local_390;
  long local_388;
  long local_380;
  Box local_378;
  Geometry *local_358;
  ulong uStack_350;
  Array4<const_double> local_340;
  Array4<const_double> local_300;
  double local_2c0;
  undefined1 local_2b8 [16];
  Box local_29c;
  long local_280;
  long local_278;
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  local_270;
  MFItInfo local_254;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *local_240;
  undefined1 local_238 [16];
  double local_228;
  ulong uStack_220;
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  local_210;
  FabArray<amrex::IArrayBox> *local_1f8;
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  local_1f0;
  undefined1 local_1d8 [16];
  double local_1c8;
  ulong uStack_1c0;
  undefined1 local_1b8 [32];
  int local_198 [40];
  IntVect local_f8;
  int local_ec;
  
  local_240 = rhnd;
  local_4f0 = vel;
  local_630 = a_rhcc;
  if ((this->super_MLNodeLinOp).m_masks_built == false) {
    MLNodeLinOp::buildMasks(&this->super_MLNodeLinOp);
  }
  if (this->m_integral_built == false) {
    buildIntegral(this);
  }
  if ((this->m_build_surface_integral == true) && (this->m_surface_integral_built == false)) {
    buildSurfaceIntegral(this);
  }
  paVar16 = (this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            .
            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_6b0.arr._0_8_ = *(undefined8 *)paVar16->_M_elems;
  local_6b0.arr[2] = paVar16->_M_elems[2];
  paVar16 = (this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            .
            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_6c0.arr._0_8_ = *(undefined8 *)paVar16->_M_elems;
  local_6c0.arr[2] = paVar16->_M_elems[2];
  lVar36 = 0;
  uVar101 = 0;
  do {
    local_3a0 = 1;
    if ((uVar101 == 0) && (local_6b0.arr[lVar36] != inflow)) {
      local_3a0 = (ulong)(local_6c0.arr[lVar36] == inflow);
    }
    lVar36 = lVar36 + 1;
    uVar101 = local_3a0;
  } while (lVar36 != 3);
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::vector(&local_270,(long)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels,
           (allocator_type *)local_1b8);
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::vector(&local_1f0,(long)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels,
           (allocator_type *)local_1b8);
  iVar75 = (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels;
  local_6e0 = rhs;
  if (0 < iVar75) {
    uVar101 = 0;
    do {
      pGVar72 = *(Geometry **)
                 &(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                  super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  .
                  super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar101].
                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
      local_620 = uVar101;
      if ((char)local_3a0 != '\0') {
        uVar15 = *(undefined8 *)((pGVar72->domain).smallend.vect + 2);
        uVar27 = *(undefined8 *)((pGVar72->domain).bigend.vect + 2);
        local_498.kstride._0_4_ =
             (undefined4)((ulong)*(undefined8 *)(pGVar72->domain).bigend.vect >> 0x20);
        local_498.kstride._4_4_ = (undefined4)uVar27;
        local_498.nstride._0_4_ = (undefined4)((ulong)uVar27 >> 0x20);
        local_498.p = (double *)*(undefined ***)(pGVar72->domain).smallend.vect;
        local_498.jstride._0_4_ = (uint)uVar15;
        local_498.jstride._4_4_ = (int)((ulong)uVar15 >> 0x20);
        lVar36 = 0;
        do {
          if (local_6b0.arr[lVar36] != inflow) {
            piVar38 = (int *)((long)&local_498.p + lVar36 * 4);
            *piVar38 = *piVar38 + -1;
          }
          if (local_6c0.arr[lVar36] != inflow) {
            piVar38 = (int *)((long)&local_498.jstride + lVar36 * 4 + 4);
            *piVar38 = *piVar38 + 1;
          }
          lVar36 = lVar36 + 1;
        } while (lVar36 != 3);
        local_5f8._8_4_ = (uint)local_498.jstride;
        local_5f8._0_8_ = local_498.p;
        puVar95 = (undefined1 *)((long)&local_498.jstride + 4);
        local_340.jstride._0_4_ = local_498.kstride._4_4_;
        local_340.p = (double *)CONCAT44((undefined4)local_498.kstride,local_498.jstride._4_4_);
        local_7c0 = pGVar72;
        MFIter::MFIter((MFIter *)local_1b8,
                       (FabArrayBase *)
                       (local_4f0->
                       super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                       super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar101],true);
        iVar75 = local_498.jstride._4_4_;
        uVar31 = (uint)local_498.jstride;
        if (local_198[0] < local_198[2]) {
          local_798 = (double)CONCAT44(local_498.kstride._4_4_,(undefined4)local_498.kstride);
          uStack_790 = 0;
          local_7e8 = (undefined **)local_498.p;
          iStack_7e0 = (int)local_498.p;
          uStack_7dc = local_498.p._4_4_;
          do {
            uVar121 = SUB84(puVar95,0);
            MFIter::growntilebox((Box *)&local_5b8,(MFIter *)local_1b8,1);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((Array4<double> *)local_578,
                       &(local_4f0->
                        super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar101]->
                        super_FabArray<amrex::FArrayBox>,(MFIter *)local_1b8);
            auVar23._4_4_ = -(uint)(local_798._4_4_ < local_5b8.kstride._4_4_);
            auVar23._0_4_ = -(uint)((int)local_798 < (int)local_5b8.kstride);
            auVar23._8_4_ = -(uint)((int)local_5b8.p < iStack_7e0);
            auVar23._12_4_ = -(uint)(local_5b8.p._4_4_ < local_7e8._4_4_);
            uVar42 = movmskps(uVar121,auVar23);
            puVar95 = (undefined1 *)(ulong)uVar42;
            if ((((uVar42 != 0) || (iVar75 < local_5b8.jstride._4_4_)) ||
                ((int)(uint)local_5b8.jstride < (int)uVar31)) &&
               (puVar95 = (undefined1 *)(ulong)(uint)local_5b8.jstride,
               (int)(uint)local_5b8.jstride <= local_5b8.kstride._4_4_)) {
              do {
                iVar62 = (int)puVar95;
                if (local_5b8.p._4_4_ <= (int)local_5b8.kstride) {
                  iVar53 = local_5b8.p._4_4_;
                  do {
                    if ((int)local_5b8.p <= local_5b8.jstride._4_4_) {
                      iVar32 = (int)local_5b8.p;
                      do {
                        local_458.p._0_4_ = iVar32;
                        local_458.p._4_4_ = iVar53;
                        local_458.jstride._0_4_ = iVar62;
                        lVar36 = 0;
                        do {
                          puVar63 = (undefined8 *)
                                    (((long)iVar53 - (long)local_558._4_4_) *
                                     CONCAT44(local_578._12_4_,local_578._8_4_) * 8 +
                                     ((long)iVar62 - (long)local_550) * (long)local_568 * 8 +
                                     (long)(int)local_558 * -8 +
                                    CONCAT44(local_578._4_4_,local_578._0_4_) + (long)iVar32 * 8);
                          lVar98 = 0;
                          do {
                            if ((lVar36 != lVar98) &&
                               ((iVar43 = *(int *)((long)&local_458.p + lVar36 * 4),
                                iVar43 < *(int *)(local_5f8 + lVar36 * 4) ||
                                (*(int *)((long)&local_340.p + lVar36 * 4) < iVar43)))) {
                              *puVar63 = 0;
                            }
                            lVar98 = lVar98 + 1;
                            puVar63 = puVar63 + (long)pbStack_560;
                          } while (lVar98 != 3);
                          lVar36 = lVar36 + 1;
                        } while (lVar36 != 3);
                        bVar106 = iVar32 != local_5b8.jstride._4_4_;
                        iVar32 = iVar32 + 1;
                      } while (bVar106);
                    }
                    bVar106 = iVar53 != (int)local_5b8.kstride;
                    iVar53 = iVar53 + 1;
                  } while (bVar106);
                }
                puVar95 = (undefined1 *)(ulong)(iVar62 + 1);
              } while (iVar62 != local_5b8.kstride._4_4_);
            }
            MFIter::operator++((MFIter *)local_1b8);
            uVar101 = local_620;
          } while (local_198[0] < local_198[2]);
        }
        MFIter::~MFIter((MFIter *)local_1b8);
        rhs = local_6e0;
        pGVar72 = local_7c0;
      }
      pFVar17 = &(local_4f0->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                 super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar101]->super_FabArray<amrex::FArrayBox>;
      local_1b8[0] = (allocator_type)0x1;
      local_1b8._1_7_ = 0x1000000;
      local_1b8._8_4_ = 1;
      PVar134 = Geometry::periodicity(pGVar72);
      local_578._0_4_ = PVar134.period.vect[0];
      local_578._4_4_ = PVar134.period.vect[1];
      local_578._8_4_ = PVar134.period.vect[2];
      FabArray<amrex::FArrayBox>::FillBoundary<double>
                (pFVar17,0,3,(IntVect *)local_1b8,(Periodicity *)local_578,false);
      ppMVar18 = (local_630->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                 super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (((long)uVar101 <
           (long)(local_630->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                 super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)ppMVar18 >> 3) &&
         (pMVar19 = ppMVar18[uVar101], pMVar19 != (MultiFab *)0x0)) {
        pMVar37 = (MultiFab *)operator_new(0x180);
        local_1b8._1_7_ = 0;
        local_1b8[0] = (allocator_type)0x1;
        local_1b8._24_4_ = 0;
        local_1b8[0x1c] = '\0';
        local_1b8._29_3_ = 0;
        local_198[0] = 0;
        local_198[1] = 0;
        local_1b8._8_4_ = 0;
        local_1b8._12_4_ = 0;
        local_1b8._16_4_ = 0;
        local_1b8._20_4_ = 0;
        local_578._0_4_ = 0x8378d0;
        local_578._4_4_ = 0;
        MultiFab::MultiFab(pMVar37,(BoxArray *)
                                   ((long)&(pMVar19->super_FabArray<amrex::FArrayBox>).
                                           super_FabArrayBase + 8),
                           (DistributionMapping *)
                           ((long)&(pMVar19->super_FabArray<amrex::FArrayBox>).super_FabArrayBase +
                           0x70),1,1,(MFInfo *)local_1b8,(FabFactory<amrex::FArrayBox> *)local_578);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b8 + 0x10));
        pMVar19 = local_270.
                  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar101]._M_t.
                  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t
                  .super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
        local_270.
        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar101]._M_t.
        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = pMVar37;
        if (pMVar19 != (MultiFab *)0x0) {
          (**(code **)(*(long *)&(pMVar19->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8)
          )();
        }
        pFVar17 = &(local_270.
                    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar101]._M_t.
                    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                   super_FabArray<amrex::FArrayBox>;
        FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (pFVar17,0.0,0,(pFVar17->super_FabArrayBase).n_comp,
                   &(pFVar17->super_FabArrayBase).n_grow);
        MultiFab::Copy(local_270.
                       super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar101]._M_t.
                       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                       .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                       (local_630->
                       super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                       super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar101],0,0,1,0);
        pFVar17 = &(local_270.
                    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar101]._M_t.
                    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                   super_FabArray<amrex::FArrayBox>;
        PVar134 = Geometry::periodicity(pGVar72);
        local_1b8[0] = PVar134.period.vect[0]._0_1_;
        local_1b8._1_7_ = PVar134.period.vect._1_7_;
        local_1b8._8_4_ = PVar134.period.vect[2];
        FabArray<amrex::FArrayBox>::FillBoundary<double>(pFVar17,(Periodicity *)local_1b8,false);
        pMVar19 = (rhs->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar101];
        pMVar37 = (MultiFab *)operator_new(0x180);
        local_1b8._1_7_ = 0;
        local_1b8[0] = (allocator_type)0x1;
        local_1b8._24_4_ = 0;
        local_1b8[0x1c] = '\0';
        local_1b8._29_3_ = 0;
        local_198[0] = 0;
        local_198[1] = 0;
        local_1b8._8_4_ = 0;
        local_1b8._12_4_ = 0;
        local_1b8._16_4_ = 0;
        local_1b8._20_4_ = 0;
        local_578._0_4_ = 0x8378d0;
        local_578._4_4_ = 0;
        MultiFab::MultiFab(pMVar37,(BoxArray *)
                                   ((long)&(pMVar19->super_FabArray<amrex::FArrayBox>).
                                           super_FabArrayBase + 8),
                           (DistributionMapping *)
                           ((long)&(pMVar19->super_FabArray<amrex::FArrayBox>).super_FabArrayBase +
                           0x70),1,0,(MFInfo *)local_1b8,(FabFactory<amrex::FArrayBox> *)local_578);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b8 + 0x10));
        pMVar19 = local_1f0.
                  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar101]._M_t.
                  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t
                  .super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
        local_1f0.
        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar101]._M_t.
        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = pMVar37;
        if (pMVar19 != (MultiFab *)0x0) {
          (**(code **)(*(long *)&(pMVar19->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8)
          )();
        }
      }
      local_518 = (pGVar72->super_CoordSys).inv_dx[0];
      dVar57 = (pGVar72->super_CoordSys).inv_dx[1];
      local_7c0 = (Geometry *)(pGVar72->super_CoordSys).inv_dx[2];
      local_808.smallend.vect._0_8_ = *(undefined8 *)(pGVar72->domain).smallend.vect;
      uVar15 = *(undefined8 *)((pGVar72->domain).smallend.vect + 2);
      local_808.bigend.vect[1] = (int)((ulong)*(undefined8 *)(pGVar72->domain).bigend.vect >> 0x20);
      local_808._20_8_ = *(undefined8 *)((pGVar72->domain).bigend.vect + 2);
      local_808.smallend.vect[2] = (int)uVar15;
      local_808.bigend.vect[0] = (int)((ulong)uVar15 >> 0x20);
      lVar36 = 0;
      do {
        if ((local_808.btype.itype >> ((uint)lVar36 & 0x1f) & 1) == 0) {
          piVar38 = local_808.bigend.vect + lVar36;
          *piVar38 = *piVar38 + 1;
        }
        lVar36 = lVar36 + 1;
      } while (lVar36 != 3);
      local_808.btype.itype = 7;
      local_398 = (FabArray<amrex::IArrayBox> *)
                  **(long **)&(this->super_MLNodeLinOp).m_dirichlet_mask.
                              super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar101].
                              super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                              .
                              super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
      ;
      lVar36 = **(long **)&(this->super_MLNodeLinOp).super_MLLinOp.m_factory.
                           super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar101].
                           super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                           .
                           super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
      ;
      if (lVar36 == 0) {
        local_6a0 = (EBFArrayBoxFactory *)0x0;
      }
      else {
        local_6a0 = (EBFArrayBoxFactory *)
                    __dynamic_cast(lVar36,&FabFactory<amrex::FArrayBox>::typeinfo,
                                   &EBFArrayBoxFactory::typeinfo,0);
      }
      bVar106 = local_6a0 == (EBFArrayBoxFactory *)0x0;
      if (bVar106) {
        local_4d8 = (FabArray<amrex::EBCellFlagFab> *)0x0;
      }
      else {
        local_4d8 = EBDataCollection::getMultiEBCellFlagFab
                              ((local_6a0->m_ebdc).
                               super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
      }
      if (local_6a0 == (EBFArrayBoxFactory *)0x0) {
        local_510 = (FabArray<amrex::FArrayBox> *)0x0;
      }
      else {
        local_510 = &EBDataCollection::getVolFrac
                               ((local_6a0->m_ebdc).
                                super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->super_FabArray<amrex::FArrayBox>;
      }
      if (local_6a0 == (EBFArrayBoxFactory *)0x0) {
        local_628 = (MultiCutFab *)0x0;
      }
      else {
        local_628 = EBDataCollection::getBndryArea
                              ((local_6a0->m_ebdc).
                               super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
      }
      local_4e0._M_head_impl =
           *(MultiFab **)
            &(this->m_integral).
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar101]._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
      local_4e8._M_head_impl =
           *(MultiFab **)
            &(this->m_surface_integral).
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar101]._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
      if ((((uVar101 != (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels - 1) &&
           (local_6a0 != (EBFArrayBoxFactory *)0x0)) &&
          ((this->super_MLNodeLinOp).super_MLLinOp.m_amr_ref_ratio.
           super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar101] != 2)) &&
         (bVar30 = EBFArrayBoxFactory::isAllRegular(local_6a0), !bVar30)) {
        Assert_host("ilev == m_num_amr_levels-1 || AMRRefRatio(ilev) == 2 || factory == nullptr || factory->isAllRegular()"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLaplacian_misc.cpp"
                    ,0x3df,(char *)0x0);
      }
      local_29c.smallend.vect[0] = CONCAT13(local_29c.smallend.vect[0]._3_1_,0x10000);
      local_29c.smallend.vect[1] = Gpu::Device::max_gpu_streams;
      local_29c.bigend.vect[1] = DAT_0083cec0;
      local_29c.smallend.vect[2] = (undefined4)FabArrayBase::mfiter_tile_size;
      local_29c.bigend.vect[0] = FabArrayBase::mfiter_tile_size._4_4_;
      local_29c.smallend.vect[0] = CONCAT22(local_29c.smallend.vect[0]._2_2_,0x101);
      MFIter::MFIter((MFIter *)local_1b8,
                     (FabArrayBase *)
                     (rhs->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                     super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar101],(MFItInfo *)&local_29c);
      if (local_198[0] < local_198[2]) {
        local_718 = (undefined1 *)(local_518 * 0.25);
        dVar57 = dVar57 * 0.25;
        local_7c0 = (Geometry *)((double)local_7c0 * 0.25);
        local_518 = local_518 * 0.125;
        do {
          MFIter::tilebox(&local_7b8,(MFIter *)local_1b8);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_578,
                     &(rhs->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar101]->
                      super_FabArray<amrex::FArrayBox>,(MFIter *)local_1b8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_498,
                     &(local_4f0->
                      super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar101]->
                      super_FabArray<amrex::FArrayBox>,(MFIter *)local_1b8);
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    ((Array4<const_int> *)&local_5b8,local_398,(MFIter *)local_1b8);
          if (local_6a0 == (EBFArrayBoxFactory *)0x0) {
            local_70c = regular;
            bVar30 = bVar106;
          }
          else {
            piVar38 = local_198;
            if ((Vector<int,_std::allocator<int>_> *)local_198._32_8_ !=
                (Vector<int,_std::allocator<int>_> *)0x0) {
              piVar38 = (int *)((long)local_198[0] * 4 + *(long *)local_198._32_8_);
            }
            this_00 = (local_4d8->m_fabs_v).
                      super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[*piVar38];
            local_5f8._16_4_ = local_7b8.bigend.vect[1];
            local_5f8._20_4_ = local_7b8.bigend.vect[2];
            uStack_5e0 = local_7b8.btype.itype;
            local_5f8._0_4_ = local_7b8.smallend.vect[0];
            local_5f8._4_4_ = local_7b8.smallend.vect[1];
            local_5f8._8_4_ = local_7b8.smallend.vect[2];
            local_5f8._12_4_ = local_7b8.bigend.vect[0];
            lVar36 = 0;
            do {
              if ((uStack_5e0 >> ((uint)lVar36 & 0x1f) & 1) != 0) {
                *(int *)(local_5f8 + lVar36 * 4 + 0xc) = *(int *)(local_5f8 + lVar36 * 4 + 0xc) + -1
                ;
              }
              lVar36 = lVar36 + 1;
            } while (lVar36 != 3);
            uStack_5e0 = 0;
            local_378.btype.itype = 0;
            local_378.smallend.vect[0] = local_7b8.smallend.vect[0];
            local_378.smallend.vect[1] = local_7b8.smallend.vect[1];
            local_378.smallend.vect[2] = local_7b8.smallend.vect[2] + ~interior;
            local_378.bigend.vect[0] = local_5f8._12_4_ + 1;
            local_378.smallend.vect[1] = local_378.smallend.vect[1] + -1;
            local_378.smallend.vect[0] = local_378.smallend.vect[0] + -1;
            local_378.bigend.vect[1] = local_5f8._16_4_ + 1;
            local_378.bigend.vect[2] = local_5f8._20_4_ + 1;
            local_70c = EBCellFlagFab::getType(this_00,&local_378);
            iVar75 = local_7b8.bigend.vect[0];
            if (local_70c == singlevalued) {
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        ((Array4<const_double> *)local_5f8,local_510,(MFIter *)local_1b8);
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        (&local_340,&(local_4e0._M_head_impl)->super_FabArray<amrex::FArrayBox>,
                         (MFIter *)local_1b8);
              local_6e8 = local_7b8.bigend.vect[2];
              local_708 = (ulong)(uint)local_7b8.smallend.vect[2];
              if (local_7b8.smallend.vect[2] <= local_7b8.bigend.vect[2]) {
                local_748 = (ulong)(uint)local_7b8.bigend.vect[1];
                local_4c0 = (FabArray<amrex::IArrayBox> *)(long)local_7b8.smallend.vect[1];
                local_388 = (long)local_7b8.smallend.vect[0];
                local_6e4 = local_7b8.bigend.vect[1] + 1;
                local_698 = (undefined1 *)(local_388 * 8);
                local_508 = (FabArray<amrex::IArrayBox> *)-local_388;
                local_4d0 = (undefined1 *)
                            ((long)&local_4c0[-1].os_temp._M_t.
                                    super___uniq_ptr_impl<amrex::FabArray<amrex::IArrayBox>,_std::default_delete<amrex::FabArray<amrex::IArrayBox>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_amrex::FabArray<amrex::IArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::IArrayBox>_>_>
                                    .
                                    super__Head_base<0UL,_amrex::FabArray<amrex::IArrayBox>_*,_false>
                                    ._M_head_impl + 7);
                local_4c8 = CONCAT44(local_4c8._4_4_,local_7b8.smallend.vect[2] - 1);
                local_390 = local_388 * 4;
                local_380 = CONCAT44(local_380._4_4_,local_7b8.bigend.vect[0]);
                do {
                  if (local_7b8.smallend.vect[1] <= local_7b8.bigend.vect[1]) {
                    local_4b8 = (long)(int)local_4c8;
                    local_690 = (ulong)(int)(uint)local_708;
                    local_3f8 = (FabArray<amrex::IArrayBox> *)(long)local_808.smallend.vect[1];
                    local_408._0_4_ = local_808.smallend.vect[2];
                    local_4a8._0_4_ = local_808.bigend.vect[2];
                    local_688 = (FabArray<amrex::IArrayBox> *)(long)local_808.bigend.vect[1];
                    local_610 = (LayoutData<int> *)
                                ((long)&(local_508->super_FabArrayBase)._vptr_FabArrayBase +
                                (long)local_808.smallend.vect[0]);
                    local_618._M_head_impl =
                         (LayoutData<int> *)
                         ((long)&(local_508->super_FabArrayBase)._vptr_FabArrayBase +
                         (long)local_808.bigend.vect[0]);
                    local_500 = CONCAT44(local_5b8.jstride._4_4_,(uint)local_5b8.jstride) * 4;
                    lVar36 = ((long)local_4c0 - (long)local_5b8.begin.y) * local_500 +
                             (local_690 - (long)local_5b8.begin.z) *
                             CONCAT44(local_5b8.kstride._4_4_,(int)local_5b8.kstride) * 4 +
                             (long)local_5b8.begin.x * -4 +
                             CONCAT44(local_5b8.p._4_4_,(int)local_5b8.p) + local_390;
                    local_418._0_8_ = local_4d0;
                    local_900 = local_4c0;
                    do {
                      if (local_7b8.smallend.vect[0] <= local_7b8.bigend.vect[0]) {
                        local_740 = CONCAT44(local_740._4_4_,local_6b0.arr[1]);
                        bVar74 = local_900 == local_3f8 && local_6b0.arr[1] == inflow;
                        local_6d8._M_t.
                        super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                        .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl._0_1_ =
                             bVar74;
                        local_768 = CONCAT44(local_768._4_4_,local_6c0.arr[1]);
                        bVar30 = local_900 == local_688 && local_6c0.arr[1] == inflow;
                        local_4b0._M_t.
                        super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                        .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl._0_1_ =
                             bVar30;
                        local_770 = CONCAT44(local_770._4_4_,local_6b0.arr[2]);
                        bVar107 = local_6b0.arr[2] == inflow &&
                                  local_808.smallend.vect[2] == (uint)local_708;
                        local_358 = (Geometry *)CONCAT71(local_358._1_7_,bVar107);
                        bVar108 = local_6c0.arr[2] == inflow &&
                                  local_808.bigend.vect[2] == (uint)local_708;
                        local_2b8[0] = bVar108;
                        lVar73 = CONCAT44(local_498.nstride._4_4_,(undefined4)local_498.nstride);
                        lVar84 = CONCAT44(local_498.jstride._4_4_,(uint)local_498.jstride) * 8;
                        lVar49 = (local_418._0_8_ - (long)local_498.begin.y) * lVar84;
                        lVar40 = CONCAT44(local_498.kstride._4_4_,(undefined4)local_498.kstride) * 8
                        ;
                        lVar50 = (local_4b8 - local_498.begin.z) * lVar40;
                        lVar98 = lVar49 + lVar50;
                        lVar40 = (local_690 - (long)local_498.begin.z) * lVar40;
                        lVar49 = lVar49 + lVar40;
                        lVar84 = ((long)local_900 - (long)local_498.begin.y) * lVar84;
                        lVar50 = lVar50 + lVar84;
                        lVar84 = lVar84 + lVar40;
                        lVar41 = lVar73 * 0x10;
                        lVar40 = (long)local_498.begin.x;
                        ppuVar39 = (undefined **)(local_498.p + local_388);
                        local_6f0 = (undefined1 *)(lVar98 + lVar41 + lVar40 * -8 + (long)ppuVar39);
                        local_730 = lVar98 + lVar73 * 8 + lVar40 * -8 + (long)ppuVar39;
                        local_720 = lVar98 + lVar40 * -8 + (long)ppuVar39;
                        local_638 = lVar49 + lVar41 + lVar40 * -8 + (long)ppuVar39;
                        local_6f8 = lVar49 + lVar73 * 8 + lVar40 * -8 + (long)ppuVar39;
                        local_778 = lVar49 + lVar40 * -8 + (long)ppuVar39;
                        local_640 = lVar50 + lVar41 + lVar40 * -8 + (long)ppuVar39;
                        local_700 = lVar50 + lVar73 * 8 + lVar40 * -8 + (long)ppuVar39;
                        local_780 = (undefined **)(lVar50 + lVar40 * -8 + (long)ppuVar39);
                        local_648 = lVar41 + lVar84 + lVar40 * -8 + (long)ppuVar39;
                        local_6c8 = lVar84 + lVar73 * 8 + lVar40 * -8 + (long)ppuVar39;
                        local_728 = lVar84 + lVar40 * -8 + (long)ppuVar39;
                        lVar77 = (local_4b8 - local_340.begin.z) * local_340.kstride * 8;
                        lVar73 = (local_690 - (long)local_340.begin.z) * local_340.kstride * 8;
                        lVar69 = CONCAT44(local_340.jstride._4_4_,(undefined4)local_340.jstride) * 8
                        ;
                        lVar41 = (local_418._0_8_ - (long)local_340.begin.y) * lVar69;
                        lVar69 = ((long)local_900 - (long)local_340.begin.y) * lVar69;
                        lVar98 = lVar41 + lVar77;
                        lVar41 = lVar41 + lVar73;
                        lVar77 = lVar77 + lVar69;
                        lVar69 = lVar69 + lVar73;
                        lVar85 = local_340.nstride * 0x38;
                        lVar70 = local_340.nstride * 0x10;
                        lVar50 = (long)local_340.begin.x;
                        lVar40 = local_340.nstride * 0x30;
                        lVar92 = lVar98 + lVar40 + lVar50 * -8;
                        lVar88 = lVar98 + lVar85 + lVar50 * -8;
                        lVar55 = local_340.nstride * 0x40;
                        lVar51 = lVar98 + local_340.nstride * 8 + lVar50 * -8;
                        lVar73 = lVar41 + local_340.nstride * 8 + lVar50 * -8;
                        lVar84 = lVar77 + local_340.nstride * 8 + lVar50 * -8;
                        lVar54 = lVar40 + lVar69 + lVar50 * -8;
                        lVar49 = lVar85 + lVar69 + lVar50 * -8;
                        lVar94 = lVar69 + lVar50 * -8;
                        lVar67 = lVar55 + lVar69 + lVar50 * -8;
                        lVar65 = lVar69 + local_340.nstride * 8 + lVar50 * -8;
                        pdVar48 = local_340.p + local_388;
                        local_758 = lVar98 + lVar50 * -8 + (long)pdVar48;
                        local_7d0 = lVar98 + lVar55 + lVar50 * -8 + (long)pdVar48;
                        local_738 = lVar98 + lVar70 + lVar50 * -8 + (long)pdVar48;
                        local_760 = lVar41 + lVar40 + lVar50 * -8 + (long)pdVar48;
                        local_788 = lVar41 + lVar85 + lVar50 * -8 + (long)pdVar48;
                        local_660 = (undefined **)(lVar41 + lVar50 * -8 + (long)pdVar48);
                        local_650 = (undefined **)(lVar41 + lVar55 + lVar50 * -8 + (long)pdVar48);
                        local_658 = lVar41 + lVar70 + lVar50 * -8 + (long)pdVar48;
                        local_668 = (undefined **)(lVar77 + lVar40 + lVar50 * -8 + (long)pdVar48);
                        local_670 = (undefined **)(lVar77 + lVar85 + lVar50 * -8 + (long)pdVar48);
                        local_600 = lVar77 + lVar50 * -8 + (long)pdVar48;
                        local_678 = (undefined **)(lVar77 + lVar55 + lVar50 * -8 + (long)pdVar48);
                        local_680 = lVar77 + lVar70 + lVar50 * -8 + (long)pdVar48;
                        local_6d0 = lVar70 + lVar69 + lVar50 * -8 + (long)pdVar48;
                        lVar98 = CONCAT44(local_5f8._20_4_,local_5f8._16_4_) * 8;
                        lVar41 = (local_4b8 - local_5d0) * lVar98;
                        lVar98 = (local_690 - (long)local_5d0) * lVar98;
                        lVar40 = CONCAT44(local_5f8._12_4_,local_5f8._8_4_) * 8;
                        lVar69 = (local_418._0_8_ - (long)local_5d4) * lVar40;
                        lVar40 = ((long)local_900 - (long)local_5d4) * lVar40;
                        lVar50 = (long)local_5d8;
                        lVar70 = lVar69 + lVar41 + lVar50 * -8;
                        lVar69 = lVar69 + lVar98 + lVar50 * -8;
                        lVar41 = lVar41 + lVar40 + lVar50 * -8;
                        lVar98 = lVar40 + lVar98 + lVar50 * -8;
                        ppuVar39 = (undefined **)(local_5f8._0_8_ + local_388 * 8);
                        pLVar66 = (LayoutData<int> *)0x0;
                        local_608 = CONCAT44(local_608._4_4_,local_6b0.arr[0]);
                        local_74c = local_6c0.arr[0];
                        do {
                          dVar126 = 0.0;
                          if (*(int *)(lVar36 + (long)pLVar66 * 4) == 0) {
                            dVar126 = 1.0;
                            if (((local_6b0.arr[0] == Neumann) ||
                                (local_798 = 1.0, local_6b0.arr[0] == inflow)) &&
                               (local_798 = 1.0, local_610 == pLVar66)) {
                              local_798 = 0.0;
                            }
                            uVar42 = 0x3ff00000;
                            uVar31 = uVar42;
                            if (((local_6c0.arr[0] == Neumann) || (local_6c0.arr[0] == inflow)) &&
                               (local_618._M_head_impl == pLVar66)) {
                              uVar31 = 0;
                            }
                            if (local_6b0.arr[1] == Neumann) {
                              dVar127 = dVar126;
                              if (local_900 == local_3f8) {
LAB_006e2642:
                                dVar127 = 0.0;
                              }
                            }
                            else {
                              dVar127 = 1.0;
                              if (bVar74) goto LAB_006e2642;
                            }
                            if (local_6c0.arr[1] == Neumann) {
                              if (local_900 == local_688) {
LAB_006e2674:
                                uVar42 = 0;
                              }
                            }
                            else if (bVar30) goto LAB_006e2674;
                            if (local_6b0.arr[2] == Neumann) {
                              dVar125 = dVar126;
                              if (local_808.smallend.vect[2] == (uint)local_708) {
LAB_006e26a8:
                                dVar125 = 0.0;
                              }
                            }
                            else {
                              dVar125 = 1.0;
                              if (bVar107) goto LAB_006e26a8;
                            }
                            local_7e8 = (undefined **)((ulong)uVar31 << 0x20);
                            if (local_6c0.arr[2] == Neumann) {
                              if (local_808.bigend.vect[2] == (uint)local_708) {
LAB_006e26f4:
                                dVar126 = 0.0;
                              }
                            }
                            else {
                              dVar126 = 1.0;
                              if (bVar108) goto LAB_006e26f4;
                            }
                            dVar5 = *(double *)((long)pdVar48 + (long)pLVar66 * 8 + lVar73 + -8);
                            dVar109 = *(double *)((long)pdVar48 + (long)pLVar66 * 8 + lVar73);
                            dVar6 = *(double *)((long)ppuVar39 + (long)pLVar66 * 8 + lVar69 + -8);
                            dVar7 = *(double *)((long)ppuVar39 + (long)pLVar66 * 8 + lVar69);
                            dVar115 = *(double *)(local_658 + (long)pLVar66 * 8 + -8);
                            dVar115 = dVar115 + dVar115;
                            dVar116 = *(double *)(local_658 + (long)pLVar66 * 8);
                            dVar109 = dVar109 + dVar109;
                            dVar116 = dVar116 + dVar116;
                            dVar110 = *(double *)((long)pdVar48 + (long)pLVar66 * 8 + lVar65 + -8);
                            dVar8 = *(double *)((long)ppuVar39 + (long)pLVar66 * 8 + lVar98 + -8);
                            dVar110 = dVar110 + dVar110;
                            dVar132 = *(double *)((long)pdVar48 + (long)pLVar66 * 8 + lVar94 + -8);
                            dVar123 = dVar132 + dVar132 + dVar8;
                            dVar132 = *(double *)(local_6d0 + (long)pLVar66 * 8 + -8);
                            dVar132 = dVar132 + dVar132;
                            dVar111 = *(double *)((long)pdVar48 + (long)pLVar66 * 8 + lVar65) * -2.0
                            ;
                            dVar9 = *(double *)((long)ppuVar39 + (long)pLVar66 * 8 + lVar98);
                            dVar24 = *(double *)(local_6d0 + (long)pLVar66 * 8) * -2.0;
                            dVar112 = *(double *)((long)pdVar48 + (long)pLVar66 * 8 + lVar51 + -8) *
                                      -2.0;
                            dVar10 = *(double *)((long)ppuVar39 + (long)pLVar66 * 8 + lVar70 + -8);
                            dVar117 = *(double *)(local_738 + (long)pLVar66 * 8 + -8) * -2.0;
                            dVar113 = *(double *)((long)pdVar48 + (long)pLVar66 * 8 + lVar51);
                            dVar113 = dVar113 + dVar113;
                            dVar114 = *(double *)(local_758 + (long)pLVar66 * 8);
                            dVar11 = *(double *)((long)ppuVar39 + (long)pLVar66 * 8 + lVar70);
                            dVar124 = (dVar114 + dVar114) - dVar11;
                            dVar25 = (double)((ulong)uVar42 << 0x20);
                            dVar114 = *(double *)(local_738 + (long)pLVar66 * 8);
                            dVar114 = dVar114 + dVar114;
                            dVar118 = *(double *)((long)pdVar48 + (long)pLVar66 * 8 + lVar84 + -8);
                            dVar118 = dVar118 + dVar118;
                            dVar12 = *(double *)(local_600 + (long)pLVar66 * 8 + -8);
                            local_7c8 = *(undefined1 **)
                                         ((long)ppuVar39 + (long)pLVar66 * 8 + lVar41 + -8);
                            dVar119 = *(double *)(local_680 + (long)pLVar66 * 8 + -8);
                            dVar119 = dVar119 + dVar119;
                            dVar13 = *(double *)((long)pdVar48 + (long)pLVar66 * 8 + lVar84);
                            dVar13 = dVar13 + dVar13;
                            dVar131 = *(double *)(local_600 + (long)pLVar66 * 8);
                            dVar131 = dVar131 + dVar131;
                            dVar14 = *(double *)((long)ppuVar39 + (long)pLVar66 * 8 + lVar41);
                            dVar130 = *(double *)(local_680 + (long)pLVar66 * 8);
                            dVar130 = dVar130 + dVar130;
                            puVar120 = local_660[(long)&pLVar66[-1].field_0x10f];
                            dVar128 = (double)local_660[(long)pLVar66] +
                                      (double)local_660[(long)pLVar66];
                            dVar129 = *(double *)((long)pdVar48 + (long)pLVar66 * 8 + lVar94);
                            dVar133 = dVar9 - (dVar129 + dVar129);
                            dVar129 = *(double *)(local_758 + (long)pLVar66 * 8 + -8) * -2.0 -
                                      dVar10;
                            dVar126 = (((double)local_668[(long)pLVar66] * -4.0 +
                                       (dVar131 - dVar14) + dVar13) *
                                       *(double *)(local_640 + (long)pLVar66 * 8) *
                                       (double)local_7e8 * dVar25 +
                                      ((double)local_668[(long)&pLVar66[-1].field_0x10f] * 4.0 +
                                      (dVar12 * -2.0 - (double)local_7c8) + dVar118) *
                                      *(double *)(local_640 + (long)pLVar66 * 8 + -8) * local_798 *
                                      dVar25 + (*(double *)
                                                 ((long)pdVar48 + (long)pLVar66 * 8 + lVar92) * 4.0
                                               + (dVar124 - dVar113)) *
                                               *(double *)(local_6f0 + (long)pLVar66 * 8) *
                                               (double)local_7e8 * dVar127 +
                                               (*(double *)
                                                 ((long)pdVar48 + (long)pLVar66 * 8 + lVar92 + -8) *
                                                -4.0 + dVar129 + dVar112) *
                                               *(double *)(local_6f0 + (long)pLVar66 * 8 + -8) *
                                               local_798 * dVar127 +
                                               (*(double *)
                                                 ((long)pdVar48 + (long)pLVar66 * 8 + lVar54) * 4.0
                                               + dVar133 + dVar111) *
                                               *(double *)(local_648 + (long)pLVar66 * 8) *
                                               (double)local_7e8 * dVar25 +
                                               (*(double *)
                                                 ((long)pdVar48 + (long)pLVar66 * 8 + lVar54 + -8) *
                                                -4.0 + (dVar123 - dVar110)) *
                                               *(double *)(local_648 + (long)pLVar66 * 8 + -8) *
                                               local_798 * dVar25 +
                                               (*(double *)(local_760 + (long)pLVar66 * 8 + -8) *
                                                4.0 + dVar5 + dVar5 +
                                                      (double)puVar120 + (double)puVar120 + dVar6) *
                                               *(double *)(local_638 + (long)pLVar66 * 8 + -8) *
                                               local_798 * dVar127 +
                                               (*(double *)(local_760 + (long)pLVar66 * 8) * -4.0 +
                                               (dVar7 - dVar128) + dVar109) *
                                               *(double *)(local_638 + (long)pLVar66 * 8) *
                                               (double)local_7e8 * dVar127) * (double)local_7c0 +
                                      (((double)local_678[(long)pLVar66] * -4.0 +
                                       (dVar14 - dVar13) + dVar130) *
                                       (double)local_780[(long)pLVar66] * dVar25 * dVar125 +
                                      ((double)local_678[(long)&pLVar66[-1].field_0x10f] * 4.0 +
                                      ((dVar118 - (double)local_7c8) - dVar119)) *
                                      (double)local_780[(long)&pLVar66[-1].field_0x10f] * dVar25 *
                                      dVar125 + (*(double *)(local_7d0 + (long)pLVar66 * 8) * 4.0 +
                                                dVar113 + dVar11 + dVar114) *
                                                *(double *)(local_720 + (long)pLVar66 * 8) * dVar127
                                                * dVar125 +
                                                (*(double *)(local_7d0 + (long)pLVar66 * 8 + -8) *
                                                 -4.0 + (dVar112 - dVar10) + dVar117) *
                                                *(double *)(local_720 + (long)pLVar66 * 8 + -8) *
                                                dVar127 * dVar125 +
                                                (*(double *)
                                                  ((long)pdVar48 + (long)pLVar66 * 8 + lVar67) * 4.0
                                                + dVar111 + dVar9 + dVar24) *
                                                *(double *)(local_728 + (long)pLVar66 * 8) *
                                                (double)((ulong)uVar42 << 0x20) * dVar126 +
                                                (*(double *)
                                                  ((long)pdVar48 + (long)pLVar66 * 8 + lVar67 + -8)
                                                 * -4.0 + (dVar110 - dVar8) + dVar132) *
                                                *(double *)(local_728 + (long)pLVar66 * 8 + -8) *
                                                (double)((ulong)uVar42 << 0x20) * dVar126 +
                                                ((double)local_650[(long)&pLVar66[-1].field_0x10f] *
                                                 4.0 + (dVar5 * -2.0 - dVar6) + dVar115) *
                                                *(double *)(local_778 + (long)pLVar66 * 8 + -8) *
                                                dVar127 * dVar126 +
                                                ((double)local_650[(long)pLVar66] * -4.0 +
                                                ((dVar109 + dVar7) - dVar116)) *
                                                *(double *)(local_778 + (long)pLVar66 * 8) * dVar127
                                                * dVar126) * (double)local_718 +
                                      (((double)local_670[(long)pLVar66] * -4.0 +
                                       (dVar14 - dVar131) + dVar130) *
                                       *(double *)(local_700 + (long)pLVar66 * 8) *
                                       (double)local_7e8 * dVar125 +
                                      ((double)local_670[(long)&pLVar66[-1].field_0x10f] * 4.0 +
                                      dVar12 + dVar12 + (double)local_7c8 + dVar119) *
                                      *(double *)(local_700 + (long)pLVar66 * 8 + -8) * local_798 *
                                      dVar125 + (*(double *)
                                                  ((long)pdVar48 + (long)pLVar66 * 8 + lVar88) * 4.0
                                                + (dVar124 - dVar114)) *
                                                *(double *)(local_730 + (long)pLVar66 * 8) *
                                                (double)local_7e8 * dVar125 +
                                                (*(double *)
                                                  ((long)pdVar48 + (long)pLVar66 * 8 + lVar88 + -8)
                                                 * -4.0 + dVar117 + dVar129) *
                                                *(double *)(local_730 + (long)pLVar66 * 8 + -8) *
                                                local_798 * dVar125 +
                                                (*(double *)
                                                  ((long)pdVar48 + (long)pLVar66 * 8 + lVar49) * 4.0
                                                + dVar24 + dVar133) *
                                                *(double *)(local_6c8 + (long)pLVar66 * 8) *
                                                (double)local_7e8 * dVar126 +
                                                (*(double *)
                                                  ((long)pdVar48 + (long)pLVar66 * 8 + lVar49 + -8)
                                                 * -4.0 + (dVar123 - dVar132)) *
                                                *(double *)(local_6c8 + (long)pLVar66 * 8 + -8) *
                                                local_798 * dVar126 +
                                                (*(double *)(local_788 + (long)pLVar66 * 8 + -8) *
                                                 4.0 + ((double)puVar120 * -2.0 - dVar6) + dVar115)
                                                * *(double *)(local_6f8 + (long)pLVar66 * 8 + -8) *
                                                local_798 * dVar126 +
                                                (*(double *)(local_788 + (long)pLVar66 * 8) * -4.0 +
                                                (dVar128 - dVar7) + dVar116) *
                                                *(double *)(local_6f8 + (long)pLVar66 * 8) *
                                                (double)local_7e8 * dVar126) * dVar57;
                          }
                          *(double *)
                           (local_698 +
                           (long)pLVar66 * 8 +
                           ((long)local_900 - (long)local_558._4_4_) *
                           CONCAT44(local_578._12_4_,local_578._8_4_) * 8 +
                           CONCAT44(local_578._4_4_,local_578._0_4_) +
                           ((long)(int)(uint)local_708 - (long)local_550) * (long)local_568 * 8 +
                           (long)(int)local_558 * -8) = dVar126;
                          pLVar66 = (LayoutData<int> *)
                                    ((long)&(pLVar66->super_FabArrayBase)._vptr_FabArrayBase + 1);
                        } while ((local_7b8.bigend.vect[0] - local_7b8.smallend.vect[0]) + 1 !=
                                 (int)pLVar66);
                      }
                      local_900 = (FabArray<amrex::IArrayBox> *)
                                  ((long)&(local_900->super_FabArrayBase)._vptr_FabArrayBase + 1);
                      local_418._0_8_ = local_418._0_8_ + 1;
                      lVar36 = lVar36 + local_500;
                    } while (local_6e4 != (int)local_900);
                  }
                  uVar31 = (uint)local_708 + 1;
                  local_4c8 = CONCAT44(local_4c8._4_4_,(int)local_4c8 + 1);
                  bVar30 = (uint)local_708 != local_7b8.bigend.vect[2];
                  local_708 = (ulong)uVar31;
                } while (bVar30);
              }
              puVar20 = (this->m_eb_vel_dot_n).
                        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((_Head_base<0UL,_amrex::MultiFab_*,_false>)
                  *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
                   &puVar20[local_620]._M_t.
                    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> !=
                  (MultiFab *)0x0) {
                FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                          (&local_458,
                           (FabArray<amrex::FArrayBox> *)
                           puVar20[local_620]._M_t.
                           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                           ,(MFIter *)local_1b8);
                MultiCutFab::const_array(&local_300,local_628,(MFIter *)local_1b8);
                FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                          (&local_3e8,&(local_4e8._M_head_impl)->super_FabArray<amrex::FArrayBox>,
                           (MFIter *)local_1b8);
                local_770 = CONCAT44(local_770._4_4_,local_7b8.bigend.vect[2]);
                local_788 = (ulong)(uint)local_7b8.smallend.vect[2];
                if (local_7b8.smallend.vect[2] <= local_7b8.bigend.vect[2]) {
                  local_768 = (long)local_7b8.smallend.vect[1];
                  local_758 = (long)local_7b8.smallend.vect[0];
                  local_7d0 = CONCAT44(local_7d0._4_4_,local_7b8.bigend.vect[1] + 1U);
                  lVar36 = local_758 * 8;
                  local_778 = local_768 + -1;
                  local_740 = CONCAT44(local_740._4_4_,local_7b8.smallend.vect[2] - 1);
                  local_780 = (undefined **)(local_758 * 4);
                  local_738 = CONCAT44(local_738._4_4_,local_7b8.bigend.vect[0]);
                  uVar31 = (local_7b8.bigend.vect[0] - local_7b8.smallend.vect[0]) + 1;
                  local_760 = (ulong)uVar31;
                  do {
                    if (local_7b8.smallend.vect[1] <= local_7b8.bigend.vect[1]) {
                      lVar98 = (long)(int)local_740;
                      lVar73 = (long)(int)local_788;
                      lVar84 = CONCAT44(local_5b8.jstride._4_4_,(uint)local_5b8.jstride) * 4;
                      local_930 = (long)local_780 +
                                  (local_768 - local_5b8.begin.y) * lVar84 +
                                  (lVar73 - local_5b8.begin.z) *
                                  CONCAT44(local_5b8.kstride._4_4_,(int)local_5b8.kstride) * 4 +
                                  (long)local_5b8.begin.x * -4 +
                                  CONCAT44(local_5b8.p._4_4_,(int)local_5b8.p);
                      local_8f0 = (undefined **)local_778;
                      local_8b0 = (LayoutData<int> *)local_768;
                      do {
                        if (local_7b8.smallend.vect[0] <= local_7b8.bigend.vect[0]) {
                          lVar79 = (long)local_3e8.begin.x;
                          lVar80 = CONCAT44(local_3e8.jstride._4_4_,(int)local_3e8.jstride) * 8;
                          lVar67 = ((long)local_8f0 - (long)local_3e8.begin.y) * lVar80;
                          lVar41 = CONCAT44(local_3e8.kstride._4_4_,(int)local_3e8.kstride) * 8;
                          lVar68 = (lVar98 - local_3e8.begin.z) * lVar41;
                          lVar40 = lVar67 + lVar68;
                          lVar41 = (lVar73 - local_3e8.begin.z) * lVar41;
                          lVar67 = lVar67 + lVar41;
                          lVar80 = ((long)local_8b0 - (long)local_3e8.begin.y) * lVar80;
                          lVar68 = lVar68 + lVar80;
                          lVar80 = lVar80 + lVar41;
                          lVar78 = local_3e8.nstride * 0x10;
                          lVar41 = local_3e8.nstride * 0x30;
                          lVar71 = local_3e8.nstride * 0x20;
                          lVar49 = local_3e8.nstride * 0x28;
                          lVar50 = local_3e8.nstride * 0x18;
                          lVar54 = lVar40 + lVar41 + lVar79 * -8 + lVar36;
                          lVar69 = lVar40 + lVar71 + lVar79 * -8 + lVar36;
                          lVar70 = lVar40 + lVar49 + lVar79 * -8 + lVar36;
                          lVar77 = lVar40 + lVar78 + lVar79 * -8 + lVar36;
                          lVar85 = lVar40 + lVar50 + lVar79 * -8 + lVar36;
                          lVar92 = lVar40 + local_3e8.nstride * 8 + lVar79 * -8 + lVar36;
                          local_798 = (double)((long)local_3e8.p + lVar40 + lVar79 * -8 + lVar36);
                          lVar40 = lVar67 + lVar41 + lVar79 * -8 + lVar36;
                          lVar88 = lVar67 + lVar71 + lVar79 * -8 + lVar36;
                          lVar94 = lVar67 + lVar49 + lVar79 * -8 + lVar36;
                          lVar65 = lVar67 + lVar78 + lVar79 * -8 + lVar36;
                          lVar51 = lVar67 + lVar50 + lVar79 * -8 + lVar36;
                          lVar55 = lVar67 + local_3e8.nstride * 8 + lVar79 * -8 + lVar36;
                          local_7e8 = (undefined **)
                                      ((long)local_3e8.p + lVar67 + lVar79 * -8 + lVar36);
                          lVar67 = lVar68 + lVar41 + lVar79 * -8 + lVar36;
                          lVar56 = lVar68 + lVar71 + lVar79 * -8 + lVar36;
                          lVar64 = lVar68 + lVar49 + lVar79 * -8 + lVar36;
                          lVar60 = lVar68 + lVar78 + lVar79 * -8 + lVar36;
                          lVar82 = lVar68 + lVar50 + lVar79 * -8 + lVar36;
                          lVar103 = lVar68 + local_3e8.nstride * 8 + lVar79 * -8 + lVar36;
                          lVar68 = lVar68 + lVar79 * -8 + lVar36;
                          lVar41 = lVar41 + lVar80 + lVar79 * -8 + lVar36;
                          lVar71 = lVar71 + lVar80 + lVar79 * -8 + lVar36;
                          lVar49 = lVar49 + lVar80 + lVar79 * -8 + lVar36;
                          lVar78 = lVar78 + lVar80 + lVar79 * -8 + lVar36;
                          local_7c8 = (undefined1 *)
                                      ((long)local_3e8.p + lVar50 + lVar80 + lVar79 * -8 + lVar36);
                          lVar50 = lVar80 + local_3e8.nstride * 8 + lVar79 * -8 + lVar36;
                          lVar79 = lVar80 + lVar79 * -8 + lVar36;
                          lVar80 = CONCAT44(local_458.kstride._4_4_,(uint)local_458.kstride) * 8;
                          lVar93 = (lVar98 - local_458.begin.z) * lVar80;
                          lVar80 = (lVar73 - local_458.begin.z) * lVar80;
                          lVar91 = CONCAT44(local_458.jstride._4_4_,(int)local_458.jstride) * 8;
                          lVar90 = ((long)local_8f0 - (long)local_458.begin.y) * lVar91;
                          lVar91 = ((long)local_8b0 - (long)local_458.begin.y) * lVar91;
                          lVar83 = (long)local_458.begin.x;
                          lVar86 = CONCAT44(local_458.p._4_4_,(int)local_458.p) + lVar36;
                          lVar89 = lVar90 + lVar93 + lVar83 * -8 + lVar86;
                          lVar90 = lVar90 + lVar80 + lVar83 * -8 + lVar86;
                          lVar93 = lVar93 + lVar91 + lVar83 * -8 + lVar86;
                          lVar86 = lVar91 + lVar80 + lVar83 * -8 + lVar86;
                          lVar80 = CONCAT44(local_300.kstride._4_4_,(int)local_300.kstride) * 8;
                          lVar91 = (lVar98 - local_300.begin.z) * lVar80;
                          lVar80 = (lVar73 - local_300.begin.z) * lVar80;
                          lVar100 = CONCAT44(local_300.jstride._4_4_,(int)local_300.jstride) * 8;
                          lVar83 = ((long)local_8f0 - (long)local_300.begin.y) * lVar100;
                          lVar100 = ((long)local_8b0 - (long)local_300.begin.y) * lVar100;
                          lVar99 = (long)local_300.begin.x;
                          lVar104 = CONCAT44(local_300.p._4_4_,(int)local_300.p) + lVar36;
                          lVar81 = lVar83 + lVar91 + lVar99 * -8 + lVar104;
                          lVar83 = lVar83 + lVar80 + lVar99 * -8 + lVar104;
                          lVar91 = lVar91 + lVar100 + lVar99 * -8 + lVar104;
                          lVar104 = lVar100 + lVar80 + lVar99 * -8 + lVar104;
                          lVar100 = ((long)local_8b0 - (long)local_558._4_4_) *
                                    CONCAT44(local_578._12_4_,local_578._8_4_) * 8 +
                                    (lVar73 - local_550) * (long)local_568 * 8 +
                                    (long)(int)local_558 * -8 +
                                    CONCAT44(local_578._4_4_,local_578._0_4_) + lVar36;
                          lVar80 = 0;
                          do {
                            if (*(int *)(local_930 + lVar80 * 4) == 0) {
                              dVar126 = *(double *)((long)local_3e8.p + lVar80 * 8 + lVar55 + -8);
                              dVar127 = *(double *)((long)local_3e8.p + lVar80 * 8 + lVar55);
                              dVar125 = *(double *)((long)local_3e8.p + lVar80 * 8 + lVar65 + -8);
                              dVar5 = *(double *)((long)local_3e8.p + lVar80 * 8 + lVar65);
                              dVar109 = *(double *)((long)local_3e8.p + lVar80 * 8 + lVar79 + -8);
                              dVar6 = *(double *)((long)local_3e8.p + lVar80 * 8 + lVar79);
                              dVar7 = *(double *)((long)local_3e8.p + lVar80 * 8 + lVar50 + -8);
                              dVar115 = *(double *)((long)local_3e8.p + lVar80 * 8 + lVar50);
                              dVar116 = *(double *)((long)local_3e8.p + lVar80 * 8 + lVar78 + -8);
                              dVar110 = *(double *)((long)local_3e8.p + lVar80 * 8 + lVar78);
                              dVar8 = *(double *)((long)local_798 + lVar80 * 8 + -8);
                              dVar132 = *(double *)((long)local_798 + lVar80 * 8);
                              dVar9 = *(double *)((long)local_3e8.p + lVar80 * 8 + lVar92 + -8);
                              dVar10 = *(double *)((long)local_3e8.p + lVar80 * 8 + lVar92);
                              dVar113 = *(double *)((long)local_3e8.p + lVar80 * 8 + lVar77 + -8);
                              dVar114 = *(double *)((long)local_3e8.p + lVar80 * 8 + lVar77);
                              dVar11 = *(double *)((long)local_3e8.p + lVar80 * 8 + lVar68 + -8);
                              dVar118 = *(double *)((long)local_3e8.p + lVar80 * 8 + lVar68);
                              dVar12 = *(double *)((long)local_3e8.p + lVar80 * 8 + lVar103 + -8);
                              dVar119 = *(double *)((long)local_3e8.p + lVar80 * 8 + lVar103);
                              dVar13 = *(double *)((long)local_3e8.p + lVar80 * 8 + lVar60 + -8);
                              dVar131 = *(double *)((long)local_3e8.p + lVar80 * 8 + lVar60);
                              *(double *)(lVar100 + lVar80 * 8) =
                                   ((*(double *)((long)local_3e8.p + lVar80 * 8 + lVar67) * 8.0 +
                                    *(double *)((long)local_3e8.p + lVar80 * 8 + lVar56) * -4.0 +
                                    *(double *)((long)local_3e8.p + lVar80 * 8 + lVar64) * -4.0 +
                                    dVar131 + dVar131 +
                                    *(double *)((long)local_3e8.p + lVar80 * 8 + lVar82) * 4.0 +
                                    ((*(double *)(lVar91 + lVar80 * 8) - (dVar118 + dVar118)) -
                                    (dVar119 + dVar119))) * *(double *)(lVar93 + lVar80 * 8) +
                                   (*(double *)((long)local_3e8.p + lVar80 * 8 + lVar67 + -8) * -8.0
                                   + *(double *)((long)local_3e8.p + lVar80 * 8 + lVar56 + -8) * 4.0
                                     + *(double *)((long)local_3e8.p + lVar80 * 8 + lVar64 + -8) *
                                       -4.0 + dVar13 + dVar13 +
                                              *(double *)
                                               ((long)local_3e8.p + lVar80 * 8 + lVar82 + -8) * -4.0
                                              + ((dVar11 + dVar11 +
                                                 *(double *)(lVar91 + -8 + lVar80 * 8)) -
                                                (dVar12 + dVar12))) *
                                   *(double *)(lVar93 + -8 + lVar80 * 8) +
                                   (*(double *)((long)local_3e8.p + lVar80 * 8 + lVar54) * -8.0 +
                                   *(double *)((long)local_3e8.p + lVar80 * 8 + lVar69) * -4.0 +
                                   *(double *)((long)local_3e8.p + lVar80 * 8 + lVar70) * 4.0 +
                                   dVar114 + dVar114 +
                                   *(double *)((long)local_3e8.p + lVar80 * 8 + lVar85) * -4.0 +
                                   dVar10 + dVar10 +
                                   (*(double *)(lVar81 + lVar80 * 8) - (dVar132 + dVar132))) *
                                   *(double *)(lVar89 + lVar80 * 8) +
                                   (*(double *)((long)local_3e8.p + lVar80 * 8 + lVar54 + -8) * 8.0
                                   + *(double *)((long)local_3e8.p + lVar80 * 8 + lVar69 + -8) * 4.0
                                     + *(double *)((long)local_3e8.p + lVar80 * 8 + lVar70 + -8) *
                                       4.0 + dVar113 + dVar113 +
                                             *(double *)
                                              ((long)local_3e8.p + lVar80 * 8 + lVar85 + -8) * 4.0 +
                                             dVar9 + dVar9 +
                                             dVar8 + dVar8 + *(double *)(lVar81 + -8 + lVar80 * 8))
                                   * *(double *)(lVar89 + -8 + lVar80 * 8) +
                                   (*(double *)((long)local_3e8.p + lVar80 * 8 + lVar41) * -8.0 +
                                   *(double *)((long)local_3e8.p + lVar80 * 8 + lVar71) * 4.0 +
                                   *(double *)((long)local_3e8.p + lVar80 * 8 + lVar49) * 4.0 +
                                   ((*(double *)(local_7c8 + lVar80 * 8) * 4.0 +
                                    ((*(double *)(lVar104 + lVar80 * 8) - (dVar6 + dVar6)) -
                                    (dVar115 + dVar115))) - (dVar110 + dVar110))) *
                                   *(double *)(lVar86 + lVar80 * 8) +
                                   (*(double *)((long)local_3e8.p + lVar80 * 8 + lVar41 + -8) * 8.0
                                   + *(double *)((long)local_3e8.p + lVar80 * 8 + lVar71 + -8) *
                                     -4.0 + *(double *)
                                             ((long)local_3e8.p + lVar80 * 8 + lVar49 + -8) * 4.0 +
                                            ((*(double *)(local_7c8 + lVar80 * 8 + -8) * -4.0 +
                                             ((dVar109 + dVar109 +
                                              *(double *)(lVar104 + -8 + lVar80 * 8)) -
                                             (dVar7 + dVar7))) - (dVar116 + dVar116))) *
                                   *(double *)(lVar86 + -8 + lVar80 * 8) +
                                   (*(double *)((long)local_3e8.p + lVar80 * 8 + lVar40 + -8) * -8.0
                                   + *(double *)((long)local_3e8.p + lVar80 * 8 + lVar88 + -8) *
                                     -4.0 + *(double *)
                                             ((long)local_3e8.p + lVar80 * 8 + lVar94 + -8) * -4.0 +
                                            ((*(double *)
                                               ((long)local_3e8.p + lVar80 * 8 + lVar51 + -8) * 4.0
                                             + dVar126 + dVar126 +
                                               (double)local_7e8[lVar80 + -1] +
                                               (double)local_7e8[lVar80 + -1] +
                                               *(double *)(lVar83 + -8 + lVar80 * 8)) -
                                            (dVar125 + dVar125))) *
                                   *(double *)(lVar90 + -8 + lVar80 * 8) +
                                   (*(double *)((long)local_3e8.p + lVar80 * 8 + lVar40) * 8.0 +
                                   *(double *)((long)local_3e8.p + lVar80 * 8 + lVar88) * 4.0 +
                                   *(double *)((long)local_3e8.p + lVar80 * 8 + lVar94) * -4.0 +
                                   ((*(double *)((long)local_3e8.p + lVar80 * 8 + lVar51) * -4.0 +
                                    dVar127 + dVar127 +
                                    (*(double *)(lVar83 + lVar80 * 8) -
                                    ((double)local_7e8[lVar80] + (double)local_7e8[lVar80]))) -
                                   (dVar5 + dVar5))) * *(double *)(lVar90 + lVar80 * 8)) * local_518
                                   + *(double *)(lVar100 + lVar80 * 8);
                            }
                            lVar80 = lVar80 + 1;
                          } while (uVar31 != (uint)lVar80);
                        }
                        local_8b0 = (LayoutData<int> *)((long)local_8b0 + 1);
                        local_8f0 = (undefined **)((long)local_8f0 + 1);
                        local_930 = local_930 + lVar84;
                      } while (local_7b8.bigend.vect[1] + 1U != (int)local_8b0);
                    }
                    uVar42 = (int)local_788 + 1;
                    local_740 = CONCAT44(local_740._4_4_,(int)local_740 + 1);
                    bVar30 = (int)local_788 != local_7b8.bigend.vect[2];
                    local_788 = (ulong)uVar42;
                  } while (bVar30);
                }
              }
            }
            else {
              bVar30 = true;
              if (local_70c != covered) goto LAB_006e3b1c;
              iVar62 = local_7b8.bigend.vect[2];
              if (local_7b8.smallend.vect[2] <= local_7b8.bigend.vect[2]) {
                iVar32 = local_7b8.smallend.vect[1];
                lVar36 = (long)local_7b8.smallend.vect[1];
                iVar53 = local_7b8.smallend.vect[0];
                local_7e8 = (undefined **)((long)local_7b8.smallend.vect[0] << 3);
                uVar42 = local_7b8.bigend.vect[0] - local_7b8.smallend.vect[0];
                local_798 = (double)CONCAT44(local_798._4_4_,local_7b8.bigend.vect[1]);
                iVar43 = local_7b8.bigend.vect[1] - local_7b8.smallend.vect[1];
                uVar31 = local_7b8.smallend.vect[2];
                do {
                  if (iVar32 <= (int)local_798) {
                    lVar98 = CONCAT44(local_578._12_4_,local_578._8_4_) * 8;
                    pvVar87 = (void *)((long)local_7e8 +
                                      (lVar36 - local_558._4_4_) * lVar98 +
                                      (long)(int)(uVar31 - local_550) * (long)local_568 * 8 +
                                      (long)(int)local_558 * -8 +
                                      CONCAT44(local_578._4_4_,local_578._0_4_));
                    iVar97 = iVar43 + 1;
                    do {
                      if (iVar53 <= iVar75) {
                        memset(pvVar87,0,(ulong)uVar42 * 8 + 8);
                      }
                      pvVar87 = (void *)((long)pvVar87 + lVar98);
                      iVar97 = iVar97 + -1;
                    } while (iVar97 != 0);
                  }
                  bVar30 = uVar31 != iVar62;
                  uVar31 = uVar31 + 1;
                } while (bVar30);
              }
            }
            bVar30 = false;
          }
LAB_006e3b1c:
          if (bVar30) {
            local_720 = CONCAT44(local_720._4_4_,local_7b8.bigend.vect[2]);
            if (local_7b8.smallend.vect[2] <= local_7b8.bigend.vect[2]) {
              local_728 = (ulong)(uint)local_7b8.bigend.vect[1];
              local_780 = (undefined **)(long)local_7b8.smallend.vect[1];
              local_760 = (ulong)local_7b8.smallend.vect[0];
              local_788 = CONCAT44(local_788._4_4_,local_7b8.bigend.vect[1] + 1U);
              lVar36 = local_760 * 8;
              local_730 = -local_760;
              local_6f8 = local_760 * 4;
              local_700 = CONCAT44(local_700._4_4_,local_7b8.smallend.vect[1] + -1);
              local_768 = CONCAT44(local_768._4_4_,local_7b8.smallend.vect[2] - 1);
              local_778 = CONCAT44(local_778._4_4_,local_7b8.smallend.vect[0] + -1);
              local_758 = CONCAT44(local_758._4_4_,local_7b8.bigend.vect[0]);
              uVar31 = local_7b8.smallend.vect[2];
              do {
                if (local_7b8.smallend.vect[1] <= local_7b8.bigend.vect[1]) {
                  local_770 = (ulong)(int)uVar31;
                  local_738 = CONCAT44(local_5b8.jstride._4_4_,(uint)local_5b8.jstride) * 4;
                  lVar98 = local_6f8 +
                           ((long)local_780 - (long)local_5b8.begin.y) * local_738 +
                           (local_770 - (long)local_5b8.begin.z) *
                           CONCAT44(local_5b8.kstride._4_4_,(int)local_5b8.kstride) * 4 +
                           (long)local_5b8.begin.x * -4 +
                           CONCAT44(local_5b8.p._4_4_,(int)local_5b8.p);
                  local_7d0 = CONCAT44(local_7d0._4_4_,local_7b8.smallend.vect[1] + -1);
                  local_7e8 = local_780;
                  do {
                    if (local_7b8.smallend.vect[0] <= local_7b8.bigend.vect[0]) {
                      lVar73 = CONCAT44(local_498.kstride._4_4_,(undefined4)local_498.kstride);
                      lVar49 = (int)(~local_498.begin.z + uVar31) * lVar73;
                      lVar40 = (int)(uVar31 - local_498.begin.z) * lVar73;
                      lVar92 = (local_770 - (long)local_498.begin.z) * lVar73 * 8;
                      lVar84 = (long)((int)local_768 - local_498.begin.z) * lVar73 * 8;
                      lVar73 = CONCAT44(local_498.jstride._4_4_,(uint)local_498.jstride);
                      lVar77 = (~local_498.begin.y + (int)local_7e8) * lVar73;
                      lVar41 = lVar73 * ((long)local_7e8 - (long)local_498.begin.y);
                      lVar50 = (long)((int)local_7d0 - local_498.begin.y) * lVar73 * 8;
                      lVar69 = lVar73 * 8 * ((long)local_7e8 - (long)local_498.begin.y);
                      lVar73 = lVar50 + lVar92;
                      lVar50 = lVar50 + lVar84;
                      lVar92 = lVar92 + lVar69;
                      lVar69 = lVar69 + lVar84;
                      lVar84 = CONCAT44(local_498.nstride._4_4_,(undefined4)local_498.nstride);
                      lVar54 = lVar84 * 0x10;
                      lVar85 = (long)local_498.begin.x;
                      lVar70 = 0;
                      local_7c8 = (undefined1 *)CONCAT44(local_7c8._4_4_,local_6c0.arr[0]);
                      do {
                        dVar126 = 0.0;
                        if (*(int *)(lVar98 + lVar70 * 4) == 0) {
                          if (((local_6b0.arr[0] == Neumann) ||
                              (dVar126 = 1.0, local_6b0.arr[0] == inflow)) &&
                             (dVar126 = 1.0, local_730 + local_808.smallend.vect[0] == lVar70)) {
                            dVar126 = 0.0;
                          }
                          if (((local_6c0.arr[0] == Neumann) ||
                              (dVar127 = 1.0, local_6c0.arr[0] == inflow)) &&
                             (dVar127 = 1.0, local_730 + local_808.bigend.vect[0] == lVar70)) {
                            dVar127 = 0.0;
                          }
                          if (local_6b0.arr[1] == Neumann) {
                            uVar42 = 0x3ff00000;
                            if (local_7e8 == (undefined **)(long)local_808.smallend.vect[1]) {
LAB_006e4073:
                              uVar42 = 0;
                            }
                          }
                          else {
                            uVar42 = 0x3ff00000;
                            if (local_7e8 == (undefined **)(long)local_808.smallend.vect[1] &&
                                local_6b0.arr[1] == inflow) goto LAB_006e4073;
                          }
                          if (local_6c0.arr[1] == Neumann) {
                            uVar44 = 0x3ff00000;
                            if (local_7e8 == (undefined **)(long)local_808.bigend.vect[1]) {
LAB_006e40a1:
                              uVar44 = 0;
                            }
                          }
                          else {
                            uVar44 = 0x3ff00000;
                            if (local_7e8 == (undefined **)(long)local_808.bigend.vect[1] &&
                                local_6c0.arr[1] == inflow) goto LAB_006e40a1;
                          }
                          if (local_6b0.arr[2] == Neumann) {
                            dVar125 = 1.0;
                            if (local_808.smallend.vect[2] == uVar31) {
LAB_006e40d2:
                              dVar125 = 0.0;
                            }
                          }
                          else {
                            dVar125 = 1.0;
                            if (local_6b0.arr[2] == inflow && local_808.smallend.vect[2] == uVar31)
                            goto LAB_006e40d2;
                          }
                          dVar5 = (double)((ulong)uVar44 << 0x20);
                          uVar44 = 0x3ff00000;
                          if (local_6c0.arr[2] == Neumann) {
                            if (local_808.bigend.vect[2] == uVar31) {
LAB_006e4108:
                              uVar44 = 0;
                            }
                          }
                          else if (local_6c0.arr[2] == inflow && local_808.bigend.vect[2] == uVar31)
                          goto LAB_006e4108;
                          lVar88 = (long)(((local_7b8.smallend.vect[0] + -1) - local_498.begin.x) +
                                         (int)lVar70);
                          ppuVar39 = (undefined **)(local_498.p + lVar77 + lVar88 + lVar49);
                          ppuVar1 = (undefined **)(local_498.p + lVar41 + lVar88 + lVar49);
                          ppuVar2 = (undefined **)(local_498.p + lVar77 + lVar88 + lVar40);
                          dVar109 = (double)((ulong)uVar42 << 0x20);
                          ppuVar3 = (undefined **)(local_498.p + lVar41 + lVar88 + lVar40);
                          local_798 = -(double)ppuVar39[lVar84] * dVar126;
                          uStack_790 = 0x8000000000000000;
                          dVar126 = (dVar127 * *(double *)
                                                ((long)local_498.p +
                                                lVar70 * 8 + lVar92 + lVar54 + lVar85 * -8 + lVar36)
                                     * dVar5 +
                                    dVar126 * (double)ppuVar3[lVar84 * 2] * dVar5 +
                                    *(double *)
                                     ((long)local_498.p +
                                     lVar70 * 8 + lVar73 + lVar54 + lVar85 * -8 + lVar36) * dVar127
                                    * dVar109 +
                                    (double)ppuVar2[lVar84 * 2] * dVar126 * dVar109 +
                                    (((-(double)ppuVar39[lVar84 * 2] * dVar126 * dVar109 -
                                      *(double *)
                                       ((long)local_498.p +
                                       lVar70 * 8 + lVar50 + lVar54 + lVar85 * -8 + lVar36) *
                                      dVar127 * dVar109) -
                                     (double)ppuVar1[lVar84 * 2] * dVar126 * dVar5) -
                                    *(double *)
                                     ((long)local_498.p +
                                     lVar70 * 8 + lVar54 + lVar69 + lVar85 * -8 + lVar36) * dVar127
                                    * dVar5)) * (double)local_7c0 +
                                    (*(double *)
                                      ((long)local_498.p +
                                      lVar70 * 8 + lVar92 + lVar85 * -8 + lVar36) * dVar5 *
                                     (double)((ulong)uVar44 << 0x20) +
                                    ((*(double *)
                                       ((long)local_498.p +
                                       lVar70 * 8 + lVar73 + lVar85 * -8 + lVar36) * dVar109 *
                                      (double)((ulong)uVar44 << 0x20) +
                                     ((*(double *)
                                        ((long)local_498.p +
                                        lVar70 * 8 + lVar69 + lVar85 * -8 + lVar36) * dVar5 *
                                       dVar125 +
                                      ((*(double *)
                                         ((long)local_498.p +
                                         lVar70 * 8 + lVar50 + lVar85 * -8 + lVar36) * dVar109 *
                                        dVar125 -
                                       (double)*ppuVar39 * (double)((ulong)uVar42 << 0x20) * dVar125
                                       ) - (double)*ppuVar1 * dVar5 * dVar125)) -
                                     (double)*ppuVar2 * dVar109 * (double)((ulong)uVar44 << 0x20)))
                                    - (double)*ppuVar3 * dVar5 * (double)((ulong)uVar44 << 0x20))) *
                                    (double)local_718 +
                                    (*(double *)
                                      ((long)local_498.p +
                                      lVar70 * 8 + lVar92 + lVar84 * 8 + lVar85 * -8 + lVar36) *
                                     dVar127 * (double)((ulong)uVar44 << 0x20) +
                                    (double)ppuVar3[lVar84] * dVar126 *
                                    (double)((ulong)uVar44 << 0x20) +
                                    (((*(double *)
                                        ((long)local_498.p +
                                        lVar70 * 8 + lVar69 + lVar84 * 8 + lVar85 * -8 + lVar36) *
                                       dVar127 * dVar125 +
                                      (double)ppuVar1[lVar84] * dVar126 * dVar125 +
                                      (local_798 * dVar125 -
                                      *(double *)
                                       ((long)local_498.p +
                                       lVar70 * 8 + lVar50 + lVar84 * 8 + lVar85 * -8 + lVar36) *
                                      dVar127 * dVar125)) -
                                     (double)ppuVar2[lVar84] * dVar126 *
                                     (double)((ulong)uVar44 << 0x20)) -
                                    *(double *)
                                     ((long)local_498.p +
                                     lVar70 * 8 + lVar73 + lVar84 * 8 + lVar85 * -8 + lVar36) *
                                    dVar127 * (double)((ulong)uVar44 << 0x20))) * dVar57;
                        }
                        *(double *)
                         (((long)local_7e8 - (long)local_558._4_4_) *
                          CONCAT44(local_578._12_4_,local_578._8_4_) * 8 +
                          CONCAT44(local_578._4_4_,local_578._0_4_) +
                          ((long)(int)uVar31 - (long)local_550) * (long)local_568 * 8 +
                          (long)(int)local_558 * -8 + lVar36 + lVar70 * 8) = dVar126;
                        lVar70 = lVar70 + 1;
                        local_740 = lVar98;
                      } while ((local_7b8.bigend.vect[0] - local_7b8.smallend.vect[0]) + 1 !=
                               (int)lVar70);
                    }
                    local_7e8 = (undefined **)((long)local_7e8 + 1);
                    lVar98 = lVar98 + local_738;
                    local_7d0 = CONCAT44(local_7d0._4_4_,(int)local_7d0 + 1);
                  } while (local_7b8.bigend.vect[1] + 1U != (int)local_7e8);
                }
                local_768 = CONCAT44(local_768._4_4_,(int)local_768 + 1);
                bVar30 = uVar31 != local_7b8.bigend.vect[2];
                uVar31 = uVar31 + 1;
              } while (bVar30);
            }
          }
          mlndlap_impose_neumann_bc
                    (&local_7b8,(Array4<double> *)local_578,&local_808,&local_6b0,&local_6c0);
          uVar101 = local_620;
          if (local_270.
              super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[local_620]._M_t.
              super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
              super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl != (MultiFab *)0x0) {
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((Array4<double> *)local_5f8,
                       &(local_1f0.
                         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[local_620]._M_t.
                         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                         .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                        super_FabArray<amrex::FArrayBox>,(MFIter *)local_1b8);
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_340,
                       &(local_270.
                         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar101]._M_t.
                         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                         .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                        super_FabArray<amrex::FArrayBox>,(MFIter *)local_1b8);
            iVar53 = local_7b8.bigend.vect[0];
            iVar32 = local_7b8.bigend.vect[2];
            iVar75 = local_7b8.smallend.vect[0];
            iVar62 = local_7b8.smallend.vect[1];
            if (local_70c == covered) {
              if (local_7b8.smallend.vect[2] <= local_7b8.bigend.vect[2]) {
                lVar36 = (long)local_7b8.smallend.vect[1];
                local_7e8 = (undefined **)((long)local_7b8.smallend.vect[0] << 3);
                uVar42 = local_7b8.bigend.vect[0] - local_7b8.smallend.vect[0];
                local_798 = (double)CONCAT44(local_798._4_4_,local_7b8.bigend.vect[1]);
                iVar43 = local_7b8.bigend.vect[1] - local_7b8.smallend.vect[1];
                uVar31 = local_7b8.smallend.vect[2];
                do {
                  if (iVar62 <= (int)local_798) {
                    lVar98 = CONCAT44(local_5f8._12_4_,local_5f8._8_4_) * 8;
                    pvVar87 = (void *)(local_5f8._0_8_ + (long)local_7e8 +
                                      (lVar36 - local_5d4) * lVar98 +
                                      (long)(int)(uVar31 - local_5d0) *
                                      CONCAT44(local_5f8._20_4_,local_5f8._16_4_) * 8 +
                                      (long)local_5d8 * -8);
                    iVar97 = iVar43 + 1;
                    do {
                      if (iVar75 <= iVar53) {
                        memset(pvVar87,0,(ulong)uVar42 * 8 + 8);
                      }
                      pvVar87 = (void *)((long)pvVar87 + lVar98);
                      iVar97 = iVar97 + -1;
                    } while (iVar97 != 0);
                  }
                  bVar30 = uVar31 != iVar32;
                  uVar31 = uVar31 + 1;
                } while (bVar30);
              }
            }
            else if (local_70c == singlevalued) {
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        (&local_458,local_510,(MFIter *)local_1b8);
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        (&local_300,&(local_4e0._M_head_impl)->super_FabArray<amrex::FArrayBox>,
                         (MFIter *)local_1b8);
              local_780 = (undefined **)CONCAT44(local_780._4_4_,local_7b8.bigend.vect[2]);
              local_770 = (ulong)(uint)local_7b8.smallend.vect[2];
              if (local_7b8.smallend.vect[2] <= local_7b8.bigend.vect[2]) {
                local_720 = (ulong)(uint)local_7b8.bigend.vect[1];
                lVar98 = (long)local_7b8.smallend.vect[1];
                local_740 = (long)local_7b8.smallend.vect[0];
                local_768 = CONCAT44(local_768._4_4_,local_7b8.bigend.vect[1] + 1U);
                lVar36 = local_740 * 8;
                local_778 = CONCAT44(local_778._4_4_,local_7b8.smallend.vect[2] - 1);
                local_728 = lVar98 - 1;
                local_730 = local_740 * 4;
                local_788 = CONCAT44(local_788._4_4_,local_7b8.bigend.vect[0]);
                do {
                  if (local_7b8.smallend.vect[1] <= local_7b8.bigend.vect[1]) {
                    local_758 = (long)(int)local_770;
                    local_760 = (ulong)(int)local_778;
                    local_7d0 = CONCAT44(local_5f8._12_4_,local_5f8._8_4_) * 8;
                    local_930 = local_5f8._0_8_ +
                                (lVar98 - local_5d4) * local_7d0 +
                                (local_758 - local_5d0) *
                                CONCAT44(local_5f8._20_4_,local_5f8._16_4_) * 8 +
                                (long)local_5d8 * -8 + lVar36;
                    local_738 = CONCAT44(local_5b8.jstride._4_4_,(uint)local_5b8.jstride) * 4;
                    local_928 = local_730 +
                                (lVar98 - local_5b8.begin.y) * local_738 +
                                (local_758 - local_5b8.begin.z) *
                                CONCAT44(local_5b8.kstride._4_4_,(int)local_5b8.kstride) * 4 +
                                (long)local_5b8.begin.x * -4 +
                                CONCAT44(local_5b8.p._4_4_,(int)local_5b8.p);
                    local_880 = lVar98;
                    local_830 = local_728;
                    do {
                      if (local_7b8.smallend.vect[0] <= local_7b8.bigend.vect[0]) {
                        lVar55 = (long)local_300.begin.x;
                        lVar65 = CONCAT44(local_300.nstride._4_4_,(uint)local_300.nstride);
                        lVar51 = CONCAT44(local_300.jstride._4_4_,(int)local_300.jstride) * 8;
                        lVar92 = (local_880 - local_300.begin.y) * lVar51;
                        lVar84 = CONCAT44(local_300.kstride._4_4_,(int)local_300.kstride) * 8;
                        lVar67 = (local_760 - (long)local_300.begin.z) * lVar84;
                        lVar73 = lVar92 + lVar67;
                        lVar64 = lVar65 * 0x38;
                        lVar84 = (local_758 - local_300.begin.z) * lVar84;
                        lVar92 = lVar92 + lVar84;
                        lVar51 = (local_830 - (long)local_300.begin.y) * lVar51;
                        lVar67 = lVar67 + lVar51;
                        lVar51 = lVar51 + lVar84;
                        lVar82 = lVar65 * 0x10;
                        lVar88 = lVar65 * 0x90;
                        lVar103 = lVar65 * 0x40;
                        lVar94 = lVar65 * 0x30;
                        lVar56 = CONCAT44(local_300.p._4_4_,(int)local_300.p) + lVar36;
                        lVar84 = lVar73 + lVar88 + lVar55 * -8 + lVar56;
                        lVar40 = lVar73 + lVar103 + lVar55 * -8 + lVar56;
                        lVar41 = lVar73 + lVar64 + lVar55 * -8 + lVar56;
                        lVar49 = lVar73 + lVar94 + lVar55 * -8 + lVar56;
                        lVar50 = lVar73 + lVar82 + lVar55 * -8 + lVar56;
                        local_7e8 = (undefined **)(lVar73 + lVar65 * 8 + lVar55 * -8 + lVar56);
                        lVar73 = lVar73 + lVar55 * -8 + lVar56;
                        lVar54 = lVar92 + lVar88 + lVar55 * -8 + lVar56;
                        lVar69 = lVar92 + lVar103 + lVar55 * -8 + lVar56;
                        lVar70 = lVar92 + lVar64 + lVar55 * -8 + lVar56;
                        lVar77 = lVar92 + lVar94 + lVar55 * -8 + lVar56;
                        lVar93 = lVar92 + lVar82 + lVar55 * -8 + lVar56;
                        lVar85 = lVar92 + lVar65 * 8 + lVar55 * -8 + lVar56;
                        lVar92 = lVar92 + lVar55 * -8 + lVar56;
                        lVar89 = lVar67 + lVar88 + lVar55 * -8 + lVar56;
                        lVar100 = lVar67 + lVar103 + lVar55 * -8 + lVar56;
                        lVar60 = lVar67 + lVar64 + lVar55 * -8 + lVar56;
                        lVar86 = lVar67 + lVar94 + lVar55 * -8 + lVar56;
                        lVar78 = lVar67 + lVar82 + lVar55 * -8 + lVar56;
                        local_798 = (double)(lVar67 + lVar65 * 8 + lVar55 * -8 + lVar56);
                        lVar67 = lVar67 + lVar55 * -8 + lVar56;
                        lVar71 = lVar88 + lVar51 + lVar55 * -8 + lVar56;
                        lVar104 = lVar103 + lVar51 + lVar55 * -8 + lVar56;
                        lVar103 = lVar64 + lVar51 + lVar55 * -8 + lVar56;
                        lVar68 = lVar94 + lVar51 + lVar55 * -8 + lVar56;
                        lVar83 = lVar82 + lVar51 + lVar55 * -8 + lVar56;
                        lVar88 = lVar51 + lVar65 * 8 + lVar55 * -8 + lVar56;
                        local_7c8 = (undefined1 *)(lVar51 + lVar55 * -8 + lVar56);
                        lVar51 = (local_760 - (long)local_340.begin.z) * local_340.kstride * 8;
                        lVar55 = (local_758 - local_340.begin.z) * local_340.kstride * 8;
                        lVar64 = CONCAT44(local_340.jstride._4_4_,(undefined4)local_340.jstride) * 8
                        ;
                        lVar65 = (local_880 - local_340.begin.y) * lVar64;
                        lVar64 = (local_830 - (long)local_340.begin.y) * lVar64;
                        lVar56 = (long)local_340.begin.x;
                        lVar94 = lVar51 + lVar65 + lVar56 * -8 + lVar36;
                        lVar65 = lVar65 + lVar55 + lVar56 * -8 + lVar36;
                        lVar51 = lVar51 + lVar64 + lVar56 * -8 + lVar36;
                        lVar55 = lVar64 + lVar55 + lVar56 * -8 + lVar36;
                        lVar56 = CONCAT44(local_458.kstride._4_4_,(uint)local_458.kstride) * 8;
                        lVar82 = (local_760 - (long)local_458.begin.z) * lVar56;
                        lVar56 = (local_758 - local_458.begin.z) * lVar56;
                        lVar79 = CONCAT44(local_458.jstride._4_4_,(int)local_458.jstride) * 8;
                        lVar64 = (local_880 - local_458.begin.y) * lVar79;
                        lVar79 = (local_830 - (long)local_458.begin.y) * lVar79;
                        lVar90 = (long)local_458.begin.x;
                        lVar91 = CONCAT44(local_458.p._4_4_,(int)local_458.p) + lVar36;
                        lVar80 = lVar64 + lVar82 + lVar90 * -8 + lVar91;
                        lVar64 = lVar64 + lVar56 + lVar90 * -8 + lVar91;
                        lVar82 = lVar82 + lVar79 + lVar90 * -8 + lVar91;
                        lVar91 = lVar79 + lVar56 + lVar90 * -8 + lVar91;
                        lVar56 = 0;
                        do {
                          dVar126 = 0.0;
                          if (*(int *)(local_928 + lVar56 * 4) == 0) {
                            dVar126 = ((*(double *)(lVar86 + -8 + lVar56 * 8) +
                                        *(double *)(lVar60 + -8 + lVar56 * 8) +
                                       *(double *)(lVar100 + -8 + lVar56 * 8)) * 0.5 +
                                       *(double *)(lVar82 + -8 + lVar56 * 8) * 0.125 +
                                       (*(double *)(lVar67 + -8 + lVar56 * 8) +
                                        *(double *)((long)local_798 + lVar56 * 8 + -8) +
                                       *(double *)(lVar78 + -8 + lVar56 * 8)) * 0.25 +
                                      *(double *)(lVar89 + -8 + lVar56 * 8)) *
                                      *(double *)((long)local_340.p + lVar56 * 8 + lVar51 + -8) +
                                      ((((-*(double *)(lVar86 + lVar56 * 8) -
                                         *(double *)(lVar60 + lVar56 * 8)) +
                                        *(double *)(lVar100 + lVar56 * 8)) * 0.5 +
                                       *(double *)(lVar82 + lVar56 * 8) * 0.125 +
                                       ((*(double *)((long)local_798 + lVar56 * 8) -
                                        *(double *)(lVar67 + lVar56 * 8)) +
                                       *(double *)(lVar78 + lVar56 * 8)) * 0.25) -
                                      *(double *)(lVar89 + lVar56 * 8)) *
                                      *(double *)((long)local_340.p + lVar56 * 8 + lVar51) +
                                      ((((*(double *)(lVar41 + -8 + lVar56 * 8) -
                                         *(double *)(lVar49 + -8 + lVar56 * 8)) -
                                        *(double *)(lVar40 + -8 + lVar56 * 8)) * 0.5 +
                                       *(double *)(lVar80 + -8 + lVar56 * 8) * 0.125 +
                                       ((*(double *)(lVar73 + -8 + lVar56 * 8) -
                                        (double)local_7e8[lVar56 + -1]) +
                                       *(double *)(lVar50 + -8 + lVar56 * 8)) * 0.25) -
                                      *(double *)(lVar84 + -8 + lVar56 * 8)) *
                                      *(double *)((long)local_340.p + lVar56 * 8 + lVar94 + -8) +
                                      (((*(double *)(lVar49 + lVar56 * 8) -
                                        *(double *)(lVar41 + lVar56 * 8)) -
                                       *(double *)(lVar40 + lVar56 * 8)) * 0.5 +
                                       *(double *)(lVar80 + lVar56 * 8) * 0.125 +
                                       ((-*(double *)(lVar73 + lVar56 * 8) -
                                        (double)local_7e8[lVar56]) +
                                       *(double *)(lVar50 + lVar56 * 8)) * 0.25 +
                                      *(double *)(lVar84 + lVar56 * 8)) *
                                      *(double *)((long)local_340.p + lVar56 * 8 + lVar94) +
                                      ((((*(double *)(lVar68 + -8 + lVar56 * 8) -
                                         *(double *)(lVar103 + -8 + lVar56 * 8)) -
                                        *(double *)(lVar104 + -8 + lVar56 * 8)) * 0.5 +
                                       *(double *)(lVar91 + -8 + lVar56 * 8) * 0.125 +
                                       ((*(double *)(local_7c8 + lVar56 * 8 + -8) +
                                        *(double *)(lVar88 + -8 + lVar56 * 8)) -
                                       *(double *)(lVar83 + -8 + lVar56 * 8)) * 0.25) -
                                      *(double *)(lVar71 + -8 + lVar56 * 8)) *
                                      *(double *)((long)local_340.p + lVar56 * 8 + lVar55 + -8) +
                                      (((*(double *)(lVar103 + lVar56 * 8) -
                                        *(double *)(lVar68 + lVar56 * 8)) -
                                       *(double *)(lVar104 + lVar56 * 8)) * 0.5 +
                                       *(double *)(lVar91 + lVar56 * 8) * 0.125 +
                                       ((*(double *)(lVar88 + lVar56 * 8) -
                                        *(double *)(local_7c8 + lVar56 * 8)) -
                                       *(double *)(lVar83 + lVar56 * 8)) * 0.25 +
                                      *(double *)(lVar71 + lVar56 * 8)) *
                                      *(double *)((long)local_340.p + lVar56 * 8 + lVar55) +
                                      (((*(double *)(lVar77 + lVar56 * 8) +
                                         *(double *)(lVar70 + lVar56 * 8) +
                                        *(double *)(lVar69 + lVar56 * 8)) * 0.5 +
                                       *(double *)(lVar64 + lVar56 * 8) * 0.125 +
                                       ((-*(double *)(lVar92 + lVar56 * 8) -
                                        *(double *)(lVar85 + lVar56 * 8)) -
                                       *(double *)(lVar93 + lVar56 * 8)) * 0.25) -
                                      *(double *)(lVar54 + lVar56 * 8)) *
                                      *(double *)((long)local_340.p + lVar56 * 8 + lVar65) +
                                      (((-*(double *)(lVar77 + -8 + lVar56 * 8) -
                                        *(double *)(lVar70 + -8 + lVar56 * 8)) +
                                       *(double *)(lVar69 + -8 + lVar56 * 8)) * 0.5 +
                                       *(double *)(lVar64 + -8 + lVar56 * 8) * 0.125 +
                                       ((*(double *)(lVar92 + -8 + lVar56 * 8) -
                                        *(double *)(lVar85 + -8 + lVar56 * 8)) -
                                       *(double *)(lVar93 + -8 + lVar56 * 8)) * 0.25 +
                                      *(double *)(lVar54 + -8 + lVar56 * 8)) *
                                      *(double *)((long)local_340.p + lVar56 * 8 + lVar65 + -8);
                          }
                          *(double *)(local_930 + lVar56 * 8) = dVar126;
                          lVar56 = lVar56 + 1;
                        } while ((local_7b8.bigend.vect[0] - local_7b8.smallend.vect[0]) + 1 !=
                                 (int)lVar56);
                      }
                      local_880 = local_880 + 1;
                      local_930 = local_930 + local_7d0;
                      local_830 = local_830 + 1;
                      local_928 = local_928 + local_738;
                    } while (local_7b8.bigend.vect[1] + 1U != (int)local_880);
                  }
                  uVar31 = (int)local_770 + 1;
                  local_778 = CONCAT44(local_778._4_4_,(int)local_778 + 1);
                  bVar30 = (int)local_770 != local_7b8.bigend.vect[2];
                  local_770 = (ulong)uVar31;
                } while (bVar30);
              }
            }
            else if (local_7b8.smallend.vect[2] <= local_7b8.bigend.vect[2]) {
              lVar98 = (long)local_7b8.smallend.vect[1];
              lVar36 = (long)local_7b8.smallend.vect[0] * 8;
              iVar75 = local_7b8.smallend.vect[2] - 1;
              local_7e8 = (undefined **)CONCAT44(local_7e8._4_4_,local_7b8.bigend.vect[0]);
              uVar31 = local_7b8.smallend.vect[2];
              do {
                if (local_7b8.smallend.vect[1] <= local_7b8.bigend.vect[1]) {
                  lVar40 = (long)(int)uVar31;
                  lVar84 = CONCAT44(local_5f8._12_4_,local_5f8._8_4_) * 8;
                  lVar41 = local_5f8._0_8_ +
                           (lVar98 - local_5d4) * lVar84 +
                           (lVar40 - local_5d0) * CONCAT44(local_5f8._20_4_,local_5f8._16_4_) * 8 +
                           (long)local_5d8 * -8 + lVar36;
                  local_798 = (double)(CONCAT44(local_5b8.jstride._4_4_,(uint)local_5b8.jstride) * 4
                                      );
                  lVar73 = (lVar98 - local_5b8.begin.y) * (long)local_798 +
                           (lVar40 - local_5b8.begin.z) *
                           CONCAT44(local_5b8.kstride._4_4_,(int)local_5b8.kstride) * 4 +
                           (long)local_5b8.begin.x * -4 +
                           CONCAT44(local_5b8.p._4_4_,(int)local_5b8.p) +
                           (long)local_7b8.smallend.vect[0] * 4;
                  local_930 = lVar98;
                  iVar62 = local_7b8.smallend.vect[1] + -1;
                  do {
                    if (local_7b8.smallend.vect[0] <= local_7b8.bigend.vect[0]) {
                      lVar85 = (long)local_340.begin.x;
                      lVar49 = CONCAT44(local_340.jstride._4_4_,(undefined4)local_340.jstride);
                      lVar88 = (~local_340.begin.y + (int)local_930) * lVar49;
                      lVar54 = (int)(~local_340.begin.z + uVar31) * local_340.kstride;
                      lVar50 = (int)(uVar31 - local_340.begin.z) * local_340.kstride;
                      lVar92 = (lVar40 - local_340.begin.z) * local_340.kstride * 8;
                      lVar94 = (long)(iVar75 - local_340.begin.z) * local_340.kstride * 8;
                      lVar69 = lVar49 * (local_930 - (long)local_340.begin.y);
                      lVar77 = (long)(iVar62 - local_340.begin.y) * lVar49 * 8;
                      lVar49 = lVar49 * 8 * (local_930 - (long)local_340.begin.y);
                      lVar70 = 0;
                      do {
                        dVar126 = 0.0;
                        if (*(int *)(lVar73 + lVar70 * 4) == 0) {
                          lVar65 = (long)(((local_7b8.smallend.vect[0] + -1) - local_340.begin.x) +
                                         (int)lVar70);
                          dVar126 = (local_340.p[lVar88 + lVar65 + lVar54] +
                                     *(double *)
                                      ((long)local_340.p +
                                      lVar70 * 8 + lVar77 + lVar94 + lVar85 * -8 + lVar36) +
                                     local_340.p[lVar69 + lVar65 + lVar54] +
                                     *(double *)
                                      ((long)local_340.p +
                                      lVar70 * 8 + lVar49 + lVar94 + lVar85 * -8 + lVar36) +
                                     local_340.p[lVar88 + lVar65 + lVar50] +
                                     *(double *)
                                      ((long)local_340.p +
                                      lVar70 * 8 + lVar92 + lVar77 + lVar85 * -8 + lVar36) +
                                     local_340.p[lVar69 + lVar65 + lVar50] +
                                    *(double *)
                                     ((long)local_340.p +
                                     lVar70 * 8 + lVar92 + lVar49 + lVar85 * -8 + lVar36)) * 0.125;
                        }
                        *(double *)(lVar41 + lVar70 * 8) = dVar126;
                        lVar70 = lVar70 + 1;
                      } while ((local_7b8.bigend.vect[0] - local_7b8.smallend.vect[0]) + 1 !=
                               (int)lVar70);
                    }
                    local_930 = local_930 + 1;
                    lVar41 = lVar41 + lVar84;
                    iVar62 = iVar62 + 1;
                    lVar73 = lVar73 + (long)local_798;
                  } while (local_7b8.bigend.vect[1] + 1U != (int)local_930);
                }
                iVar75 = iVar75 + 1;
                bVar30 = uVar31 != local_7b8.bigend.vect[2];
                uVar31 = uVar31 + 1;
              } while (bVar30);
            }
            mlndlap_impose_neumann_bc
                      (&local_7b8,(Array4<double> *)local_5f8,&local_808,&local_6b0,&local_6c0);
          }
          uVar101 = local_620;
          MFIter::operator++((MFIter *)local_1b8);
          rhs = local_6e0;
        } while (local_198[0] < local_198[2]);
      }
      MFIter::~MFIter((MFIter *)local_1b8);
      uVar101 = uVar101 + 1;
      iVar75 = (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels;
    } while ((long)uVar101 < (long)iVar75);
  }
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::vector(&local_210,(long)iVar75,(allocator_type *)local_1b8);
  if (1 < (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels) {
    local_3a8 = 0;
    do {
      iVar75 = (this->super_MLNodeLinOp).super_MLLinOp.m_amr_ref_ratio.
               super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
               ._M_impl.super__Vector_impl_data._M_start[local_3a8];
      lVar36 = local_3a8 + 1;
      local_280 = *(long *)&(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                            super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar36].
                            super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                            super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
      lVar98 = lVar36;
      local_278 = local_3a8;
      if ((iVar75 != 2) && (iVar75 != 4)) {
        local_3a8 = lVar36;
        Assert_host("amrrr == 2 || amrrr == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLaplacian_misc.cpp"
                    ,0x454,(char *)0x0);
        lVar98 = local_3a8;
      }
      local_3a8 = lVar98;
      lVar98 = local_3a8;
      pVVar28 = local_6e0;
      local_4f8 = iVar75;
      amrex::coarsen((BoxArray *)local_1b8,
                     (BoxArray *)
                     ((long)&((local_6e0->
                              super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[local_3a8]->
                             super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8),iVar75);
      pMVar19 = (pVVar28->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_start[lVar98];
      pMVar37 = (MultiFab *)operator_new(0x180);
      local_578._4_4_ = 0;
      local_578._0_4_ = 1;
      pbStack_560 = (pointer)0x0;
      local_558 = (pointer)0x0;
      local_578._8_4_ = 0;
      local_578._12_4_ = 0;
      local_568 = (undefined1  [8])0x0;
      local_498.p = (double *)&PTR__FabFactory_008378d0;
      MultiFab::MultiFab(pMVar37,(BoxArray *)local_1b8,
                         (DistributionMapping *)
                         ((long)&(pMVar19->super_FabArray<amrex::FArrayBox>).super_FabArrayBase +
                         0x70),1,0,(MFInfo *)local_578,(FabFactory<amrex::FArrayBox> *)&local_498);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_568);
      pMVar19 = local_210.
                super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_278]._M_t.
                super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
      local_210.
      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[local_278]._M_t.
      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = pMVar37;
      if (pMVar19 != (MultiFab *)0x0) {
        (**(code **)(*(long *)&(pMVar19->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))
                  ();
      }
      BoxArray::~BoxArray((BoxArray *)local_1b8);
      local_228 = *(double *)(local_280 + 0x38);
      uStack_220 = 0;
      local_2c0 = *(double *)(local_280 + 0x40);
      local_238._8_8_ = 0;
      local_238._0_8_ = *(ulong *)(local_280 + 0x48);
      local_1f8 = (FabArray<amrex::IArrayBox> *)
                  **(undefined8 **)
                    &(this->super_MLNodeLinOp).m_dirichlet_mask.
                     super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar36].
                     super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
      ;
      local_808.smallend.vect[0]._0_3_ = 0x10000;
      local_808.smallend.vect[1] = Gpu::Device::max_gpu_streams;
      local_808.bigend.vect[1] = DAT_0083cec0;
      local_808.smallend.vect[2] = (int)FabArrayBase::mfiter_tile_size;
      local_808.bigend.vect[0] = (int)(FabArrayBase::mfiter_tile_size >> 0x20);
      local_808.smallend.vect[0]._0_2_ = 0x101;
      MFIter::MFIter((MFIter *)local_1b8,
                     (FabArrayBase *)
                     local_210.
                     super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_278]._M_t.
                     super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                     .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                     (MFItInfo *)&local_808);
      if (local_198[0] < local_198[2]) {
        local_228 = local_228 * 0.25;
        local_2c0 = local_2c0 * 0.25;
        uVar121 = local_238._8_4_;
        uVar31 = local_238._12_4_;
        dVar57 = local_238._0_8_ * 0.25;
        local_1c8 = -local_228;
        uStack_1c0 = uStack_220 ^ 0x8000000000000000;
        local_238._8_4_ = uVar121;
        local_238._0_8_ = dVar57;
        local_238._12_4_ = uVar31;
        local_1d8._8_4_ = uVar121;
        local_1d8._0_8_ = -dVar57;
        local_1d8._12_4_ = uVar31 ^ 0x80000000;
        do {
          MFIter::tilebox((Box *)&local_458,(MFIter *)local_1b8);
          BATransformer::operator()
                    ((Box *)local_578,
                     (BATransformer *)(CONCAT44(local_1b8._12_4_,local_1b8._8_4_) + 8),
                     (Box *)((long)*(int *)(*(long *)local_198._24_8_ + (long)local_198[0] * 4) *
                             0x1c + **(long **)(CONCAT44(local_1b8._12_4_,local_1b8._8_4_) + 0x50)))
          ;
          iVar62 = local_578._0_4_;
          uVar31 = local_578._12_4_;
          local_300.kstride._0_4_ = local_568._0_4_;
          local_300.kstride._4_4_ = local_568._4_4_;
          local_300.p._4_4_ = local_578._4_4_;
          iVar75 = local_578._8_4_;
          if (local_4f8 != 1) {
            iVar62 = local_578._0_4_ * local_4f8;
            local_300.p._4_4_ = local_578._4_4_ * local_4f8;
            iVar75 = local_578._8_4_ * local_4f8;
            uVar42 = (uint)(((ulong)pbStack_560 & 2) == 0);
            uVar44 = (uint)(((ulong)pbStack_560 & 4) == 0);
            uVar31 = (local_578._12_4_ + (~pbStack_560._0_4_ & 1)) * local_4f8 -
                     (~pbStack_560._0_4_ & 1);
            local_300.kstride._0_4_ = (local_568._0_4_ + uVar42) * local_4f8 - uVar42;
            local_300.kstride._4_4_ = (local_568._4_4_ + uVar44) * local_4f8 - uVar44;
          }
          local_300.p._0_4_ = iVar62;
          local_748 = CONCAT44(local_748._4_4_,local_300.p._4_4_);
          local_300.jstride._0_4_ = iVar75;
          local_300.jstride._4_4_ = uVar31;
          local_4d0 = (undefined1 *)CONCAT44(local_4d0._4_4_,(int)local_300.kstride);
          local_4e8._M_head_impl._0_4_ = local_300.kstride._4_4_;
          local_300.nstride._0_4_ = pbStack_560._0_4_;
          lVar36 = 0;
          do {
            if ((pbStack_560._0_4_ >> ((uint)lVar36 & 0x1f) & 1) != 0) {
              piVar38 = (int *)((long)&local_300.jstride + lVar36 * 4 + 4);
              *piVar38 = *piVar38 + -1;
            }
            lVar36 = lVar36 + 1;
          } while (lVar36 != 3);
          local_300.nstride._0_4_ = 0;
          local_3e8.kstride._0_4_ = (int)local_300.kstride;
          local_3e8.kstride._4_4_ = local_300.kstride._4_4_;
          local_3e8.nstride = local_3e8.nstride & 0xffffffff00000000;
          local_3e8.p = (double *)CONCAT44(local_300.p._4_4_,iVar62);
          local_3e8.jstride._0_4_ = iVar75;
          local_3e8.jstride._4_4_ = local_300.jstride._4_4_;
          paVar16 = (this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
                    super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                    .
                    super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          paVar21 = (this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
                    super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                    .
                    super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar36 = 0;
          do {
            if ((*(int *)((long)paVar16->_M_elems + lVar36) == 0x6a) &&
               (iVar53 = *(int *)((long)&local_3e8.p + lVar36),
               iVar53 == *(int *)(local_280 + 0xac + lVar36))) {
              *(int *)((long)&local_3e8.p + lVar36) = iVar53 + -1;
            }
            if ((*(int *)((long)paVar21->_M_elems + lVar36) == 0x6a) &&
               (iVar53 = *(int *)((long)&local_3e8.jstride + lVar36 + 4),
               iVar53 == *(int *)(local_280 + 0xb8 + lVar36))) {
              *(int *)((long)&local_3e8.jstride + lVar36 + 4) = iVar53 + 1;
            }
            lVar36 = lVar36 + 4;
          } while (lVar36 != 0xc);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_578,
                     &(local_210.
                       super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_278]._M_t.
                       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                       .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                      super_FabArray<amrex::FArrayBox>,(MFIter *)local_1b8);
          lVar36 = local_3a8;
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_498,
                     &(local_4f0->
                      super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[local_3a8]->
                      super_FabArray<amrex::FArrayBox>,(MFIter *)local_1b8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_5b8,
                     &(local_6e0->
                      super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar36]->
                      super_FabArray<amrex::FArrayBox>,(MFIter *)local_1b8);
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    ((Array4<const_int> *)local_5f8,local_1f8,(MFIter *)local_1b8);
          local_6d8._M_t.
          super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
          super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl._0_4_ = iVar62;
          local_4b0._M_t.
          super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
          super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl._0_4_ = uVar31;
          if (local_4f8 == 2) {
            lVar36 = (long)(int)local_458.jstride;
            local_630 = (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                        CONCAT44(local_630._4_4_,local_458.kstride._4_4_);
            if ((int)local_458.jstride <= local_458.kstride._4_4_) {
              local_390 = (ulong)local_458.jstride._4_4_;
              local_3a0 = (ulong)(uint)local_458.kstride;
              local_628 = (MultiCutFab *)(long)local_458.p._4_4_;
              local_508 = (FabArray<amrex::IArrayBox> *)(long)(int)local_458.p;
              local_510 = (FabArray<amrex::FArrayBox> *)
                          CONCAT44(local_510._4_4_,(int)local_458.p * 2);
              local_4e0._M_head_impl._0_4_ = (int)local_458.p * 2 + -1;
              local_798 = (double)(long)iVar62;
              local_4f4 = local_458.p._4_4_ * 2 + ~interior;
              local_718 = (undefined1 *)(long)(int)local_4d0;
              local_7c0 = (Geometry *)(long)(int)(LinOpBCType)local_748;
              iVar53 = (int)local_458.jstride * 2 + -1;
              lVar98 = (long)iVar75;
              local_6e8 = local_458.jstride._4_4_ + 1;
              local_630 = (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                          CONCAT44(local_630._4_4_,local_458.kstride._4_4_ + 1);
              local_70c = (uint)local_458.kstride + singlevalued;
              do {
                local_500 = (long)iVar53;
                if (iVar53 < lVar98) {
                  local_500 = lVar98;
                }
                local_518 = (Real)CONCAT44(local_518._4_4_,iVar53);
                iVar32 = iVar53;
                if (iVar53 < iVar75) {
                  iVar32 = iVar75;
                }
                if (local_458.p._4_4_ <= (int)(uint)local_458.kstride) {
                  local_380 = (long)iVar32;
                  local_3f8 = (FabArray<amrex::IArrayBox> *)(lVar36 * 2);
                  local_388 = (long)local_5d8;
                  local_6a0 = (EBFArrayBoxFactory *)(long)local_5d4;
                  local_4d8 = (FabArray<amrex::EBCellFlagFab> *)
                              CONCAT44(local_5f8._12_4_,local_5f8._8_4_);
                  local_398 = (FabArray<amrex::IArrayBox> *)
                              (((long)local_3f8 - (long)local_5d0) *
                               CONCAT44(local_5f8._20_4_,local_5f8._16_4_) * 4 + local_5f8._0_8_);
                  iVar32 = (int)local_3f8;
                  local_6e4 = iVar32 + -1;
                  if (iVar32 + -1 <= iVar75) {
                    local_6e4 = iVar75;
                  }
                  iVar43 = iVar32 + 1;
                  if ((int)local_4e8._M_head_impl < iVar32 + 1) {
                    iVar43 = (int)local_4e8._M_head_impl;
                  }
                  local_610 = (LayoutData<int> *)(long)iVar43;
                  local_4c8 = local_500 + -1;
                  local_4c0 = (FabArray<amrex::IArrayBox> *)CONCAT44(local_4c0._4_4_,iVar43);
                  pMVar102 = local_628;
                  LVar52 = local_4f4;
                  do {
                    local_358 = (Geometry *)(long)(int)LVar52;
                    if ((long)(int)LVar52 < (long)local_7c0) {
                      local_358 = local_7c0;
                    }
                    local_620 = CONCAT44(local_620._4_4_,LVar52);
                    LVar33 = LVar52;
                    if ((int)LVar52 < (int)(LinOpBCType)local_748) {
                      LVar33 = (LinOpBCType)local_748;
                    }
                    if ((int)local_458.p <= (int)local_458.jstride._4_4_) {
                      local_618._M_head_impl = (LayoutData<int> *)(long)(int)LVar33;
                      local_760 = (long)pMVar102 * 2;
                      lVar73 = (long)&(local_398->super_FabArrayBase)._vptr_FabArrayBase +
                               (local_760 - (long)local_6a0) * (long)local_4d8 * 4;
                      iVar97 = (int)local_760;
                      local_74c = iVar97 + ~interior;
                      if ((int)(iVar97 + ~interior) <= (int)(LinOpBCType)local_748) {
                        local_74c = (LinOpBCType)local_748;
                      }
                      iVar26 = iVar97 + 1;
                      if ((int)local_4d0 < iVar97 + 1) {
                        iVar26 = (int)local_4d0;
                      }
                      local_690 = CONCAT44(local_578._4_4_,local_578._0_4_);
                      local_708 = CONCAT44(local_708._4_4_,iVar26);
                      local_7d0 = (long)iVar26;
                      local_698 = (undefined1 *)((long)&local_358[-1].domain.btype.itype + 3);
                      local_688 = (FabArray<amrex::IArrayBox> *)
                                  CONCAT44(local_688._4_4_,(int)local_458.p * 2);
                      local_2b8._0_8_ = pMVar102;
                      local_418._0_8_ = lVar73;
                      pFVar61 = local_508;
                      iVar35 = (int)local_4e0._M_head_impl;
                      do {
                        local_4a8._0_4_ = iVar35;
                        dVar57 = (double)(long)iVar35;
                        if ((long)iVar35 < (long)local_798) {
                          dVar57 = local_798;
                        }
                        dVar127 = 0.0;
                        local_408._0_8_ = pFVar61;
                        dVar126 = 0.0;
                        if ((*(int *)(lVar73 + ((long)pFVar61 * 2 - local_388) * 4) != 0) &&
                           (dVar126 = dVar127, local_6e4 <= iVar43)) {
                          iVar34 = (int)local_688 - SUB84(dVar57,0);
                          local_758 = CONCAT44(local_758._4_4_,iVar34);
                          lVar84 = (long)dVar57 * 8;
                          uVar44 = (uint)((long)pFVar61 * 2);
                          uVar42 = uVar44 | 1;
                          if ((int)uVar31 < (int)uVar42) {
                            uVar42 = uVar31;
                          }
                          iVar45 = uVar44 - 1;
                          if (iVar45 <= iVar62) {
                            iVar45 = iVar62;
                          }
                          lVar40 = CONCAT44(local_498.jstride._4_4_,(uint)local_498.jstride);
                          lVar41 = CONCAT44(local_498.kstride._4_4_,(undefined4)local_498.kstride);
                          lVar49 = CONCAT44(local_498.nstride._4_4_,(undefined4)local_498.nstride);
                          local_608 = CONCAT44(local_5b8.kstride._4_4_,(int)local_5b8.kstride) * 8;
                          lVar94 = CONCAT44(local_5b8.jstride._4_4_,(uint)local_5b8.jstride) * 8;
                          local_600 = lVar41 * 8;
                          lVar50 = (local_4c8 - local_498.begin.z) * local_600;
                          lVar55 = lVar40 * 8;
                          lVar69 = ((long)local_698 - (long)local_498.begin.y) * lVar55;
                          lVar77 = lVar50 + lVar69 + lVar84;
                          lVar54 = ((long)local_358 - (long)local_498.begin.y) * lVar55;
                          lVar70 = lVar50 + lVar54 + lVar84;
                          lVar50 = (local_500 - local_498.begin.z) * local_600;
                          lVar92 = lVar69 + lVar50 + lVar84;
                          lVar69 = lVar50 + lVar54 + lVar84;
                          lVar54 = lVar49 * 0x10;
                          lVar50 = (long)local_498.begin.x;
                          local_730 = lVar77 + lVar50 * -8;
                          local_838 = lVar77 + lVar49 * 8 + lVar50 * -8;
                          lVar51 = lVar77 + lVar54 + lVar50 * -8;
                          local_6f8 = lVar70 + lVar50 * -8;
                          lVar77 = lVar70 + lVar49 * 8 + lVar50 * -8;
                          lVar70 = lVar70 + lVar54 + lVar50 * -8;
                          local_700 = lVar92 + lVar50 * -8;
                          lVar85 = lVar92 + lVar49 * 8 + lVar50 * -8;
                          lVar92 = lVar92 + lVar54 + lVar50 * -8;
                          local_6c8 = lVar69 + lVar50 * -8;
                          lVar49 = lVar69 + lVar49 * 8 + lVar50 * -8;
                          local_778 = lVar69 + lVar54 + lVar50 * -8;
                          local_6f0 = (undefined1 *)((long)local_498.p + local_6c8 + -8);
                          local_6c8 = local_6c8 + (long)local_498.p;
                          local_638 = (long)local_498.p + lVar49 + -8;
                          local_728 = lVar49 + (long)local_498.p;
                          local_640 = (long)local_498.p + local_778 + -8;
                          local_778 = local_778 + (long)local_498.p;
                          local_648 = (long)local_498.p + local_700 + -8;
                          local_700 = local_700 + (long)local_498.p;
                          local_6d0 = (long)local_498.p + lVar85 + -8;
                          local_720 = lVar85 + (long)local_498.p;
                          local_650 = (undefined **)((long)local_498.p + lVar92 + -8);
                          local_658 = (long)local_498.p + local_6f8 + -8;
                          local_6f8 = local_6f8 + (long)local_498.p;
                          local_660 = (undefined **)((long)local_498.p + lVar77 + -8);
                          local_780 = (undefined **)(lVar77 + (long)local_498.p);
                          local_668 = (undefined **)((long)local_498.p + lVar70 + -8);
                          local_670 = (undefined **)((long)local_498.p + local_730 + -8);
                          local_730 = local_730 + (long)local_498.p;
                          local_678 = (undefined **)((long)local_498.p + local_838 + -8);
                          local_838 = local_838 + (long)local_498.p;
                          local_680 = (long)local_498.p + lVar51 + -8;
                          lVar77 = (long)(int)local_3e8.p;
                          lVar88 = (long)(int)local_3e8.jstride._4_4_;
                          lVar65 = (long)local_3e8.p._4_4_;
                          lVar69 = (long)(int)local_3e8.kstride;
                          lVar85 = (long)(int)local_3e8.jstride;
                          lVar54 = (long)local_3e8.kstride._4_4_;
                          local_7e8 = (undefined **)(long)(int)uVar42;
                          uVar101 = ((long)local_358 - (long)local_5b8.begin.y) * lVar94 +
                                    (local_500 - local_5b8.begin.z) * local_608 + lVar84 +
                                    (long)local_5b8.begin.x * -8 +
                                    CONCAT44(local_5b8.p._4_4_,(int)local_5b8.p);
                          lVar84 = lVar70 + (long)local_498.p;
                          lVar49 = lVar92 + (long)local_498.p;
                          uVar29 = lVar51 + (long)local_498.p;
                          lVar50 = local_380;
                          do {
                            local_770 = uVar29;
                            local_768 = lVar49;
                            local_740 = lVar84;
                            local_788 = uVar101;
                            if ((int)local_74c <= iVar26) {
                              iVar46 = iVar32 - (int)lVar50;
                              iVar76 = -iVar46;
                              if (iVar46 < 1) {
                                iVar76 = iVar46;
                              }
                              local_738 = CONCAT44(local_738._4_4_,iVar76 + 2);
                              lVar84 = lVar50 + -1;
                              local_910 = local_838;
                              local_858 = local_730;
                              local_8b8 = local_780;
                              local_860 = local_6f8;
                              local_840 = local_720;
                              local_820 = local_700;
                              local_898 = local_778;
                              local_828 = local_728;
                              local_8a0 = local_6c8;
                              local_868 = local_640;
                              local_870 = local_638;
                              local_7c8 = local_6f0;
                              local_8e8 = local_650;
                              local_8c8 = local_6d0;
                              local_878 = local_648;
                              local_848 = local_668;
                              local_900 = (FabArray<amrex::IArrayBox> *)local_660;
                              local_8d0 = local_658;
                              local_8a8 = local_680;
                              local_8b0 = (LayoutData<int> *)local_678;
                              local_8f0 = local_670;
                              pLVar66 = local_618._M_head_impl;
                              local_918 = local_740;
                              local_908 = local_788;
                              local_8e0 = local_770;
                              local_8c0 = local_768;
                              do {
                                if (iVar45 <= (int)uVar42) {
                                  iVar47 = iVar97 - (int)pLVar66;
                                  iVar46 = -iVar47;
                                  if (iVar47 < 1) {
                                    iVar46 = iVar47;
                                  }
                                  puVar95 = &pLVar66[-1].field_0x10f;
                                  lVar49 = 0;
                                  iVar47 = iVar34;
                                  do {
                                    lVar70 = (long)dVar57 + lVar49;
                                    iVar59 = -iVar47;
                                    if (iVar47 < 1) {
                                      iVar59 = iVar47;
                                    }
                                    if (((((long)local_798 < lVar70) && (lVar70 < (int)uVar31)) &&
                                        ((long)local_7c0 < (long)pLVar66)) &&
                                       ((((long)pLVar66 < (long)local_718 && (lVar98 < lVar50)) &&
                                        (lVar50 < (int)local_4e8._M_head_impl)))) {
                                      dVar126 = *(double *)(local_908 + lVar49 * 8);
                                    }
                                    else {
                                      lVar92 = (long)dVar57 + lVar49 + -1;
                                      dVar126 = 0.0;
                                      if (((lVar77 < lVar70) && (lVar92 <= lVar88)) &&
                                         ((lVar65 < (long)pLVar66 &&
                                          ((((long)puVar95 <= lVar69 && (lVar85 < lVar50)) &&
                                           (lVar84 <= lVar54)))))) {
                                        dVar126 = *(double *)(local_8a8 + lVar49 * 8) *
                                                  (double)local_1d8._0_8_ +
                                                  ((double)local_8f0[lVar49] * local_1c8 -
                                                  (double)*(undefined **)
                                                           ((long)local_8b0 + lVar49 * 8) *
                                                  local_2c0) + 0.0;
                                      }
                                      if (((lVar77 <= lVar70) && (lVar70 <= lVar88)) &&
                                         (((lVar65 < (long)pLVar66 &&
                                           (((long)puVar95 <= lVar69 && (lVar85 < lVar50)))) &&
                                          (lVar84 <= lVar54)))) {
                                        dVar126 = dVar126 + *(double *)(local_8e0 + lVar49 * 8) *
                                                            (double)local_1d8._0_8_ +
                                                            (*(double *)(local_858 + lVar49 * 8) *
                                                             local_228 -
                                                            *(double *)(local_910 + lVar49 * 8) *
                                                            local_2c0);
                                      }
                                      if (((((lVar77 < lVar70) && (lVar92 <= lVar88)) &&
                                           (lVar65 <= (long)pLVar66)) &&
                                          (((long)pLVar66 <= lVar69 && (lVar85 < lVar50)))) &&
                                         (lVar84 <= lVar54)) {
                                        dVar126 = dVar126 + (double)local_848[lVar49] *
                                                            (double)local_1d8._0_8_ +
                                                            *(double *)(local_8d0 + lVar49 * 8) *
                                                            local_1c8 +
                                                            (double)*(undefined **)
                                                                     ((long)local_900 + lVar49 * 8)
                                                            * local_2c0;
                                      }
                                      if (((lVar77 <= lVar70) && (lVar70 <= lVar88)) &&
                                         ((lVar65 <= (long)pLVar66 &&
                                          ((((long)pLVar66 <= lVar69 && (lVar85 < lVar50)) &&
                                           (lVar84 <= lVar54)))))) {
                                        dVar126 = dVar126 + *(double *)(local_918 + lVar49 * 8) *
                                                            (double)local_1d8._0_8_ +
                                                            *(double *)(local_860 + lVar49 * 8) *
                                                            local_228 +
                                                            (double)local_8b8[lVar49] * local_2c0;
                                      }
                                      if (((lVar77 < lVar70) && (lVar92 <= lVar88)) &&
                                         (((lVar65 < (long)pLVar66 &&
                                           (((long)puVar95 <= lVar69 && (lVar85 <= lVar50)))) &&
                                          (lVar50 <= lVar54)))) {
                                        dVar126 = dVar126 + (double)local_8e8[lVar49] *
                                                            (double)local_238._0_8_ +
                                                            (*(double *)(local_878 + lVar49 * 8) *
                                                             local_1c8 -
                                                            *(double *)(local_8c8 + lVar49 * 8) *
                                                            local_2c0);
                                      }
                                      if ((((lVar77 <= lVar70) && (lVar70 <= lVar88)) &&
                                          (lVar65 < (long)pLVar66)) &&
                                         ((((long)puVar95 <= lVar69 && (lVar85 <= lVar50)) &&
                                          (lVar50 <= lVar54)))) {
                                        dVar126 = dVar126 + *(double *)(local_8c0 + lVar49 * 8) *
                                                            (double)local_238._0_8_ +
                                                            (*(double *)(local_820 + lVar49 * 8) *
                                                             local_228 -
                                                            *(double *)(local_840 + lVar49 * 8) *
                                                            local_2c0);
                                      }
                                      if (((lVar77 < lVar70) && (lVar92 <= lVar88)) &&
                                         ((lVar65 <= (long)pLVar66 &&
                                          ((((long)pLVar66 <= lVar69 && (lVar85 <= lVar50)) &&
                                           (lVar50 <= lVar54)))))) {
                                        dVar126 = dVar126 + *(double *)(local_868 + lVar49 * 8) *
                                                            (double)local_238._0_8_ +
                                                            *(double *)(local_7c8 + lVar49 * 8) *
                                                            local_1c8 +
                                                            *(double *)(local_870 + lVar49 * 8) *
                                                            local_2c0;
                                      }
                                      if ((((lVar77 <= lVar70) && (lVar70 <= lVar88)) &&
                                          ((lVar65 <= (long)pLVar66 &&
                                           (((long)pLVar66 <= lVar69 && (lVar85 <= lVar50)))))) &&
                                         (lVar50 <= lVar54)) {
                                        dVar126 = dVar126 + *(double *)(local_898 + lVar49 * 8) *
                                                            (double)local_238._0_8_ +
                                                            *(double *)(local_8a0 + lVar49 * 8) *
                                                            local_228 +
                                                            *(double *)(local_828 + lVar49 * 8) *
                                                            local_2c0;
                                      }
                                    }
                                    dVar127 = dVar127 + (double)((iVar59 + 2) *
                                                                (iVar46 + 2) * (iVar76 + 2)) *
                                                        dVar126;
                                    lVar70 = (long)dVar57 + lVar49;
                                    lVar49 = lVar49 + 1;
                                    iVar47 = iVar47 + -1;
                                  } while (lVar70 < (long)local_7e8);
                                }
                                local_908 = local_908 + lVar94;
                                local_8f0 = local_8f0 + lVar40;
                                local_8b0 = (LayoutData<int> *)((long)local_8b0 + lVar40 * 8);
                                local_8a8 = local_8a8 + lVar55;
                                local_8d0 = local_8d0 + lVar55;
                                local_900 = (FabArray<amrex::IArrayBox> *)
                                            ((long)local_900 + lVar40 * 8);
                                local_848 = local_848 + lVar40;
                                local_878 = local_878 + lVar55;
                                local_8c8 = local_8c8 + lVar55;
                                local_8e8 = local_8e8 + lVar40;
                                local_7c8 = local_7c8 + lVar55;
                                local_870 = local_870 + lVar55;
                                local_868 = local_868 + lVar55;
                                local_8a0 = local_8a0 + lVar55;
                                local_828 = local_828 + lVar55;
                                local_898 = local_898 + lVar55;
                                local_820 = local_820 + lVar55;
                                local_840 = local_840 + lVar55;
                                local_8c0 = local_8c0 + lVar55;
                                local_860 = local_860 + lVar55;
                                local_8b8 = local_8b8 + lVar40;
                                local_918 = local_918 + lVar55;
                                local_858 = local_858 + lVar55;
                                local_910 = local_910 + lVar55;
                                local_8e0 = local_8e0 + lVar55;
                                bVar106 = (long)pLVar66 < local_7d0;
                                pLVar66 = (LayoutData<int> *)
                                          ((long)&(pLVar66->super_FabArrayBase)._vptr_FabArrayBase +
                                          1);
                              } while (bVar106);
                            }
                            local_670 = local_670 + lVar41;
                            local_678 = local_678 + lVar41;
                            local_680 = local_680 + local_600;
                            local_658 = local_658 + local_600;
                            local_660 = local_660 + lVar41;
                            local_668 = local_668 + lVar41;
                            local_648 = local_648 + local_600;
                            local_6d0 = local_6d0 + local_600;
                            local_650 = local_650 + lVar41;
                            local_6f0 = local_6f0 + local_600;
                            local_638 = local_638 + local_600;
                            local_640 = local_640 + local_600;
                            local_6c8 = local_6c8 + local_600;
                            local_728 = local_728 + local_600;
                            local_778 = local_778 + local_600;
                            local_700 = local_700 + local_600;
                            local_720 = local_720 + local_600;
                            local_6f8 = local_6f8 + local_600;
                            local_780 = local_780 + lVar41;
                            local_730 = local_730 + local_600;
                            local_838 = local_838 + local_600;
                            bVar106 = lVar50 < (long)local_610;
                            uVar101 = local_788 + local_608;
                            lVar84 = local_740 + local_600;
                            lVar49 = local_768 + local_600;
                            uVar29 = local_770 + local_600;
                            lVar50 = lVar50 + 1;
                          } while (bVar106);
                          dVar126 = dVar127 * 0.015625;
                        }
                        *(double *)
                         (((long)pMVar102 - (long)local_558._4_4_) *
                          CONCAT44(local_578._12_4_,local_578._8_4_) * 8 + local_690 +
                          ((long)pFVar61 - (long)(int)local_558) * 8 +
                         (lVar36 - local_550) * (long)local_568 * 8) = dVar126;
                        pFVar61 = (FabArray<amrex::IArrayBox> *)
                                  ((long)&(pFVar61->super_FabArrayBase)._vptr_FabArrayBase + 1);
                        iVar35 = iVar35 + 2;
                        local_688 = (FabArray<amrex::IArrayBox> *)
                                    CONCAT44(local_688._4_4_,(int)local_688 + 2);
                      } while (local_6e8 != (uint)pFVar61);
                    }
                    pMVar102 = (MultiCutFab *)
                               ((long)&(pMVar102->m_data).super_FabArrayBase._vptr_FabArrayBase + 1)
                    ;
                    LVar52 = LVar52 + 2;
                    local_4b8 = lVar36;
                  } while (local_70c != (FabType)pMVar102);
                }
                lVar36 = lVar36 + 1;
                iVar53 = iVar53 + 2;
              } while (local_458.kstride._4_4_ + 1 != (int)lVar36);
            }
          }
          else {
            lVar36 = (long)(int)local_458.jstride;
            local_630 = (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                        CONCAT44(local_630._4_4_,local_458.kstride._4_4_);
            if ((int)local_458.jstride <= local_458.kstride._4_4_) {
              local_390 = (ulong)local_458.jstride._4_4_;
              local_3a0 = (ulong)(uint)local_458.kstride;
              local_628 = (MultiCutFab *)(long)local_458.p._4_4_;
              local_508 = (FabArray<amrex::IArrayBox> *)(long)(int)local_458.p;
              local_510 = (FabArray<amrex::FArrayBox> *)
                          CONCAT44(local_510._4_4_,(int)local_458.p * 4);
              local_4e0._M_head_impl._0_4_ = (int)local_458.p * 4 + -3;
              local_798 = (double)(long)iVar62;
              local_4f4 = local_458.p._4_4_ * 4 - 3;
              local_718 = (undefined1 *)(long)(int)local_4d0;
              local_7c0 = (Geometry *)(long)(int)(LinOpBCType)local_748;
              iVar53 = (int)local_458.jstride * 4 + -3;
              lVar98 = (long)iVar75;
              local_6e8 = local_458.jstride._4_4_ + 1;
              local_630 = (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                          CONCAT44(local_630._4_4_,local_458.kstride._4_4_ + 1);
              local_70c = (uint)local_458.kstride + singlevalued;
              do {
                local_500 = (long)iVar53;
                if (iVar53 < lVar98) {
                  local_500 = lVar98;
                }
                local_518 = (Real)CONCAT44(local_518._4_4_,iVar53);
                iVar32 = iVar53;
                if (iVar53 < iVar75) {
                  iVar32 = iVar75;
                }
                if (local_458.p._4_4_ <= (int)(uint)local_458.kstride) {
                  local_380 = (long)iVar32;
                  local_3f8 = (FabArray<amrex::IArrayBox> *)(lVar36 * 4);
                  local_388 = (long)local_5d8;
                  local_6a0 = (EBFArrayBoxFactory *)(long)local_5d4;
                  local_4d8 = (FabArray<amrex::EBCellFlagFab> *)
                              CONCAT44(local_5f8._12_4_,local_5f8._8_4_);
                  local_398 = (FabArray<amrex::IArrayBox> *)
                              (((long)local_3f8 - (long)local_5d0) *
                               CONCAT44(local_5f8._20_4_,local_5f8._16_4_) * 4 + local_5f8._0_8_);
                  iVar32 = (int)local_3f8;
                  local_6e4 = iVar32 + -3;
                  if (iVar32 + -3 <= iVar75) {
                    local_6e4 = iVar75;
                  }
                  iVar43 = iVar32 + 3;
                  if ((int)local_4e8._M_head_impl < iVar32 + 3) {
                    iVar43 = (int)local_4e8._M_head_impl;
                  }
                  local_610 = (LayoutData<int> *)(long)iVar43;
                  local_4c8 = local_500 + -1;
                  local_4c0 = (FabArray<amrex::IArrayBox> *)CONCAT44(local_4c0._4_4_,iVar43);
                  pMVar102 = local_628;
                  LVar52 = local_4f4;
                  do {
                    local_358 = (Geometry *)(long)(int)LVar52;
                    if ((long)(int)LVar52 < (long)local_7c0) {
                      local_358 = local_7c0;
                    }
                    local_620 = CONCAT44(local_620._4_4_,LVar52);
                    LVar33 = LVar52;
                    if ((int)LVar52 < (int)(LinOpBCType)local_748) {
                      LVar33 = (LinOpBCType)local_748;
                    }
                    if ((int)local_458.p <= (int)local_458.jstride._4_4_) {
                      local_618._M_head_impl = (LayoutData<int> *)(long)(int)LVar33;
                      local_760 = (long)pMVar102 * 4;
                      lVar73 = (long)&(local_398->super_FabArrayBase)._vptr_FabArrayBase +
                               (local_760 - (long)local_6a0) * (long)local_4d8 * 4;
                      iVar97 = (int)local_760;
                      local_74c = iVar97 - 3;
                      if ((int)(iVar97 - 3) <= (int)(LinOpBCType)local_748) {
                        local_74c = (LinOpBCType)local_748;
                      }
                      iVar26 = iVar97 + 3;
                      if ((int)local_4d0 < iVar97 + 3) {
                        iVar26 = (int)local_4d0;
                      }
                      local_690 = CONCAT44(local_578._4_4_,local_578._0_4_);
                      local_708 = CONCAT44(local_708._4_4_,iVar26);
                      local_7d0 = (long)iVar26;
                      local_698 = (undefined1 *)((long)&local_358[-1].domain.btype.itype + 3);
                      local_4a8._0_4_ = (int)local_458.p * 4;
                      local_2b8._0_8_ = pMVar102;
                      local_418._0_8_ = lVar73;
                      pFVar61 = local_508;
                      iVar35 = (int)local_4e0._M_head_impl;
                      do {
                        local_408._0_4_ = iVar35;
                        dVar57 = (double)(long)iVar35;
                        if ((long)iVar35 < (long)local_798) {
                          dVar57 = local_798;
                        }
                        dVar126 = 0.0;
                        if ((*(int *)(lVar73 + ((long)pFVar61 * 4 - local_388) * 4) != 0) &&
                           (local_6e4 <= iVar43)) {
                          iVar34 = local_4a8._0_4_ - SUB84(dVar57,0);
                          local_758 = CONCAT44(local_758._4_4_,iVar34);
                          lVar84 = (long)dVar57 * 8;
                          uVar44 = (uint)((long)pFVar61 * 4);
                          uVar42 = uVar44 | 3;
                          if ((int)uVar31 < (int)uVar42) {
                            uVar42 = uVar31;
                          }
                          iVar45 = uVar44 - 3;
                          if (iVar45 <= iVar62) {
                            iVar45 = iVar62;
                          }
                          lVar40 = CONCAT44(local_498.jstride._4_4_,(uint)local_498.jstride);
                          lVar41 = CONCAT44(local_498.kstride._4_4_,(undefined4)local_498.kstride);
                          lVar49 = CONCAT44(local_498.nstride._4_4_,(undefined4)local_498.nstride);
                          local_608 = CONCAT44(local_5b8.kstride._4_4_,(int)local_5b8.kstride) * 8;
                          lVar94 = CONCAT44(local_5b8.jstride._4_4_,(uint)local_5b8.jstride) * 8;
                          local_600 = lVar41 * 8;
                          lVar50 = (local_4c8 - local_498.begin.z) * local_600;
                          lVar55 = lVar40 * 8;
                          lVar69 = ((long)local_698 - (long)local_498.begin.y) * lVar55;
                          lVar77 = lVar50 + lVar69 + lVar84;
                          lVar54 = ((long)local_358 - (long)local_498.begin.y) * lVar55;
                          lVar70 = lVar50 + lVar54 + lVar84;
                          lVar50 = (local_500 - local_498.begin.z) * local_600;
                          lVar92 = lVar69 + lVar50 + lVar84;
                          lVar69 = lVar50 + lVar54 + lVar84;
                          lVar54 = lVar49 * 0x10;
                          lVar50 = (long)local_498.begin.x;
                          local_730 = lVar77 + lVar50 * -8;
                          local_838 = lVar77 + lVar49 * 8 + lVar50 * -8;
                          lVar51 = lVar77 + lVar54 + lVar50 * -8;
                          local_6f8 = lVar70 + lVar50 * -8;
                          lVar77 = lVar70 + lVar49 * 8 + lVar50 * -8;
                          lVar70 = lVar70 + lVar54 + lVar50 * -8;
                          local_700 = lVar92 + lVar50 * -8;
                          lVar85 = lVar92 + lVar49 * 8 + lVar50 * -8;
                          lVar92 = lVar92 + lVar54 + lVar50 * -8;
                          local_6c8 = lVar69 + lVar50 * -8;
                          lVar49 = lVar69 + lVar49 * 8 + lVar50 * -8;
                          local_778 = lVar69 + lVar54 + lVar50 * -8;
                          local_6f0 = (undefined1 *)((long)local_498.p + local_6c8 + -8);
                          local_6c8 = local_6c8 + (long)local_498.p;
                          local_638 = (long)local_498.p + lVar49 + -8;
                          local_728 = lVar49 + (long)local_498.p;
                          local_640 = (long)local_498.p + local_778 + -8;
                          local_778 = local_778 + (long)local_498.p;
                          local_648 = (long)local_498.p + local_700 + -8;
                          local_700 = local_700 + (long)local_498.p;
                          local_6d0 = (long)local_498.p + lVar85 + -8;
                          local_720 = lVar85 + (long)local_498.p;
                          local_650 = (undefined **)((long)local_498.p + lVar92 + -8);
                          local_658 = (long)local_498.p + local_6f8 + -8;
                          local_6f8 = local_6f8 + (long)local_498.p;
                          local_660 = (undefined **)((long)local_498.p + lVar77 + -8);
                          local_780 = (undefined **)(lVar77 + (long)local_498.p);
                          local_668 = (undefined **)((long)local_498.p + lVar70 + -8);
                          local_670 = (undefined **)((long)local_498.p + local_730 + -8);
                          local_730 = local_730 + (long)local_498.p;
                          local_678 = (undefined **)((long)local_498.p + local_838 + -8);
                          local_838 = local_838 + (long)local_498.p;
                          local_680 = (long)local_498.p + lVar51 + -8;
                          lVar77 = (long)(int)local_3e8.p;
                          lVar88 = (long)(int)local_3e8.jstride._4_4_;
                          lVar65 = (long)local_3e8.p._4_4_;
                          lVar69 = (long)(int)local_3e8.kstride;
                          lVar85 = (long)(int)local_3e8.jstride;
                          lVar54 = (long)local_3e8.kstride._4_4_;
                          local_7e8 = (undefined **)(long)(int)uVar42;
                          uVar101 = ((long)local_358 - (long)local_5b8.begin.y) * lVar94 +
                                    (local_500 - local_5b8.begin.z) * local_608 + lVar84 +
                                    (long)local_5b8.begin.x * -8 +
                                    CONCAT44(local_5b8.p._4_4_,(int)local_5b8.p);
                          lVar84 = lVar70 + (long)local_498.p;
                          lVar49 = lVar92 + (long)local_498.p;
                          uVar29 = lVar51 + (long)local_498.p;
                          lVar50 = local_380;
                          do {
                            local_770 = uVar29;
                            local_768 = lVar49;
                            local_740 = lVar84;
                            local_788 = uVar101;
                            if ((int)local_74c <= iVar26) {
                              iVar46 = iVar32 - (int)lVar50;
                              iVar76 = -iVar46;
                              if (iVar46 < 1) {
                                iVar76 = iVar46;
                              }
                              local_738 = CONCAT44(local_738._4_4_,iVar76 + 4);
                              lVar84 = lVar50 + -1;
                              local_910 = local_838;
                              local_858 = local_730;
                              local_8b8 = local_780;
                              local_860 = local_6f8;
                              local_840 = local_720;
                              local_820 = local_700;
                              local_898 = local_778;
                              local_828 = local_728;
                              local_8a0 = local_6c8;
                              local_868 = local_640;
                              local_870 = local_638;
                              local_7c8 = local_6f0;
                              local_8e8 = local_650;
                              local_8c8 = local_6d0;
                              local_878 = local_648;
                              local_848 = local_668;
                              local_900 = (FabArray<amrex::IArrayBox> *)local_660;
                              local_8d0 = local_658;
                              local_8a8 = local_680;
                              local_8b0 = (LayoutData<int> *)local_678;
                              local_8f0 = local_670;
                              pLVar66 = local_618._M_head_impl;
                              local_918 = local_740;
                              local_908 = local_788;
                              local_8e0 = local_770;
                              local_8c0 = local_768;
                              do {
                                if (iVar45 <= (int)uVar42) {
                                  iVar47 = iVar97 - (int)pLVar66;
                                  iVar46 = -iVar47;
                                  if (iVar47 < 1) {
                                    iVar46 = iVar47;
                                  }
                                  puVar95 = &pLVar66[-1].field_0x10f;
                                  lVar49 = 0;
                                  iVar47 = iVar34;
                                  do {
                                    lVar70 = (long)dVar57 + lVar49;
                                    iVar59 = -iVar47;
                                    if (iVar47 < 1) {
                                      iVar59 = iVar47;
                                    }
                                    if ((((((long)local_798 < lVar70) && (lVar70 < (int)uVar31)) &&
                                         ((long)local_7c0 < (long)pLVar66)) &&
                                        (((long)pLVar66 < (long)local_718 && (lVar98 < lVar50)))) &&
                                       (lVar50 < (int)local_4e8._M_head_impl)) {
                                      dVar127 = *(double *)(local_908 + lVar49 * 8);
                                    }
                                    else {
                                      lVar92 = (long)dVar57 + lVar49 + -1;
                                      dVar127 = 0.0;
                                      if (((lVar77 < lVar70) && (lVar92 <= lVar88)) &&
                                         ((lVar65 < (long)pLVar66 &&
                                          ((((long)puVar95 <= lVar69 && (lVar85 < lVar50)) &&
                                           (lVar84 <= lVar54)))))) {
                                        dVar127 = *(double *)(local_8a8 + lVar49 * 8) *
                                                  (double)local_1d8._0_8_ +
                                                  ((double)local_8f0[lVar49] * local_1c8 -
                                                  (double)*(undefined **)
                                                           ((long)local_8b0 + lVar49 * 8) *
                                                  local_2c0) + 0.0;
                                      }
                                      if (((lVar77 <= lVar70) && (lVar70 <= lVar88)) &&
                                         (((lVar65 < (long)pLVar66 &&
                                           (((long)puVar95 <= lVar69 && (lVar85 < lVar50)))) &&
                                          (lVar84 <= lVar54)))) {
                                        dVar127 = dVar127 + *(double *)(local_8e0 + lVar49 * 8) *
                                                            (double)local_1d8._0_8_ +
                                                            (*(double *)(local_858 + lVar49 * 8) *
                                                             local_228 -
                                                            *(double *)(local_910 + lVar49 * 8) *
                                                            local_2c0);
                                      }
                                      if ((((lVar77 < lVar70) && (lVar92 <= lVar88)) &&
                                          (lVar65 <= (long)pLVar66)) &&
                                         ((((long)pLVar66 <= lVar69 && (lVar85 < lVar50)) &&
                                          (lVar84 <= lVar54)))) {
                                        dVar127 = dVar127 + (double)local_848[lVar49] *
                                                            (double)local_1d8._0_8_ +
                                                            *(double *)(local_8d0 + lVar49 * 8) *
                                                            local_1c8 +
                                                            (double)*(undefined **)
                                                                     ((long)local_900 + lVar49 * 8)
                                                            * local_2c0;
                                      }
                                      if (((lVar77 <= lVar70) && (lVar70 <= lVar88)) &&
                                         ((lVar65 <= (long)pLVar66 &&
                                          ((((long)pLVar66 <= lVar69 && (lVar85 < lVar50)) &&
                                           (lVar84 <= lVar54)))))) {
                                        dVar127 = dVar127 + *(double *)(local_918 + lVar49 * 8) *
                                                            (double)local_1d8._0_8_ +
                                                            *(double *)(local_860 + lVar49 * 8) *
                                                            local_228 +
                                                            (double)local_8b8[lVar49] * local_2c0;
                                      }
                                      if ((((lVar77 < lVar70) && (lVar92 <= lVar88)) &&
                                          ((lVar65 < (long)pLVar66 &&
                                           (((long)puVar95 <= lVar69 && (lVar85 <= lVar50)))))) &&
                                         (lVar50 <= lVar54)) {
                                        dVar127 = dVar127 + (double)local_8e8[lVar49] *
                                                            (double)local_238._0_8_ +
                                                            (*(double *)(local_878 + lVar49 * 8) *
                                                             local_1c8 -
                                                            *(double *)(local_8c8 + lVar49 * 8) *
                                                            local_2c0);
                                      }
                                      if (((((lVar77 <= lVar70) && (lVar70 <= lVar88)) &&
                                           (lVar65 < (long)pLVar66)) &&
                                          (((long)puVar95 <= lVar69 && (lVar85 <= lVar50)))) &&
                                         (lVar50 <= lVar54)) {
                                        dVar127 = dVar127 + *(double *)(local_8c0 + lVar49 * 8) *
                                                            (double)local_238._0_8_ +
                                                            (*(double *)(local_820 + lVar49 * 8) *
                                                             local_228 -
                                                            *(double *)(local_840 + lVar49 * 8) *
                                                            local_2c0);
                                      }
                                      if (((lVar77 < lVar70) && (lVar92 <= lVar88)) &&
                                         ((lVar65 <= (long)pLVar66 &&
                                          ((((long)pLVar66 <= lVar69 && (lVar85 <= lVar50)) &&
                                           (lVar50 <= lVar54)))))) {
                                        dVar127 = dVar127 + *(double *)(local_868 + lVar49 * 8) *
                                                            (double)local_238._0_8_ +
                                                            *(double *)(local_7c8 + lVar49 * 8) *
                                                            local_1c8 +
                                                            *(double *)(local_870 + lVar49 * 8) *
                                                            local_2c0;
                                      }
                                      if (((lVar77 <= lVar70) && (lVar70 <= lVar88)) &&
                                         (((lVar65 <= (long)pLVar66 &&
                                           (((long)pLVar66 <= lVar69 && (lVar85 <= lVar50)))) &&
                                          (lVar50 <= lVar54)))) {
                                        dVar127 = dVar127 + *(double *)(local_898 + lVar49 * 8) *
                                                            (double)local_238._0_8_ +
                                                            *(double *)(local_8a0 + lVar49 * 8) *
                                                            local_228 +
                                                            *(double *)(local_828 + lVar49 * 8) *
                                                            local_2c0;
                                      }
                                    }
                                    dVar126 = dVar126 + (double)((iVar59 + 4) *
                                                                (iVar46 + 4) * (iVar76 + 4)) *
                                                        dVar127;
                                    lVar70 = (long)dVar57 + lVar49;
                                    lVar49 = lVar49 + 1;
                                    iVar47 = iVar47 + -1;
                                  } while (lVar70 < (long)local_7e8);
                                }
                                local_908 = local_908 + lVar94;
                                local_8f0 = local_8f0 + lVar40;
                                local_8b0 = (LayoutData<int> *)((long)local_8b0 + lVar40 * 8);
                                local_8a8 = local_8a8 + lVar55;
                                local_8d0 = local_8d0 + lVar55;
                                local_900 = (FabArray<amrex::IArrayBox> *)
                                            ((long)local_900 + lVar40 * 8);
                                local_848 = local_848 + lVar40;
                                local_878 = local_878 + lVar55;
                                local_8c8 = local_8c8 + lVar55;
                                local_8e8 = local_8e8 + lVar40;
                                local_7c8 = local_7c8 + lVar55;
                                local_870 = local_870 + lVar55;
                                local_868 = local_868 + lVar55;
                                local_8a0 = local_8a0 + lVar55;
                                local_828 = local_828 + lVar55;
                                local_898 = local_898 + lVar55;
                                local_820 = local_820 + lVar55;
                                local_840 = local_840 + lVar55;
                                local_8c0 = local_8c0 + lVar55;
                                local_860 = local_860 + lVar55;
                                local_8b8 = local_8b8 + lVar40;
                                local_918 = local_918 + lVar55;
                                local_858 = local_858 + lVar55;
                                local_910 = local_910 + lVar55;
                                local_8e0 = local_8e0 + lVar55;
                                bVar106 = (long)pLVar66 < local_7d0;
                                pLVar66 = (LayoutData<int> *)
                                          ((long)&(pLVar66->super_FabArrayBase)._vptr_FabArrayBase +
                                          1);
                              } while (bVar106);
                            }
                            local_670 = local_670 + lVar41;
                            local_678 = local_678 + lVar41;
                            local_680 = local_680 + local_600;
                            local_658 = local_658 + local_600;
                            local_660 = local_660 + lVar41;
                            local_668 = local_668 + lVar41;
                            local_648 = local_648 + local_600;
                            local_6d0 = local_6d0 + local_600;
                            local_650 = local_650 + lVar41;
                            local_6f0 = local_6f0 + local_600;
                            local_638 = local_638 + local_600;
                            local_640 = local_640 + local_600;
                            local_6c8 = local_6c8 + local_600;
                            local_728 = local_728 + local_600;
                            local_778 = local_778 + local_600;
                            local_700 = local_700 + local_600;
                            local_720 = local_720 + local_600;
                            local_6f8 = local_6f8 + local_600;
                            local_780 = local_780 + lVar41;
                            local_730 = local_730 + local_600;
                            local_838 = local_838 + local_600;
                            bVar106 = lVar50 < (long)local_610;
                            uVar101 = local_788 + local_608;
                            lVar84 = local_740 + local_600;
                            lVar49 = local_768 + local_600;
                            uVar29 = local_770 + local_600;
                            lVar50 = lVar50 + 1;
                          } while (bVar106);
                          dVar126 = dVar126 * 0.000244140625;
                          local_688 = pFVar61;
                        }
                        *(double *)
                         (((long)pMVar102 - (long)local_558._4_4_) *
                          CONCAT44(local_578._12_4_,local_578._8_4_) * 8 + local_690 +
                          ((long)pFVar61 - (long)(int)local_558) * 8 +
                         (lVar36 - local_550) * (long)local_568 * 8) = dVar126;
                        pFVar61 = (FabArray<amrex::IArrayBox> *)
                                  ((long)&(pFVar61->super_FabArrayBase)._vptr_FabArrayBase + 1);
                        iVar35 = iVar35 + 4;
                        local_4a8._0_4_ = local_4a8._0_4_ + 4;
                      } while (local_6e8 != (uint)pFVar61);
                    }
                    pMVar102 = (MultiCutFab *)
                               ((long)&(pMVar102->m_data).super_FabArrayBase._vptr_FabArrayBase + 1)
                    ;
                    LVar52 = LVar52 + 4;
                    local_4b8 = lVar36;
                  } while (local_70c != (FabType)pMVar102);
                }
                lVar36 = lVar36 + 1;
                iVar53 = iVar53 + 4;
              } while (local_458.kstride._4_4_ + 1 != (int)lVar36);
            }
          }
          if (local_270.
              super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[local_3a8]._M_t.
              super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
              super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl != (MultiFab *)0x0) {
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_340,
                       &(local_270.
                         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[local_3a8]._M_t.
                         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                         .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                        super_FabArray<amrex::FArrayBox>,(MFIter *)local_1b8);
            if (local_4f8 == 2) {
              local_8e8 = (undefined **)(long)(int)local_458.jstride;
              if ((int)local_458.jstride <= local_458.kstride._4_4_) {
                iVar62 = local_458.p._4_4_ * 2 + -2;
                local_7d0 = CONCAT44(local_7d0._4_4_,iVar62);
                iVar53 = (int)local_458.jstride * 2 + -2;
                local_7c8 = (undefined1 *)(long)(int)(LinOpBCType)local_748;
                do {
                  lVar36 = (long)iVar53;
                  if ((long)iVar53 < (long)iVar75) {
                    lVar36 = (long)iVar75;
                  }
                  iVar32 = iVar53;
                  if (iVar53 < iVar75) {
                    iVar32 = iVar75;
                  }
                  if (local_458.p._4_4_ <= (int)(uint)local_458.kstride) {
                    local_7e8 = (undefined **)((long)local_8e8 * 2);
                    iVar43 = (int)local_7e8;
                    iVar97 = iVar43 + -2;
                    if (iVar43 + -2 <= iVar75) {
                      iVar97 = iVar75;
                    }
                    iVar26 = iVar43 + 1;
                    if (local_300.kstride._4_4_ < iVar43 + 1) {
                      iVar26 = local_300.kstride._4_4_;
                    }
                    iVar35 = iVar62;
                    local_898 = (long)local_458.p._4_4_;
                    do {
                      puVar95 = (undefined1 *)(long)iVar35;
                      if ((long)iVar35 < (long)local_7c8) {
                        puVar95 = local_7c8;
                      }
                      iVar34 = iVar35;
                      if (iVar35 < (int)(LinOpBCType)local_748) {
                        iVar34 = (LinOpBCType)local_748;
                      }
                      if ((int)local_458.p <= (int)local_458.jstride._4_4_) {
                        local_798 = (double)(long)iVar34;
                        iVar34 = (int)(local_898 * 2);
                        iVar45 = iVar34 + -2;
                        if (iVar34 + -2 <= (int)(LinOpBCType)local_748) {
                          iVar45 = (LinOpBCType)local_748;
                        }
                        iVar76 = iVar34 + 1;
                        if ((int)local_300.kstride < iVar34 + 1) {
                          iVar76 = (int)local_300.kstride;
                        }
                        lVar98 = (local_898 - local_558._4_4_) *
                                 CONCAT44(local_578._12_4_,local_578._8_4_) * 8 +
                                 CONCAT44(local_578._4_4_,local_578._0_4_) +
                                 ((long)local_8e8 - (long)local_550) * (long)local_568 * 8;
                        pGVar72 = (Geometry *)(long)(int)local_458.p;
                        iVar46 = (int)local_458.p * -2;
                        iVar47 = (int)local_458.p * 2 + -2;
                        do {
                          lVar73 = (long)iVar47;
                          if ((long)iVar47 <
                              (long)(int)local_6d8._M_t.
                                         super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                         .super__Head_base<0UL,_amrex::iMultiFab_*,_false>.
                                         _M_head_impl) {
                            lVar73 = (long)(int)local_6d8._M_t.
                                                super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                                .super__Head_base<0UL,_amrex::iMultiFab_*,_false>.
                                                _M_head_impl;
                          }
                          if (*(int *)(local_5f8._0_8_ +
                                      ((long)pGVar72 * 2 - (long)local_5d8) * 4 +
                                      (local_898 * 2 - (long)local_5d4) *
                                      CONCAT44(local_5f8._12_4_,local_5f8._8_4_) * 4 +
                                      ((long)local_7e8 - (long)local_5d0) *
                                      CONCAT44(local_5f8._20_4_,local_5f8._16_4_) * 4) != 0) {
                            local_718 = (undefined1 *)CONCAT44(local_718._4_4_,iVar47);
                            dVar126 = 0.0;
                            dVar57 = 0.0;
                            if (iVar97 <= iVar26) {
                              uVar42 = (uint)((long)pGVar72 * 2);
                              uVar31 = uVar42 | 1;
                              if ((int)local_300.jstride._4_4_ < (int)uVar31) {
                                uVar31 = local_300.jstride._4_4_;
                              }
                              iVar59 = uVar42 - 2;
                              if (iVar59 <= (int)local_6d8._M_t.
                                                 super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                                 .super__Head_base<0UL,_amrex::iMultiFab_*,_false>.
                                                 _M_head_impl) {
                                iVar59 = (int)local_6d8._M_t.
                                              super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                              .super__Head_base<0UL,_amrex::iMultiFab_*,_false>.
                                              _M_head_impl;
                              }
                              lVar41 = CONCAT44(local_340.jstride._4_4_,
                                                (undefined4)local_340.jstride) * 8;
                              lVar40 = ((long)puVar95 - (long)local_340.begin.y) * lVar41 +
                                       (lVar36 - local_340.begin.z) * local_340.kstride * 8 +
                                       lVar73 * 8 + (long)local_340.begin.x * -8 + (long)local_340.p
                              ;
                              lVar84 = (long)iVar32;
                              do {
                                if (iVar45 <= iVar76) {
                                  dVar57 = local_798;
                                  lVar49 = lVar40;
                                  do {
                                    if (iVar59 <= (int)uVar31) {
                                      lVar50 = 0;
                                      do {
                                        dVar126 = dVar126 + (2.0 - ABS((double)(iVar46 + (int)lVar73
                                                                               + (int)lVar50) + 0.5)
                                                            ) * (2.0 - ABS((double)(SUB84(dVar57,0)
                                                                                   - iVar34) + 0.5))
                                                            * (2.0 - ABS((double)((int)lVar84 -
                                                                                 iVar43) + 0.5)) *
                                                            *(double *)(lVar49 + lVar50 * 8);
                                        lVar54 = lVar73 + lVar50;
                                        lVar50 = lVar50 + 1;
                                      } while (lVar54 < (int)uVar31);
                                    }
                                    lVar49 = lVar49 + lVar41;
                                    bVar106 = (long)dVar57 < (long)iVar76;
                                    dVar57 = (double)((long)dVar57 + 1);
                                  } while (bVar106);
                                }
                                lVar40 = lVar40 + local_340.kstride * 8;
                                bVar106 = lVar84 < iVar26;
                                lVar84 = lVar84 + 1;
                                dVar57 = dVar126;
                              } while (bVar106);
                            }
                            *(double *)(lVar98 + ((long)pGVar72 - (long)(int)local_558) * 8) =
                                 dVar57 * 0.015625 +
                                 *(double *)(lVar98 + ((long)pGVar72 - (long)(int)local_558) * 8);
                            local_7c0 = pGVar72;
                          }
                          pGVar72 = (Geometry *)((long)&(pGVar72->super_CoordSys).c_sys + 1);
                          iVar47 = iVar47 + 2;
                          iVar46 = iVar46 + -2;
                        } while (local_458.jstride._4_4_ + 1 != (int)pGVar72);
                      }
                      local_898 = local_898 + 1;
                      iVar35 = iVar35 + 2;
                    } while ((uint)local_458.kstride + 1 != (int)local_898);
                  }
                  local_8e8 = (undefined **)((long)local_8e8 + 1);
                  iVar53 = iVar53 + 2;
                } while (local_458.kstride._4_4_ + 1 != (int)local_8e8);
              }
            }
            else {
              local_8e8 = (undefined **)(long)(int)local_458.jstride;
              if ((int)local_458.jstride <= local_458.kstride._4_4_) {
                iVar62 = local_458.p._4_4_ * 4 + -4;
                local_7d0 = CONCAT44(local_7d0._4_4_,iVar62);
                iVar53 = (int)local_458.jstride * 4 + -4;
                local_7c8 = (undefined1 *)(long)(int)(LinOpBCType)local_748;
                do {
                  lVar36 = (long)iVar53;
                  if ((long)iVar53 < (long)iVar75) {
                    lVar36 = (long)iVar75;
                  }
                  iVar32 = iVar53;
                  if (iVar53 < iVar75) {
                    iVar32 = iVar75;
                  }
                  if (local_458.p._4_4_ <= (int)(uint)local_458.kstride) {
                    local_7e8 = (undefined **)((long)local_8e8 * 4);
                    iVar43 = (int)local_7e8;
                    iVar97 = iVar43 + -4;
                    if (iVar43 + -4 <= iVar75) {
                      iVar97 = iVar75;
                    }
                    iVar26 = iVar43 + 3;
                    if (local_300.kstride._4_4_ < iVar43 + 3) {
                      iVar26 = local_300.kstride._4_4_;
                    }
                    iVar35 = iVar62;
                    local_898 = (long)local_458.p._4_4_;
                    do {
                      puVar95 = (undefined1 *)(long)iVar35;
                      if ((long)iVar35 < (long)local_7c8) {
                        puVar95 = local_7c8;
                      }
                      iVar34 = iVar35;
                      if (iVar35 < (int)(LinOpBCType)local_748) {
                        iVar34 = (LinOpBCType)local_748;
                      }
                      if ((int)local_458.p <= (int)local_458.jstride._4_4_) {
                        local_798 = (double)(long)iVar34;
                        iVar34 = (int)(local_898 * 4);
                        iVar45 = iVar34 + -4;
                        if (iVar34 + -4 <= (int)(LinOpBCType)local_748) {
                          iVar45 = (LinOpBCType)local_748;
                        }
                        iVar76 = iVar34 + 3;
                        if ((int)local_300.kstride < iVar34 + 3) {
                          iVar76 = (int)local_300.kstride;
                        }
                        lVar98 = (local_898 - local_558._4_4_) *
                                 CONCAT44(local_578._12_4_,local_578._8_4_) * 8 +
                                 CONCAT44(local_578._4_4_,local_578._0_4_) +
                                 ((long)local_8e8 - (long)local_550) * (long)local_568 * 8;
                        pGVar72 = (Geometry *)(long)(int)local_458.p;
                        iVar46 = (int)local_458.p * -4;
                        iVar47 = (int)local_458.p * 4 + -4;
                        do {
                          lVar73 = (long)iVar47;
                          if ((long)iVar47 <
                              (long)(int)local_6d8._M_t.
                                         super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                         .super__Head_base<0UL,_amrex::iMultiFab_*,_false>.
                                         _M_head_impl) {
                            lVar73 = (long)(int)local_6d8._M_t.
                                                super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                                .super__Head_base<0UL,_amrex::iMultiFab_*,_false>.
                                                _M_head_impl;
                          }
                          if (*(int *)(local_5f8._0_8_ +
                                      ((long)pGVar72 * 4 - (long)local_5d8) * 4 +
                                      (local_898 * 4 - (long)local_5d4) *
                                      CONCAT44(local_5f8._12_4_,local_5f8._8_4_) * 4 +
                                      ((long)local_7e8 - (long)local_5d0) *
                                      CONCAT44(local_5f8._20_4_,local_5f8._16_4_) * 4) != 0) {
                            local_718 = (undefined1 *)CONCAT44(local_718._4_4_,iVar47);
                            dVar126 = 0.0;
                            dVar57 = 0.0;
                            if (iVar97 <= iVar26) {
                              uVar42 = (uint)((long)pGVar72 * 4);
                              uVar31 = uVar42 | 3;
                              if ((int)local_300.jstride._4_4_ < (int)uVar31) {
                                uVar31 = local_300.jstride._4_4_;
                              }
                              iVar59 = uVar42 - 4;
                              if (iVar59 <= (int)local_6d8._M_t.
                                                 super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                                 .super__Head_base<0UL,_amrex::iMultiFab_*,_false>.
                                                 _M_head_impl) {
                                iVar59 = (int)local_6d8._M_t.
                                              super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                              .super__Head_base<0UL,_amrex::iMultiFab_*,_false>.
                                              _M_head_impl;
                              }
                              lVar41 = CONCAT44(local_340.jstride._4_4_,
                                                (undefined4)local_340.jstride) * 8;
                              lVar40 = ((long)puVar95 - (long)local_340.begin.y) * lVar41 +
                                       (lVar36 - local_340.begin.z) * local_340.kstride * 8 +
                                       lVar73 * 8 + (long)local_340.begin.x * -8 + (long)local_340.p
                              ;
                              lVar84 = (long)iVar32;
                              do {
                                if (iVar45 <= iVar76) {
                                  dVar57 = local_798;
                                  lVar49 = lVar40;
                                  do {
                                    if (iVar59 <= (int)uVar31) {
                                      lVar50 = 0;
                                      do {
                                        dVar126 = dVar126 + (4.0 - ABS((double)(iVar46 + (int)lVar73
                                                                               + (int)lVar50) + 0.5)
                                                            ) * (4.0 - ABS((double)(SUB84(dVar57,0)
                                                                                   - iVar34) + 0.5))
                                                            * (4.0 - ABS((double)((int)lVar84 -
                                                                                 iVar43) + 0.5)) *
                                                            *(double *)(lVar49 + lVar50 * 8);
                                        lVar54 = lVar73 + lVar50;
                                        lVar50 = lVar50 + 1;
                                      } while (lVar54 < (int)uVar31);
                                    }
                                    lVar49 = lVar49 + lVar41;
                                    bVar106 = (long)dVar57 < (long)iVar76;
                                    dVar57 = (double)((long)dVar57 + 1);
                                  } while (bVar106);
                                }
                                lVar40 = lVar40 + local_340.kstride * 8;
                                bVar106 = lVar84 < iVar26;
                                lVar84 = lVar84 + 1;
                                dVar57 = dVar126;
                              } while (bVar106);
                            }
                            *(double *)(lVar98 + ((long)pGVar72 - (long)(int)local_558) * 8) =
                                 dVar57 * 0.000244140625 +
                                 *(double *)(lVar98 + ((long)pGVar72 - (long)(int)local_558) * 8);
                            local_7c0 = pGVar72;
                          }
                          pGVar72 = (Geometry *)((long)&(pGVar72->super_CoordSys).c_sys + 1);
                          iVar47 = iVar47 + 4;
                          iVar46 = iVar46 + -4;
                        } while (local_458.jstride._4_4_ + 1 != (int)pGVar72);
                      }
                      local_898 = local_898 + 1;
                      iVar35 = iVar35 + 4;
                    } while ((uint)local_458.kstride + 1 != (int)local_898);
                  }
                  local_8e8 = (undefined **)((long)local_8e8 + 1);
                  iVar53 = iVar53 + 4;
                } while (local_458.kstride._4_4_ + 1 != (int)local_8e8);
              }
            }
          }
          MFIter::operator++((MFIter *)local_1b8);
        } while (local_198[0] < local_198[2]);
      }
      MFIter::~MFIter((MFIter *)local_1b8);
    } while (local_3a8 < (long)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels + -1);
  }
  iVar75 = (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels;
  if (0 < iVar75) {
    lVar36 = 0;
    do {
      pMVar19 = local_1f0.
                super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar36]._M_t.
                super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
      if (pMVar19 != (MultiFab *)0x0) {
        MultiFab::Add((local_6e0->
                      super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar36],pMVar19,0,0,1,0);
      }
      lVar36 = lVar36 + 1;
      iVar75 = (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels;
    } while (lVar36 < iVar75);
  }
  if (1 < iVar75) {
    uVar101 = (ulong)(iVar75 - 2);
    do {
      pGVar72 = *(Geometry **)
                 &(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                  super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  .
                  super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar101].
                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
      pMVar19 = (local_6e0->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar101];
      local_578._4_4_ = 0;
      local_578._0_4_ = 1;
      pbStack_560 = (pointer)0x0;
      local_558 = (pointer)0x0;
      local_578._8_4_ = 0;
      local_578._12_4_ = 0;
      local_568 = (undefined1  [8])0x0;
      local_498.p = (double *)&PTR__FabFactory_008378d0;
      MultiFab::MultiFab((MultiFab *)local_1b8,
                         (BoxArray *)
                         ((long)&(pMVar19->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8)
                         ,(DistributionMapping *)
                          ((long)&(pMVar19->super_FabArray<amrex::FArrayBox>).super_FabArrayBase +
                          0x70),1,0,(MFInfo *)local_578,(FabFactory<amrex::FArrayBox> *)&local_498);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_568);
      FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)local_1b8,0.0,0,local_ec,&local_f8);
      pFVar17 = &(local_210.
                  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar101]._M_t.
                  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t
                  .super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                 super_FabArray<amrex::FArrayBox>;
      PVar134 = Geometry::periodicity(pGVar72);
      local_578._0_4_ = PVar134.period.vect[0];
      local_578._4_4_ = PVar134.period.vect[1];
      local_578._8_4_ = PVar134.period.vect[2];
      FabArray<amrex::FArrayBox>::ParallelCopy
                ((FabArray<amrex::FArrayBox> *)local_1b8,pFVar17,(Periodicity *)local_578,ADD);
      Geometry::growPeriodicDomain(pGVar72,1);
      local_7b8.bigend.vect[1] = local_808.bigend.vect[1];
      local_7b8.bigend.vect[2] = local_808.bigend.vect[2];
      local_7b8.btype.itype = local_808.btype.itype;
      local_7b8.smallend.vect[0] = local_808.smallend.vect[0];
      local_7b8.smallend.vect[1] = local_808.smallend.vect[1];
      local_7b8.smallend.vect[2] = local_808.smallend.vect[2];
      local_7b8.bigend.vect[0] = local_808.bigend.vect[0];
      lVar36 = 0;
      do {
        if (local_6b0.arr[lVar36] == inflow) {
          piVar38 = local_7b8.smallend.vect + lVar36;
          *piVar38 = *piVar38 + -1;
        }
        if (local_6c0.arr[lVar36] == inflow) {
          piVar38 = local_7b8.bigend.vect + lVar36;
          *piVar38 = *piVar38 + 1;
        }
        lVar36 = lVar36 + 1;
      } while (lVar36 != 3);
      uVar15 = *(undefined8 *)((pGVar72->domain).smallend.vect + 2);
      uVar27 = *(undefined8 *)((pGVar72->domain).bigend.vect + 2);
      local_378.bigend.vect[1] = (int)((ulong)*(undefined8 *)(pGVar72->domain).bigend.vect >> 0x20);
      local_378.bigend.vect[2] = (int)uVar27;
      local_378.btype.itype = (uint)((ulong)uVar27 >> 0x20);
      local_378.smallend.vect._0_8_ = *(undefined8 *)(pGVar72->domain).smallend.vect;
      local_378.smallend.vect[2] = (int)uVar15;
      local_378.bigend.vect[0] = (int)((ulong)uVar15 >> 0x20);
      lVar36 = 0;
      do {
        if ((local_378.btype.itype >> ((uint)lVar36 & 0x1f) & 1) == 0) {
          piVar38 = local_378.bigend.vect + lVar36;
          *piVar38 = *piVar38 + 1;
        }
        lVar36 = lVar36 + 1;
      } while (lVar36 != 3);
      local_378.btype.itype = 7;
      local_3f8 = (FabArray<amrex::IArrayBox> *)(pGVar72->super_CoordSys).inv_dx[0];
      uStack_3f0 = 0;
      local_408._8_8_ = 0;
      local_408._0_8_ = (pGVar72->super_CoordSys).inv_dx[1];
      local_4a8._8_8_ = 0;
      local_4a8._0_8_ = (pGVar72->super_CoordSys).inv_dx[2];
      local_688 = (FabArray<amrex::IArrayBox> *)
                  **(double **)
                    &(this->super_MLNodeLinOp).m_dirichlet_mask.
                     super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar101].
                     super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
      ;
      local_6d8._M_t.
      super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
      super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
           (this->super_MLNodeLinOp).m_nd_fine_mask.
           super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar101]._M_t.
           super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t;
      local_4b0._M_t.
      super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
      super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
           (this->super_MLNodeLinOp).m_cc_fine_mask.
           super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar101]._M_t.
           super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t;
      local_618._M_head_impl =
           *(LayoutData<int> **)
            &(this->super_MLNodeLinOp).m_has_fine_bndry.
             super_vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar101]._M_t.
             super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
      ;
      local_254.device_sync = true;
      local_254.num_streams = Gpu::Device::max_gpu_streams;
      local_254.tilesize.vect[2] = DAT_0083cec0;
      local_254.tilesize.vect[0] = (undefined4)FabArrayBase::mfiter_tile_size;
      local_254.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
      local_254.do_tiling = true;
      local_254.dynamic = true;
      MFIter::MFIter((MFIter *)local_578,
                     (FabArrayBase *)
                     (local_6e0->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                     ).super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar101],&local_254);
      iVar75 = local_7b8.smallend.vect[2];
      if ((int)local_558 < local_550) {
        local_3f8 = (FabArray<amrex::IArrayBox> *)((double)local_3f8 * 0.25);
        uVar121 = local_408._8_4_;
        uVar31 = local_408._12_4_;
        dVar57 = local_408._0_8_ * 0.25;
        uVar122 = local_4a8._8_4_;
        uVar42 = local_4a8._12_4_;
        dVar126 = local_4a8._0_8_ * 0.25;
        lVar36 = (long)local_7b8.smallend.vect[0];
        local_798 = (double)(long)local_7b8.bigend.vect[0];
        lVar98 = (long)local_7b8.smallend.vect[1];
        lVar73 = (long)local_7b8.bigend.vect[1];
        iVar62 = local_7b8.bigend.vect[2];
        local_408._8_4_ = uVar121;
        local_408._0_8_ = dVar57;
        local_408._12_4_ = uVar31;
        local_4a8._8_4_ = uVar122;
        local_4a8._0_8_ = dVar126;
        local_4a8._12_4_ = uVar42;
        local_698 = (undefined1 *)(long)local_378.smallend.vect[0];
        local_358 = (Geometry *)-(double)local_3f8;
        uStack_350 = uStack_3f0 ^ 0x8000000000000000;
        local_2b8._8_4_ = uVar121;
        local_2b8._0_8_ = -dVar57;
        local_2b8._12_4_ = uVar31 ^ 0x80000000;
        local_418._8_4_ = uVar122;
        local_418._0_8_ = -dVar126;
        local_418._12_4_ = uVar42 ^ 0x80000000;
        local_690 = uVar101;
        do {
          piVar38 = (int *)&local_558;
          if (local_538 != (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar38 = (local_538->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start + (int)local_558;
          }
          if (*(int *)(*(long *)&((local_618._M_head_impl)->m_data).
                                 super_vector<int,_std::allocator<int>_> + (long)*piVar38 * 4) != 0)
          {
            MFIter::tilebox(&local_29c,(MFIter *)local_578);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((Array4<double> *)&local_498,
                       &(local_6e0->
                        super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar101]->
                        super_FabArray<amrex::FArrayBox>,(MFIter *)local_578);
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_5b8,
                       &(local_4f0->
                        super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar101]->
                        super_FabArray<amrex::FArrayBox>,(MFIter *)local_578);
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      ((Array4<const_double> *)local_5f8,(FabArray<amrex::FArrayBox> *)local_1b8,
                       (MFIter *)local_578);
            FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                      ((Array4<const_int> *)&local_340,local_688,(MFIter *)local_578);
            FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                      ((Array4<const_int> *)&local_458,
                       (FabArray<amrex::IArrayBox> *)
                       local_6d8._M_t.
                       super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                       .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,
                       (MFIter *)local_578);
            FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                      ((Array4<const_int> *)&local_300,
                       (FabArray<amrex::IArrayBox> *)
                       local_4b0._M_t.
                       super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                       .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,
                       (MFIter *)local_578);
            pFVar17 = &(local_270.
                        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar101]._M_t.
                        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                        .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                       super_FabArray<amrex::FArrayBox>;
            if (pFVar17 == (FabArray<amrex::FArrayBox> *)0x0) {
              local_3e8.kstride._0_4_ = 0;
              local_3e8.kstride._4_4_ = 0;
              local_3e8.nstride = 0;
              local_3e8.p = (double *)0x0;
              local_3e8.jstride._0_4_ = 0;
              local_3e8.jstride._4_4_ = 0;
              local_3e8.begin.x = 1;
              local_3e8.begin.y = 1;
              local_3e8.begin.z = 1;
              local_3e8.end.x = 0;
              local_3e8.end.y = 0;
              local_3e8.end.z = 0;
              local_3e8.ncomp = 0;
            }
            else {
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        (&local_3e8,pFVar17,(MFIter *)local_578);
            }
            local_930 = local_29c._8_8_ & 0xffffffff;
            local_74c = local_29c.bigend.vect[2];
            uVar101 = local_690;
            if (local_29c.smallend.vect[2] <= local_29c.bigend.vect[2]) {
              local_708 = (ulong)(uint)local_29c.bigend.vect[1];
              local_600 = (long)local_29c.smallend.vect[1];
              lVar84 = (long)local_29c.smallend.vect[0];
              local_648 = CONCAT44(local_648._4_4_,local_29c.bigend.vect[1] + 1U);
              local_7c8 = local_698 + -lVar84;
              local_610 = (LayoutData<int> *)(local_600 + -1);
              local_608 = CONCAT44(local_608._4_4_,local_29c.smallend.vect[2] + -1);
              local_6f0 = (undefined1 *)(lVar84 * 4);
              local_6d0 = lVar84 * 8;
              local_640 = CONCAT44(local_640._4_4_,local_29c.bigend.vect[0]);
              do {
                LVar52 = (LinOpBCType)local_930;
                if (local_29c.smallend.vect[1] <= local_29c.bigend.vect[1]) {
                  lVar41 = (long)(int)LVar52;
                  local_680 = (long)(int)local_608;
                  iVar53 = LVar52 + ~interior;
                  local_638 = CONCAT44(local_340.jstride._4_4_,(undefined4)local_340.jstride) * 4;
                  puVar95 = (undefined1 *)((long)local_340.p + (long)local_6f0) +
                            (local_600 - local_340.begin.y) * local_638 +
                            (lVar41 - local_340.begin.z) * local_340.kstride * 4 +
                            (long)local_340.begin.x * -4;
                  lVar40 = local_600;
                  local_8b0 = local_610;
                  do {
                    if (local_29c.smallend.vect[0] <= local_29c.bigend.vect[0]) {
                      lVar54 = CONCAT44(local_5b8.jstride._4_4_,(uint)local_5b8.jstride);
                      lVar69 = CONCAT44(local_5b8.kstride._4_4_,(int)local_5b8.kstride);
                      lVar64 = local_5b8.nstride * 0x10;
                      uVar15 = *(undefined8 *)
                                (&DAT_007a40a0 +
                                (ulong)((local_6c0.arr[0] - Neumann & 0xfffffffb) == 0) * 8);
                      lVar56 = lVar40 - local_5b8.begin.y;
                      lVar83 = lVar54 * lVar56 + lVar84;
                      lVar86 = lVar41 - local_5b8.begin.z;
                      lVar68 = lVar69 * lVar86;
                      lVar49 = lVar68 + lVar83;
                      lVar67 = (long)local_8b0 - (long)local_5b8.begin.y;
                      lVar70 = lVar54 * lVar67 + lVar84;
                      lVar68 = lVar68 + lVar70;
                      lVar50 = local_680 - local_5b8.begin.z;
                      lVar103 = lVar69 * lVar50;
                      lVar83 = lVar83 + lVar103;
                      lVar103 = lVar103 + lVar70;
                      lVar77 = CONCAT44(local_300.kstride._4_4_,(int)local_300.kstride) * 4;
                      lVar88 = (lVar41 - local_300.begin.z) * lVar77;
                      lVar77 = (local_680 - local_300.begin.z) * lVar77;
                      lVar92 = CONCAT44(local_300.jstride._4_4_,(int)local_300.jstride) * 4;
                      lVar65 = ((long)local_8b0 - (long)local_300.begin.y) * lVar92;
                      lVar92 = (lVar40 - local_300.begin.y) * lVar92;
                      lVar85 = (long)local_300.begin.x;
                      lVar70 = CONCAT44(local_300.p._4_4_,(int)local_300.p);
                      lVar94 = lVar65 + lVar88 + lVar85 * -4 + lVar70;
                      local_7c0 = (Geometry *)(local_6f0 + lVar65 + lVar77 + lVar85 * -4 + lVar70);
                      lVar65 = lVar88 + lVar92 + lVar85 * -4 + lVar70;
                      local_718 = local_6f0 + lVar92 + lVar77 + lVar85 * -4 + lVar70;
                      lVar60 = lVar40 - local_3e8.begin.y;
                      lVar80 = (long)local_8b0 - (long)local_3e8.begin.y;
                      lVar51 = lVar41 - local_3e8.begin.z;
                      lVar79 = local_680 - local_3e8.begin.z;
                      lVar92 = CONCAT44(local_3e8.jstride._4_4_,(int)local_3e8.jstride);
                      lVar82 = lVar92 * lVar80 + lVar84;
                      lVar88 = CONCAT44(local_3e8.kstride._4_4_,(int)local_3e8.kstride);
                      lVar78 = lVar88 * lVar79;
                      lVar79 = lVar79 * lVar88 * 8;
                      lVar80 = lVar80 * lVar92 * 8;
                      lVar55 = (long)local_3e8.begin.x;
                      local_7e8 = (undefined **)local_3e8.p;
                      local_650 = (undefined **)(local_3e8.p + lVar84 + (-1 - lVar55));
                      lVar67 = lVar67 * lVar54 * 8;
                      lVar50 = lVar50 * lVar69 * 8;
                      lVar71 = lVar54 * 8 * lVar56 + lVar50;
                      lVar50 = lVar67 + lVar50;
                      lVar67 = lVar69 * 8 * lVar86 + lVar67;
                      lVar56 = (long)local_5b8.begin.x;
                      lVar54 = lVar49 * 8;
                      lVar69 = lVar68 * 8;
                      lVar70 = lVar83 * 8;
                      lVar77 = lVar103 * 8;
                      lVar85 = CONCAT44(local_5b8.p._4_4_,(int)local_5b8.p);
                      local_738 = lVar54 + lVar56 * -8 + lVar85 + -8;
                      local_758 = lVar85 + -8 + lVar54 + local_5b8.nstride * 8 + lVar56 * -8;
                      local_760 = lVar85 + -8 + lVar64 + lVar49 * 8 + lVar56 * -8;
                      local_788 = lVar85 + -8 + lVar69 + lVar56 * -8;
                      local_740 = lVar85 + -8 + lVar69 + local_5b8.nstride * 8 + lVar56 * -8;
                      local_768 = lVar85 + -8 + lVar64 + lVar68 * 8 + lVar56 * -8;
                      local_770 = lVar85 + -8 + lVar70 + lVar56 * -8;
                      local_778 = lVar85 + -8 + lVar64 + lVar83 * 8 + lVar56 * -8;
                      local_780 = (undefined **)(lVar85 + -8 + lVar77 + lVar56 * -8);
                      local_720 = lVar85 + -8 + lVar77 + local_5b8.nstride * 8 + lVar56 * -8;
                      local_728 = lVar85 + -8 + lVar64 + lVar103 * 8 + lVar56 * -8;
                      local_658 = lVar60 * 8;
                      local_660 = (undefined **)
                                  (local_3e8.p + ((lVar88 * lVar51 + lVar82 + -1) - lVar55));
                      local_668 = (undefined **)
                                  (local_3e8.p + ((lVar92 * lVar60 + lVar84 + lVar78 + -1) - lVar55)
                                  );
                      local_670 = (undefined **)(local_3e8.p + ((lVar78 + lVar82 + -1) - lVar55));
                      local_678 = (undefined **)(local_3e8.p + lVar84);
                      local_700 = lVar80 + lVar79 + lVar55 * -8 + (long)local_678;
                      local_6f8 = lVar92 * 8 * lVar60 + lVar79 + lVar55 * -8 + (long)local_678;
                      local_6c8 = lVar88 * 8 * lVar51 + lVar80 + lVar55 * -8 + (long)local_678;
                      local_7d0 = local_6d0 + lVar85;
                      local_730 = local_7d0 + lVar67 + local_5b8.nstride * 8 + lVar56 * -8;
                      lVar49 = lVar40 + -1;
                      lVar54 = (long)local_808.bigend.vect[0];
                      puVar105 = (undefined1 *)0x0;
                      do {
                        if ((*(int *)(puVar95 + (long)puVar105 * 4) == 0) &&
                           (*(int *)(local_6f0 +
                                    (long)puVar105 * 4 +
                                    (lVar41 - local_458.begin.z) *
                                    CONCAT44(local_458.kstride._4_4_,(uint)local_458.kstride) * 4 +
                                    (lVar40 - local_458.begin.y) *
                                    CONCAT44(local_458.jstride._4_4_,(int)local_458.jstride) * 4 +
                                    (long)local_458.begin.x * -4 +
                                    CONCAT44(local_458.p._4_4_,(int)local_458.p)) == 1)) {
                          puVar4 = puVar105 + lVar84;
                          puVar120 = ((undefined **)(local_5f8._0_8_ + lVar84 * 8))
                                     [(long)(puVar105 +
                                            (((lVar40 - local_5d4) *
                                              CONCAT44(local_5f8._12_4_,local_5f8._8_4_) +
                                             (lVar41 - local_5d0) *
                                             CONCAT44(local_5f8._20_4_,local_5f8._16_4_)) -
                                            (long)local_5d8))];
                          puVar96 = puVar105 + lVar84 + -1;
                          if ((((*(int *)((long)(local_7c0->super_CoordSys).offset +
                                         (long)puVar105 * 4 + -0xc) == 0) &&
                               (((((lVar36 < (long)puVar4 && ((long)puVar96 <= (long)local_798)) &&
                                  (lVar98 < lVar40)) &&
                                 ((lVar49 <= lVar73 && (iVar75 < (int)LVar52)))) &&
                                (iVar53 <= iVar62)))) &&
                              (((puVar120 = (undefined *)
                                            ((double)puVar120 +
                                            *(double *)(local_728 + (long)puVar105 * 8) *
                                            (double)local_418._0_8_ +
                                            (double)local_780[(long)puVar105] * (double)local_358 +
                                            *(double *)(local_720 + (long)puVar105 * 8) *
                                            (double)local_2b8._0_8_),
                                (undefined **)local_3e8.p != (undefined **)0x0 &&
                                ((long)local_808.smallend.vect[0] < (long)puVar4)) &&
                               ((long)puVar96 <= lVar54)))) &&
                             ((((local_808.smallend.vect[1] < lVar40 &&
                                (lVar49 <= local_808.bigend.vect[1])) &&
                               (local_808.smallend.vect[2] < (int)LVar52)) &&
                              (iVar53 <= local_808.bigend.vect[2])))) {
                            puVar120 = (undefined *)
                                       ((double)puVar120 + (double)local_670[(long)puVar105] * 0.125
                                       );
                          }
                          if ((((*(int *)((long)(local_7c0->super_CoordSys).offset +
                                         (long)puVar105 * 4 + -8) == 0) && (lVar36 <= (long)puVar4))
                              && (((long)puVar4 <= (long)local_798 &&
                                  ((lVar98 < lVar40 && (lVar49 <= lVar73)))))) &&
                             ((((iVar75 < (int)LVar52 &&
                                (((iVar53 <= iVar62 &&
                                  (puVar120 = (undefined *)
                                              ((double)puVar120 +
                                              *(double *)
                                               (local_7d0 +
                                               (long)puVar105 * 8 + lVar50 + lVar64 + lVar56 * -8) *
                                              (double)local_418._0_8_ +
                                              *(double *)
                                               (local_7d0 +
                                               (long)puVar105 * 8 + lVar50 + lVar56 * -8) *
                                              (double)local_3f8 +
                                              *(double *)
                                               (local_7d0 +
                                               (long)puVar105 * 8 +
                                               lVar50 + local_5b8.nstride * 8 + lVar56 * -8) *
                                              (double)local_2b8._0_8_),
                                  (undefined **)local_3e8.p != (undefined **)0x0)) &&
                                 ((long)local_808.smallend.vect[0] <= (long)puVar4)))) &&
                               (((long)puVar4 <= lVar54 && (local_808.smallend.vect[1] < lVar40))))
                              && ((lVar49 <= local_808.bigend.vect[1] &&
                                  ((local_808.smallend.vect[2] < (int)LVar52 &&
                                   (iVar53 <= local_808.bigend.vect[2])))))))) {
                            puVar120 = (undefined *)
                                       ((double)puVar120 +
                                       *(double *)(local_700 + (long)puVar105 * 8) * 0.125);
                          }
                          if ((((((*(int *)(local_718 + (long)puVar105 * 4 + -4) == 0) &&
                                 (lVar36 < (long)puVar4)) && ((long)puVar96 <= (long)local_798)) &&
                               ((lVar98 <= lVar40 && (lVar40 <= lVar73)))) &&
                              (((iVar75 < (int)LVar52 &&
                                ((iVar53 <= iVar62 &&
                                 (puVar120 = (undefined *)
                                             ((double)puVar120 +
                                             *(double *)(local_778 + (long)puVar105 * 8) *
                                             (double)local_418._0_8_ +
                                             *(double *)(local_770 + (long)puVar105 * 8) *
                                             (double)local_358 +
                                             *(double *)
                                              (lVar85 + -8 +
                                               lVar70 + local_5b8.nstride * 8 + lVar56 * -8 +
                                              (long)puVar105 * 8) * (double)local_408._0_8_),
                                 (undefined **)local_3e8.p != (undefined **)0x0)))) &&
                               ((long)local_808.smallend.vect[0] < (long)puVar4)))) &&
                             (((((long)puVar96 <= lVar54 && (local_808.smallend.vect[1] <= lVar40))
                               && (lVar40 <= local_808.bigend.vect[1])) &&
                              ((local_808.smallend.vect[2] < (int)LVar52 &&
                               (iVar53 <= local_808.bigend.vect[2])))))) {
                            puVar120 = (undefined *)
                                       ((double)puVar120 + (double)local_668[(long)puVar105] * 0.125
                                       );
                          }
                          if (((((*(int *)(local_718 + (long)puVar105 * 4) == 0) &&
                                (lVar36 <= (long)puVar4)) &&
                               (((long)puVar4 <= (long)local_798 &&
                                (((lVar98 <= lVar40 && (lVar40 <= lVar73)) && (iVar75 < (int)LVar52)
                                 ))))) &&
                              ((iVar53 <= iVar62 &&
                               (puVar120 = (undefined *)
                                           ((double)puVar120 +
                                           *(double *)
                                            (local_7d0 +
                                            (long)puVar105 * 8 + lVar71 + lVar64 + lVar56 * -8) *
                                           (double)local_418._0_8_ +
                                           *(double *)
                                            (local_7d0 + (long)puVar105 * 8 + lVar71 + lVar56 * -8)
                                           * (double)local_3f8 +
                                           *(double *)
                                            (local_7d0 +
                                            (long)puVar105 * 8 +
                                            lVar71 + local_5b8.nstride * 8 + lVar56 * -8) *
                                           (double)local_408._0_8_),
                               (undefined **)local_3e8.p != (undefined **)0x0)))) &&
                             (((long)local_808.smallend.vect[0] <= (long)puVar4 &&
                              ((((long)puVar4 <= lVar54 && (local_808.smallend.vect[1] <= lVar40))
                               && ((lVar40 <= local_808.bigend.vect[1] &&
                                   ((local_808.smallend.vect[2] < (int)LVar52 &&
                                    (iVar53 <= local_808.bigend.vect[2])))))))))) {
                            puVar120 = (undefined *)
                                       ((double)puVar120 +
                                       *(double *)(local_6f8 + (long)puVar105 * 8) * 0.125);
                          }
                          if (((((*(int *)(local_6f0 + (long)puVar105 * 4 + lVar94 + -4) == 0) &&
                                (lVar36 < (long)puVar4)) && ((long)puVar96 <= (long)local_798)) &&
                              ((lVar98 < lVar40 && (lVar49 <= lVar73)))) &&
                             (((iVar75 <= (int)LVar52 &&
                               (((int)LVar52 <= iVar62 &&
                                (puVar120 = (undefined *)
                                            ((double)puVar120 +
                                            *(double *)(local_768 + (long)puVar105 * 8) *
                                            (double)local_4a8._0_8_ +
                                            *(double *)(local_788 + (long)puVar105 * 8) *
                                            (double)local_358 +
                                            *(double *)(local_740 + (long)puVar105 * 8) *
                                            (double)local_2b8._0_8_),
                                (undefined **)local_3e8.p != (undefined **)0x0)))) &&
                              (((long)local_808.smallend.vect[0] < (long)puVar4 &&
                               (((((long)puVar96 <= lVar54 && (local_808.smallend.vect[1] < lVar40))
                                 && (lVar49 <= local_808.bigend.vect[1])) &&
                                ((local_808.smallend.vect[2] <= (int)LVar52 &&
                                 ((int)LVar52 <= local_808.bigend.vect[2])))))))))) {
                            puVar120 = (undefined *)
                                       ((double)puVar120 + (double)local_660[(long)puVar105] * 0.125
                                       );
                          }
                          if ((((*(int *)(local_6f0 + (long)puVar105 * 4 + lVar94) == 0) &&
                               (lVar36 <= (long)puVar4)) &&
                              (((long)puVar4 <= (long)local_7b8.bigend.vect[0] &&
                               (((local_7b8.smallend.vect[1] < lVar40 &&
                                 (lVar49 <= local_7b8.bigend.vect[1])) &&
                                (local_7b8.smallend.vect[2] <= (int)LVar52)))))) &&
                             ((((int)LVar52 <= local_7b8.bigend.vect[2] &&
                               (puVar120 = (undefined *)
                                           ((double)puVar120 +
                                           *(double *)
                                            (local_7d0 +
                                            (long)puVar105 * 8 + lVar67 + lVar64 + lVar56 * -8) *
                                           (double)local_4a8._0_8_ +
                                           *(double *)
                                            (local_7d0 + (long)puVar105 * 8 + lVar67 + lVar56 * -8)
                                           * (double)local_3f8 +
                                           *(double *)(local_730 + (long)puVar105 * 8) *
                                           (double)local_2b8._0_8_),
                               (undefined **)local_3e8.p != (undefined **)0x0)) &&
                              (((long)local_808.smallend.vect[0] <= (long)puVar4 &&
                               ((((long)puVar4 <= lVar54 && (local_808.smallend.vect[1] < lVar40))
                                && ((lVar49 <= local_808.bigend.vect[1] &&
                                    ((local_808.smallend.vect[2] <= (int)LVar52 &&
                                     ((int)LVar52 <= local_808.bigend.vect[2])))))))))))) {
                            puVar120 = (undefined *)
                                       ((double)puVar120 +
                                       *(double *)(local_6c8 + (long)puVar105 * 8) * 0.125);
                          }
                          if ((((((((*(int *)(local_6f0 + (long)puVar105 * 4 + lVar65 + -4) == 0) &&
                                   (lVar36 < (long)puVar4)) &&
                                  ((long)puVar96 <= (long)local_7b8.bigend.vect[0])) &&
                                 ((local_7b8.smallend.vect[1] <= lVar40 &&
                                  (lVar40 <= local_7b8.bigend.vect[1])))) &&
                                (local_7b8.smallend.vect[2] <= (int)LVar52)) &&
                               (((int)LVar52 <= local_7b8.bigend.vect[2] &&
                                (puVar120 = (undefined *)
                                            ((double)puVar120 +
                                            *(double *)(local_760 + (long)puVar105 * 8) *
                                            (double)local_4a8._0_8_ +
                                            *(double *)(local_738 + (long)puVar105 * 8) *
                                            (double)local_358 +
                                            *(double *)(local_758 + (long)puVar105 * 8) *
                                            (double)local_408._0_8_),
                                (undefined **)local_3e8.p != (undefined **)0x0)))) &&
                              (((long)local_808.smallend.vect[0] < (long)puVar4 &&
                               ((((long)puVar96 <= lVar54 && (local_808.smallend.vect[1] <= lVar40))
                                && (lVar40 <= local_808.bigend.vect[1])))))) &&
                             ((local_808.smallend.vect[2] <= (int)LVar52 &&
                              ((int)LVar52 <= local_808.bigend.vect[2])))) {
                            puVar120 = (undefined *)
                                       ((double)puVar120 +
                                       *(double *)
                                        ((long)local_650 +
                                        (long)puVar105 * 8 +
                                        CONCAT44(local_3e8.jstride._4_4_,(int)local_3e8.jstride) *
                                        local_658 +
                                        (lVar41 - local_3e8.begin.z) *
                                        CONCAT44(local_3e8.kstride._4_4_,(int)local_3e8.kstride) * 8
                                        ) * 0.125);
                          }
                          if ((((*(int *)(local_6f0 + (long)puVar105 * 4 + lVar65) == 0) &&
                               (lVar36 <= (long)puVar4)) &&
                              (((long)puVar4 <= (long)local_7b8.bigend.vect[0] &&
                               (((local_7b8.smallend.vect[1] <= lVar40 &&
                                 (lVar40 <= local_7b8.bigend.vect[1])) &&
                                (local_7b8.smallend.vect[2] <= (int)LVar52)))))) &&
                             ((int)LVar52 <= local_7b8.bigend.vect[2])) {
                            lVar77 = (long)local_5b8.begin.x;
                            lVar69 = (lVar41 - local_5b8.begin.z) *
                                     CONCAT44(local_5b8.kstride._4_4_,(int)local_5b8.kstride) * 8 +
                                     (lVar40 - local_5b8.begin.y) *
                                     CONCAT44(local_5b8.jstride._4_4_,(uint)local_5b8.jstride) * 8;
                            puVar120 = (undefined *)
                                       ((double)puVar120 +
                                       *(double *)
                                        (local_7d0 +
                                        (long)puVar105 * 8 +
                                        local_5b8.nstride * 0x10 + lVar69 + lVar77 * -8) *
                                       (double)local_4a8._0_8_ +
                                       *(double *)
                                        (local_7d0 + (long)puVar105 * 8 + lVar69 + lVar77 * -8) *
                                       (double)local_3f8 +
                                       *(double *)
                                        (local_7d0 +
                                        (long)puVar105 * 8 +
                                        lVar69 + local_5b8.nstride * 8 + lVar77 * -8) *
                                       (double)local_408._0_8_);
                            if (((((undefined **)local_3e8.p != (undefined **)0x0) &&
                                 ((long)local_808.smallend.vect[0] <= (long)puVar4)) &&
                                (((long)puVar4 <= (long)local_808.bigend.vect[0] &&
                                 ((local_808.smallend.vect[1] <= lVar40 &&
                                  (lVar40 <= local_808.bigend.vect[1])))))) &&
                               ((local_808.smallend.vect[2] <= (int)LVar52 &&
                                ((int)LVar52 <= local_808.bigend.vect[2])))) {
                              puVar120 = (undefined *)
                                         ((double)puVar120 +
                                         (double)local_678[(long)(puVar105 +
                                                                 (((lVar40 - local_3e8.begin.y) *
                                                                   CONCAT44(local_3e8.jstride._4_4_,
                                                                            (int)local_3e8.jstride)
                                                                  + (lVar41 - local_3e8.begin.z) *
                                                                    CONCAT44(local_3e8.kstride._4_4_
                                                                             ,(int)local_3e8.kstride
                                                                            )) -
                                                                 (long)local_3e8.begin.x))] * 0.125)
                              ;
                            }
                          }
                          if (local_7c8 == puVar105) {
                            uVar121 = 0;
                            uVar122 = 0x40000000;
                            if (local_6b0.arr[0] != Neumann) {
                              uVar121 = 0;
                              uVar122 = 0x40000000;
                              if (local_6b0.arr[0] != inflow) goto LAB_006e9c28;
                            }
                          }
                          else {
LAB_006e9c28:
                            uVar121 = 0;
                            uVar122 = 0x3ff00000;
                            if (local_29c.smallend.vect[0] + (int)puVar105 ==
                                local_378.bigend.vect[0]) {
                              uVar121 = (undefined4)uVar15;
                              uVar122 = (undefined4)((ulong)uVar15 >> 0x20);
                            }
                          }
                          dVar57 = (double)CONCAT44(uVar122,uVar121);
                          local_920 = (int)lVar40;
                          if ((local_378.smallend.vect[1] == local_920) &&
                             ((local_6b0.arr[1] == inflow || (local_6b0.arr[1] == Neumann)))) {
                            dVar57 = (double)CONCAT44(uVar122,uVar121) +
                                     (double)CONCAT44(uVar122,uVar121);
                          }
                          else if ((local_378.bigend.vect[1] == local_920) &&
                                  ((local_6c0.arr[1] == inflow || (local_6c0.arr[1] == Neumann)))) {
                            dVar57 = (double)CONCAT44(uVar122,uVar121) +
                                     (double)CONCAT44(uVar122,uVar121);
                          }
                          if (((local_378.smallend.vect[2] == LVar52) &&
                              ((local_6b0.arr[2] == inflow || (local_6b0.arr[2] == Neumann)))) ||
                             ((local_378.bigend.vect[2] == LVar52 &&
                              ((local_6c0.arr[2] == inflow || (local_6c0.arr[2] == Neumann)))))) {
                            dVar57 = dVar57 + dVar57;
                          }
                          (local_498.p + lVar84)
                          [(long)(puVar105 +
                                 (((lVar40 - local_498.begin.y) *
                                   CONCAT44(local_498.jstride._4_4_,(uint)local_498.jstride) +
                                  (lVar41 - local_498.begin.z) *
                                  CONCAT44(local_498.kstride._4_4_,(undefined4)local_498.kstride)) -
                                 (long)local_498.begin.x))] = (double)((double)puVar120 * dVar57);
                        }
                        puVar105 = puVar105 + 1;
                      } while (~local_29c.bigend.vect[0] + local_29c.smallend.vect[0] +
                               (int)puVar105 != 0);
                    }
                    lVar40 = lVar40 + 1;
                    local_8b0 = (LayoutData<int> *)
                                ((long)&(local_8b0->super_FabArrayBase)._vptr_FabArrayBase + 1);
                    puVar95 = puVar95 + local_638;
                  } while (local_29c.bigend.vect[1] + 1U != (int)lVar40);
                }
                local_930 = (ulong)(LVar52 + 1);
                local_608 = CONCAT44(local_608._4_4_,(int)local_608 + 1);
              } while (LVar52 != local_29c.bigend.vect[2]);
            }
          }
          MFIter::operator++((MFIter *)local_578);
        } while ((int)local_558 < local_550);
      }
      MFIter::~MFIter((MFIter *)local_578);
      MultiFab::~MultiFab((MultiFab *)local_1b8);
      bVar106 = 0 < (long)uVar101;
      uVar101 = uVar101 - 1;
    } while (bVar106);
  }
  if (0 < (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels) {
    lVar36 = 0;
    pVVar58 = local_240;
    do {
      ppMVar22 = (pVVar58->
                 super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
                 super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((lVar36 < (long)(pVVar58->
                          super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                          ).
                          super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar22 >> 3) &&
         (pMVar19 = ppMVar22[lVar36], pMVar19 != (MultiFab *)0x0)) {
        MultiFab::Add((local_6e0->
                      super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar36],pMVar19,0,0,1,0);
        pVVar58 = local_240;
      }
      lVar36 = lVar36 + 1;
    } while (lVar36 < (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels);
  }
  if (0 < (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels) {
    lVar36 = 0;
    do {
      EB_set_covered((local_6e0->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                     ).super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar36],0.0);
      lVar36 = lVar36 + 1;
    } while (lVar36 < (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels);
  }
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::~vector(&local_210);
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::~vector(&local_1f0);
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::~vector(&local_270);
  return;
}

Assistant:

void
MLNodeLaplacian::compRHS (const Vector<MultiFab*>& rhs, const Vector<MultiFab*>& vel,
                          const Vector<const MultiFab*>& rhnd,
                          const Vector<MultiFab*>& a_rhcc)
{
#if (AMREX_SPACEDIM == 1)
    amrex::ignore_unused(rhs,vel,rhnd,a_rhcc);
#else
    //
    // Note that div vel we copmute on a coarse/fine nodes is not a
    // composite divergence.  It has been restricted so that it is suitable
    // as RHS for our geometric mulitgrid solver with a MG hirerachy
    // including multiple AMR levels.
    //
    // Also note that even for RAP, we do doubling at Nuemann boundary,
    // because unimposeNeumannBC will be called on rhs for RAP.
    //

    BL_PROFILE("MLNodeLaplacian::compRHS()");

    if (!m_masks_built) buildMasks();

#ifdef AMREX_USE_EB
    if (!m_integral_built) buildIntegral();
    if (m_build_surface_integral && !m_surface_integral_built) buildSurfaceIntegral();
#endif

#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

    const auto lobc = LoBC();
    const auto hibc = HiBC();

    bool has_inflow = false;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        has_inflow = has_inflow || (lobc[idim] == LinOpBCType::inflow ||
                                    hibc[idim] == LinOpBCType::inflow);
    }

    Vector<std::unique_ptr<MultiFab> > rhcc(m_num_amr_levels);
    Vector<std::unique_ptr<MultiFab> > rhs_cc(m_num_amr_levels);

    for (int ilev = 0; ilev < m_num_amr_levels; ++ilev)
    {
        const Geometry& geom = m_geom[ilev][0];
        AMREX_ASSERT(vel[ilev]->nComp() >= AMREX_SPACEDIM);
        AMREX_ASSERT(vel[ilev]->nGrow() >= 1);

        if (has_inflow) { // Zero out transverse velocity so that it's not seen.
            Box domain = geom.Domain();
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                if (lobc[idim] != LinOpBCType::inflow) {
                    domain.growLo(idim,1);
                }
                if (hibc[idim] != LinOpBCType::inflow) {
                    domain.growHi(idim,1);
                }
            }
            const auto dlo = domain.smallEnd();
            const auto dhi = domain.bigEnd();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(*vel[ilev],TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box& bx = mfi.growntilebox(1);
                Array4<Real> const& vfab = vel[ilev]->array(mfi);
                if ( ! domain.contains(bx) ) {
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                    {
                        IntVect cell(AMREX_D_DECL(i,j,k));
                        for (int in = 0; in < AMREX_SPACEDIM; ++in) {
                            for (int it = 0; it < AMREX_SPACEDIM; ++it) {
                                if (it != in) {
                                    if (cell[in] < dlo[in] || cell[in] > dhi[in]) {
                                        vfab(i,j,k,it) = Real(0.0);
                                    }
                                }
                            }
                        }
                    });
                }
            }
        }

        vel[ilev]->FillBoundary(0, AMREX_SPACEDIM, IntVect(1), geom.periodicity());

        if (ilev < a_rhcc.size() && a_rhcc[ilev])
        {
            rhcc[ilev] = std::make_unique<MultiFab>(a_rhcc[ilev]->boxArray(),
                                                    a_rhcc[ilev]->DistributionMap(), 1, 1);
            rhcc[ilev]->setVal(0.0);
            MultiFab::Copy(*rhcc[ilev], *a_rhcc[ilev], 0, 0, 1, 0);
            rhcc[ilev]->FillBoundary(geom.periodicity());

            rhs_cc[ilev] = std::make_unique<MultiFab>(rhs[ilev]->boxArray(),
                                                      rhs[ilev]->DistributionMap(), 1, 0);
        }

        const auto dxinvarr = geom.InvCellSizeArray();
        const Box& nddom = amrex::surroundingNodes(geom.Domain());

        const iMultiFab& dmsk = *m_dirichlet_mask[ilev][0];

#ifdef AMREX_USE_EB
        auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[ilev][0].get());
        const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
        const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
        const MultiCutFab* barea = (factory) ? &(factory->getBndryArea()) : nullptr;
        const MultiFab* intg = m_integral[ilev].get();
        const MultiFab* sintg = m_surface_integral[ilev].get();

        AMREX_ALWAYS_ASSERT(ilev == m_num_amr_levels-1 || AMRRefRatio(ilev) == 2
                            || factory == nullptr || factory->isAllRegular());
#endif

        MFItInfo mfi_info;
        if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(*rhs[ilev],mfi_info); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> const& rhsarr = rhs[ilev]->array(mfi);
            Array4<Real const> const& velarr = vel[ilev]->const_array(mfi);
            Array4<int const> const& dmskarr = dmsk.const_array(mfi);

#ifdef AMREX_USE_EB
            bool regular = !factory;
            FabType typ = FabType::regular;
            if (factory)
            {
                const auto& flag = (*flags)[mfi];
                const auto& ccbx = amrex::grow(amrex::enclosedCells(bx),1);
                typ = flag.getType(ccbx);
                if (typ == FabType::covered)
                {
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                    {
                        rhsarr(i,j,k) = 0.0;
                    });
                }
                else if (typ == FabType::singlevalued)
                {
                    Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                    Array4<Real const> const& intgarr = intg->const_array(mfi);
                    AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                    {
                        mlndlap_divu_eb(i,j,k,rhsarr,velarr,vfracarr,intgarr,dmskarr,dxinvarr,nddom,lobc,hibc);
                    });

                    if (m_eb_vel_dot_n[ilev]) {
                        Array4<Real const> const& eb_vel_dot_n = m_eb_vel_dot_n[ilev]->const_array(mfi);
                        Array4<Real const> const& bareaarr = barea->const_array(mfi);
                        Array4<Real const> const& sintgarr = sintg->const_array(mfi);

                        AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                        {
                            add_eb_flow_contribution(i,j,k,rhsarr,dmskarr,
                                dxinvarr,bareaarr,sintgarr,eb_vel_dot_n);
                        });
                    }
                }
                else
                {
                    regular = true;
                }
            }
            if (regular)
#endif
            {
#if (AMREX_SPACEDIM == 2)
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                {
                    mlndlap_divu(i,j,k,rhsarr,velarr,dmskarr,dxinvarr,
                                 nddom,lobc,hibc,is_rz);
                });
#else
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                {
                    mlndlap_divu(i,j,k,rhsarr,velarr,dmskarr,dxinvarr,
                                 nddom,lobc,hibc);
                });
#endif
            }

            mlndlap_impose_neumann_bc(bx, rhsarr, nddom, lobc, hibc);

            if (rhcc[ilev])
            {
                Array4<Real> const& rhs_cc_a = rhs_cc[ilev]->array(mfi);
                Array4<Real const> const& rhccarr = rhcc[ilev]->const_array(mfi);
#ifdef AMREX_USE_EB
                if (typ == FabType::singlevalued)
                {
                    Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                    Array4<Real const> const& intgarr = intg->const_array(mfi);
                    AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                    {
                        rhs_cc_a(i,j,k) = mlndlap_rhcc_eb(i,j,k,rhccarr,vfracarr,intgarr,dmskarr);
                    });
                }
                else if (typ == FabType::covered)
                {
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                    {
                        rhs_cc_a(i,j,k) = 0.0;
                    });
                }
                else
#endif
                {
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                    {
                        rhs_cc_a(i,j,k) = mlndlap_rhcc(i, j, k, rhccarr, dmskarr);
                    });
                }

                mlndlap_impose_neumann_bc(bx, rhs_cc_a, nddom, lobc, hibc);
            }
        }
    }

    Vector<std::unique_ptr<MultiFab> > frhs(m_num_amr_levels);

    for (int ilev = 0; ilev < m_num_amr_levels-1; ++ilev)
    {
        const int amrrr = AMRRefRatio(ilev);
        const Geometry& fgeom = m_geom[ilev+1][0];
        AMREX_ALWAYS_ASSERT(amrrr == 2 || amrrr == 4);

        frhs[ilev] = std::make_unique<MultiFab>(amrex::coarsen(rhs[ilev+1]->boxArray(),amrrr),
                                                rhs[ilev+1]->DistributionMap(), 1, 0);

        const Box& ccfdom = fgeom.Domain();
        const auto fdxinv = fgeom.InvCellSizeArray();
        const iMultiFab& fdmsk = *m_dirichlet_mask[ilev+1][0];

        MFItInfo mfi_info;
        if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(*frhs[ilev],mfi_info); mfi.isValid(); ++mfi)
        {
            const Box& cbx = mfi.tilebox();
            const Box& fvbx = amrex::refine(mfi.validbox(),amrrr);
            const Box& cc_fvbx = amrex::enclosedCells(fvbx);

            Box bx_vel = cc_fvbx;
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
            {
                if (m_lobc[0][idim] == LinOpBCType::inflow)
                {
                    if (bx_vel.smallEnd(idim) == ccfdom.smallEnd(idim)) {
                        bx_vel.growLo(idim, 1);
                    }
                }
                if (m_hibc[0][idim] == LinOpBCType::inflow)
                {
                    if (bx_vel.bigEnd(idim) == ccfdom.bigEnd(idim)) {
                        bx_vel.growHi(idim, 1);
                    }
                }
            }

            Array4<Real> const& rhsarr = frhs[ilev]->array(mfi);
            Array4<Real const> const& velarr = vel[ilev+1]->const_array(mfi);
            Array4<Real const> const& rhsarr_fine = rhs[ilev+1]->const_array(mfi);
            Array4<int const> const& mskarr = fdmsk.const_array(mfi);
#if (AMREX_SPACEDIM == 2)
            if (amrrr == 2) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_divu_fine_contrib<2>(i,j,k,fvbx,bx_vel,rhsarr,velarr,rhsarr_fine,
                                                 mskarr,fdxinv,is_rz);
                });
            } else {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_divu_fine_contrib<4>(i,j,k,fvbx,bx_vel,rhsarr,velarr,rhsarr_fine,
                                                 mskarr,fdxinv,is_rz);
                });
            }
#elif (AMREX_SPACEDIM == 3)
            if (amrrr == 2) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_divu_fine_contrib<2>(i,j,k,fvbx,bx_vel,rhsarr,velarr,rhsarr_fine,
                                                 mskarr,fdxinv);
                });
            } else {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_divu_fine_contrib<4>(i,j,k,fvbx,bx_vel,rhsarr,velarr,rhsarr_fine,
                                                 mskarr,fdxinv);
                });
            }
#endif

            if (rhcc[ilev+1])
            {
                // xxxxx TODO: incorrect if cut cells are too close to coarse/fine boundary
                Array4<Real const> const& rhccarr = rhcc[ilev+1]->const_array(mfi);
                if (amrrr == 2) {
                    AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                    {
                        mlndlap_rhcc_fine_contrib<2>(i,j,k,cc_fvbx,rhsarr,rhccarr,mskarr);
                    });
                } else {
                    AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                    {
                        mlndlap_rhcc_fine_contrib<4>(i,j,k,cc_fvbx,rhsarr,rhccarr,mskarr);
                    });
                }
            }
        }
    }

    for (int ilev = 0; ilev < m_num_amr_levels; ++ilev)
    {
        if (rhs_cc[ilev]) {
            MultiFab::Add(*rhs[ilev], *rhs_cc[ilev], 0, 0, 1, 0);
        }
    }

    for (int ilev = m_num_amr_levels-2; ilev >= 0; --ilev)
    {
        const Geometry& cgeom = m_geom[ilev][0];

        MultiFab crhs(rhs[ilev]->boxArray(), rhs[ilev]->DistributionMap(), 1, 0);
        crhs.setVal(0.0);
        crhs.ParallelAdd(*frhs[ilev], cgeom.periodicity());

        const Box& cccdom = cgeom.Domain();
        const Box& cccdom_p = cgeom.growPeriodicDomain(1);
        Box cccdom_pi = cccdom_p;
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            if (lobc[idim] == LinOpBCType::inflow) {
                cccdom_pi.growLo(idim,1);
            }
            if (hibc[idim] == LinOpBCType::inflow) {
                cccdom_pi.growHi(idim,1);
            }
        }
        const Box& cnddom = amrex::surroundingNodes(cccdom);
        const auto cdxinv = cgeom.InvCellSizeArray();
        const iMultiFab& cdmsk = *m_dirichlet_mask[ilev][0];
        const iMultiFab& c_nd_mask = *m_nd_fine_mask[ilev];
        const iMultiFab& c_cc_mask = *m_cc_fine_mask[ilev];
        const auto& has_fine_bndry = *m_has_fine_bndry[ilev];

        MFItInfo mfi_info;
        if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(*rhs[ilev],mfi_info); mfi.isValid(); ++mfi)
        {
            if (has_fine_bndry[mfi])
            {
                const Box& bx = mfi.tilebox();

                Array4<Real> const& rhsarr = rhs[ilev]->array(mfi);
                Array4<Real const> const& velarr = vel[ilev]->const_array(mfi);
                Array4<Real const> const& crhsarr = crhs.const_array(mfi);
                Array4<int const> const& cdmskarr = cdmsk.const_array(mfi);
                Array4<int const> const& ndmskarr = c_nd_mask.const_array(mfi);
                Array4<int const> const& ccmskarr = c_cc_mask.const_array(mfi);

                Array4<Real const> rhccarr = (rhcc[ilev])
                    ? rhcc[ilev]->const_array(mfi) : Array4<Real const>{};
#if (AMREX_SPACEDIM == 2)
                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    mlndlap_divu_cf_contrib(i,j,k,rhsarr,velarr,crhsarr,rhccarr,
                                            cdmskarr,ndmskarr,ccmskarr,
                                            is_rz,
                                            cdxinv,cccdom_p,cccdom_pi,cnddom,lobc,hibc);
                });
#elif (AMREX_SPACEDIM == 3)
                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    mlndlap_divu_cf_contrib(i,j,k,rhsarr,velarr,crhsarr,rhccarr,
                                            cdmskarr,ndmskarr,ccmskarr,
                                            cdxinv,cccdom_p,cccdom_pi,cnddom,lobc,hibc);
                });
#endif
            }
        }
    }

    for (int ilev = 0; ilev < m_num_amr_levels; ++ilev)
    {
        if (ilev < rhnd.size() && rhnd[ilev]) {
            MultiFab::Add(*rhs[ilev], *rhnd[ilev], 0, 0, 1, 0);
        }
    }

#ifdef AMREX_USE_EB
    for (int ilev = 0; ilev < m_num_amr_levels; ++ilev) {
        amrex::EB_set_covered(*rhs[ilev], 0.0);
    }
#endif
#endif
}